

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [28];
  undefined1 (*pauVar11) [32];
  undefined4 uVar12;
  Primitive PVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  Geometry *pGVar17;
  __int_type_conflict _Var18;
  long lVar19;
  RTCFilterFunctionN p_Var20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [28];
  undefined1 auVar129 [28];
  undefined1 auVar130 [28];
  undefined1 auVar131 [24];
  undefined1 auVar132 [28];
  uint uVar133;
  int iVar134;
  ulong uVar135;
  RTCIntersectArguments *pRVar136;
  uint uVar137;
  long lVar138;
  bool bVar139;
  long lVar140;
  ulong uVar141;
  long lVar142;
  float fVar143;
  float fVar144;
  float fVar163;
  float fVar165;
  vint4 bi_2;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar167;
  float fVar172;
  float fVar176;
  float fVar180;
  undefined1 auVar150 [32];
  float fVar168;
  undefined1 auVar151 [32];
  float fVar169;
  float fVar173;
  float fVar177;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar164;
  float fVar166;
  float fVar170;
  float fVar171;
  float fVar174;
  float fVar175;
  float fVar178;
  float fVar179;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar186;
  float fVar202;
  float fVar204;
  vint4 bi_1;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar187;
  undefined1 auVar192 [16];
  float fVar206;
  undefined1 auVar193 [32];
  float fVar203;
  float fVar205;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar210;
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  float fVar211;
  float fVar224;
  float fVar225;
  vint4 bi;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar227;
  float fVar228;
  undefined1 auVar220 [32];
  float fVar226;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar229;
  float fVar241;
  float fVar243;
  vint4 ai_1;
  undefined1 auVar230 [16];
  float fVar245;
  undefined1 auVar231 [16];
  undefined1 auVar233 [16];
  float fVar247;
  undefined1 auVar234 [16];
  undefined1 auVar232 [16];
  float fVar248;
  float fVar249;
  float fVar251;
  float fVar252;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar242;
  float fVar244;
  float fVar246;
  float fVar250;
  float fVar253;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [64];
  float fVar254;
  float fVar269;
  float fVar272;
  vint4 ai_2;
  undefined1 auVar257 [16];
  float fVar275;
  undefined1 auVar258 [16];
  float fVar255;
  float fVar256;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar259 [16];
  undefined1 auVar262 [32];
  float fVar270;
  float fVar273;
  float fVar276;
  undefined1 auVar263 [32];
  float fVar271;
  float fVar274;
  float fVar277;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar278;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [64];
  float fVar279;
  float fVar290;
  float fVar291;
  undefined1 auVar280 [16];
  float fVar292;
  float fVar294;
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  float fVar293;
  float fVar295;
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar304;
  undefined1 auVar303 [32];
  float fVar313;
  vint4 ai;
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  float fVar314;
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  float fVar331;
  undefined1 auVar325 [16];
  float fVar332;
  float fVar333;
  float fVar334;
  float fVar335;
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [64];
  float fVar336;
  float fVar342;
  float fVar343;
  undefined1 auVar337 [16];
  float fVar345;
  float fVar346;
  float fVar347;
  undefined1 auVar338 [32];
  float fVar344;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  float fVar351;
  float fVar352;
  undefined1 auVar348 [16];
  undefined1 auVar349 [32];
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar350 [64];
  float fVar358;
  float fVar365;
  undefined1 auVar359 [16];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar369;
  float fVar370;
  undefined1 auVar366 [16];
  float fVar371;
  float fVar372;
  float fVar373;
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  float fVar374;
  float fVar375;
  float fVar379;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  bool local_92d;
  float local_920;
  float fStack_91c;
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  ulong local_900;
  uint local_8c0;
  undefined4 uStack_8bc;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [8];
  undefined8 uStack_798;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 *local_750;
  undefined1 (*local_748) [16];
  undefined1 (*local_740) [32];
  Precalculations *local_738;
  RTCFilterFunctionNArguments local_730;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  undefined8 uStack_6d8;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  undefined8 uStack_6b8;
  undefined1 auStack_6b0 [8];
  undefined8 uStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  LinearSpace3fa *local_630;
  Primitive *local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [16];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint local_39c;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined1 local_340 [32];
  float local_320 [4];
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  RTCHitN local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar360 [16];
  undefined1 auVar376 [16];
  
  PVar13 = prim[1];
  uVar135 = (ulong)(byte)PVar13;
  lVar21 = uVar135 * 0x25;
  auVar281 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar281 = vinsertps_avx(auVar281,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar215 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar215 = vinsertps_avx(auVar215,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar208 = *(float *)(prim + lVar21 + 0x12);
  auVar281 = vsubps_avx(auVar281,*(undefined1 (*) [16])(prim + lVar21 + 6));
  auVar188._0_4_ = fVar208 * auVar281._0_4_;
  auVar188._4_4_ = fVar208 * auVar281._4_4_;
  auVar188._8_4_ = fVar208 * auVar281._8_4_;
  auVar188._12_4_ = fVar208 * auVar281._12_4_;
  auVar305._0_4_ = fVar208 * auVar215._0_4_;
  auVar305._4_4_ = fVar208 * auVar215._4_4_;
  auVar305._8_4_ = fVar208 * auVar215._8_4_;
  auVar305._12_4_ = fVar208 * auVar215._12_4_;
  auVar281 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 4 + 6)));
  auVar281 = vcvtdq2ps_avx(auVar281);
  auVar215 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 5 + 6)));
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 6 + 6)));
  auVar282 = vcvtdq2ps_avx(auVar282);
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 0xf + 6)));
  auVar218 = vcvtdq2ps_avx(auVar218);
  auVar261 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + 6)));
  auVar261 = vcvtdq2ps_avx(auVar261);
  auVar234 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar135 + 6)));
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 0x1a + 6)));
  auVar234 = vcvtdq2ps_avx(auVar234);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 0x1b + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 0x1c + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vshufps_avx(auVar305,auVar305,0);
  auVar27 = vshufps_avx(auVar305,auVar305,0x55);
  auVar28 = vshufps_avx(auVar305,auVar305,0xaa);
  fVar208 = auVar28._0_4_;
  fVar228 = auVar28._4_4_;
  fVar226 = auVar28._8_4_;
  fVar293 = auVar28._12_4_;
  fVar254 = auVar27._0_4_;
  fVar269 = auVar27._4_4_;
  fVar272 = auVar27._8_4_;
  fVar275 = auVar27._12_4_;
  fVar229 = auVar26._0_4_;
  fVar241 = auVar26._4_4_;
  fVar243 = auVar26._8_4_;
  fVar245 = auVar26._12_4_;
  auVar359._0_4_ = fVar229 * auVar281._0_4_ + fVar254 * auVar215._0_4_ + fVar208 * auVar282._0_4_;
  auVar359._4_4_ = fVar241 * auVar281._4_4_ + fVar269 * auVar215._4_4_ + fVar228 * auVar282._4_4_;
  auVar359._8_4_ = fVar243 * auVar281._8_4_ + fVar272 * auVar215._8_4_ + fVar226 * auVar282._8_4_;
  auVar359._12_4_ =
       fVar245 * auVar281._12_4_ + fVar275 * auVar215._12_4_ + fVar293 * auVar282._12_4_;
  auVar366._0_4_ = fVar229 * auVar218._0_4_ + fVar254 * auVar261._0_4_ + auVar234._0_4_ * fVar208;
  auVar366._4_4_ = fVar241 * auVar218._4_4_ + fVar269 * auVar261._4_4_ + auVar234._4_4_ * fVar228;
  auVar366._8_4_ = fVar243 * auVar218._8_4_ + fVar272 * auVar261._8_4_ + auVar234._8_4_ * fVar226;
  auVar366._12_4_ =
       fVar245 * auVar218._12_4_ + fVar275 * auVar261._12_4_ + auVar234._12_4_ * fVar293;
  auVar306._0_4_ = fVar229 * auVar23._0_4_ + fVar254 * auVar24._0_4_ + auVar25._0_4_ * fVar208;
  auVar306._4_4_ = fVar241 * auVar23._4_4_ + fVar269 * auVar24._4_4_ + auVar25._4_4_ * fVar228;
  auVar306._8_4_ = fVar243 * auVar23._8_4_ + fVar272 * auVar24._8_4_ + auVar25._8_4_ * fVar226;
  auVar306._12_4_ = fVar245 * auVar23._12_4_ + fVar275 * auVar24._12_4_ + auVar25._12_4_ * fVar293;
  auVar26 = vshufps_avx(auVar188,auVar188,0);
  auVar27 = vshufps_avx(auVar188,auVar188,0x55);
  auVar28 = vshufps_avx(auVar188,auVar188,0xaa);
  fVar208 = auVar28._0_4_;
  fVar228 = auVar28._4_4_;
  fVar226 = auVar28._8_4_;
  fVar293 = auVar28._12_4_;
  fVar254 = auVar27._0_4_;
  fVar269 = auVar27._4_4_;
  fVar272 = auVar27._8_4_;
  fVar275 = auVar27._12_4_;
  fVar229 = auVar26._0_4_;
  fVar241 = auVar26._4_4_;
  fVar243 = auVar26._8_4_;
  fVar245 = auVar26._12_4_;
  auVar212._0_4_ = fVar229 * auVar281._0_4_ + fVar254 * auVar215._0_4_ + fVar208 * auVar282._0_4_;
  auVar212._4_4_ = fVar241 * auVar281._4_4_ + fVar269 * auVar215._4_4_ + fVar228 * auVar282._4_4_;
  auVar212._8_4_ = fVar243 * auVar281._8_4_ + fVar272 * auVar215._8_4_ + fVar226 * auVar282._8_4_;
  auVar212._12_4_ =
       fVar245 * auVar281._12_4_ + fVar275 * auVar215._12_4_ + fVar293 * auVar282._12_4_;
  auVar189._0_4_ = fVar229 * auVar218._0_4_ + auVar234._0_4_ * fVar208 + fVar254 * auVar261._0_4_;
  auVar189._4_4_ = fVar241 * auVar218._4_4_ + auVar234._4_4_ * fVar228 + fVar269 * auVar261._4_4_;
  auVar189._8_4_ = fVar243 * auVar218._8_4_ + auVar234._8_4_ * fVar226 + fVar272 * auVar261._8_4_;
  auVar189._12_4_ =
       fVar245 * auVar218._12_4_ + auVar234._12_4_ * fVar293 + fVar275 * auVar261._12_4_;
  auVar145._0_4_ = fVar229 * auVar23._0_4_ + fVar254 * auVar24._0_4_ + auVar25._0_4_ * fVar208;
  auVar145._4_4_ = fVar241 * auVar23._4_4_ + fVar269 * auVar24._4_4_ + auVar25._4_4_ * fVar228;
  auVar145._8_4_ = fVar243 * auVar23._8_4_ + fVar272 * auVar24._8_4_ + auVar25._8_4_ * fVar226;
  auVar145._12_4_ = fVar245 * auVar23._12_4_ + fVar275 * auVar24._12_4_ + auVar25._12_4_ * fVar293;
  auVar296._8_4_ = 0x7fffffff;
  auVar296._0_8_ = 0x7fffffff7fffffff;
  auVar296._12_4_ = 0x7fffffff;
  auVar281 = vandps_avx(auVar359,auVar296);
  auVar257._8_4_ = 0x219392ef;
  auVar257._0_8_ = 0x219392ef219392ef;
  auVar257._12_4_ = 0x219392ef;
  auVar281 = vcmpps_avx(auVar281,auVar257,1);
  auVar215 = vblendvps_avx(auVar359,auVar257,auVar281);
  auVar281 = vandps_avx(auVar366,auVar296);
  auVar281 = vcmpps_avx(auVar281,auVar257,1);
  auVar282 = vblendvps_avx(auVar366,auVar257,auVar281);
  auVar281 = vandps_avx(auVar306,auVar296);
  auVar281 = vcmpps_avx(auVar281,auVar257,1);
  auVar281 = vblendvps_avx(auVar306,auVar257,auVar281);
  auVar218 = vrcpps_avx(auVar215);
  fVar229 = auVar218._0_4_;
  auVar230._0_4_ = fVar229 * auVar215._0_4_;
  fVar241 = auVar218._4_4_;
  auVar230._4_4_ = fVar241 * auVar215._4_4_;
  fVar243 = auVar218._8_4_;
  auVar230._8_4_ = fVar243 * auVar215._8_4_;
  fVar245 = auVar218._12_4_;
  auVar230._12_4_ = fVar245 * auVar215._12_4_;
  auVar307._8_4_ = 0x3f800000;
  auVar307._0_8_ = &DAT_3f8000003f800000;
  auVar307._12_4_ = 0x3f800000;
  auVar215 = vsubps_avx(auVar307,auVar230);
  fVar229 = fVar229 + fVar229 * auVar215._0_4_;
  fVar241 = fVar241 + fVar241 * auVar215._4_4_;
  fVar243 = fVar243 + fVar243 * auVar215._8_4_;
  fVar245 = fVar245 + fVar245 * auVar215._12_4_;
  auVar215 = vrcpps_avx(auVar282);
  fVar254 = auVar215._0_4_;
  auVar280._0_4_ = fVar254 * auVar282._0_4_;
  fVar269 = auVar215._4_4_;
  auVar280._4_4_ = fVar269 * auVar282._4_4_;
  fVar272 = auVar215._8_4_;
  auVar280._8_4_ = fVar272 * auVar282._8_4_;
  fVar275 = auVar215._12_4_;
  auVar280._12_4_ = fVar275 * auVar282._12_4_;
  auVar215 = vsubps_avx(auVar307,auVar280);
  fVar254 = fVar254 + fVar254 * auVar215._0_4_;
  fVar269 = fVar269 + fVar269 * auVar215._4_4_;
  fVar272 = fVar272 + fVar272 * auVar215._8_4_;
  fVar275 = fVar275 + fVar275 * auVar215._12_4_;
  auVar215 = vrcpps_avx(auVar281);
  fVar279 = auVar215._0_4_;
  auVar297._0_4_ = fVar279 * auVar281._0_4_;
  fVar290 = auVar215._4_4_;
  auVar297._4_4_ = fVar290 * auVar281._4_4_;
  fVar291 = auVar215._8_4_;
  auVar297._8_4_ = fVar291 * auVar281._8_4_;
  fVar292 = auVar215._12_4_;
  auVar297._12_4_ = fVar292 * auVar281._12_4_;
  auVar281 = vsubps_avx(auVar307,auVar297);
  fVar279 = fVar279 + fVar279 * auVar281._0_4_;
  fVar290 = fVar290 + fVar290 * auVar281._4_4_;
  fVar291 = fVar291 + fVar291 * auVar281._8_4_;
  fVar292 = fVar292 + fVar292 * auVar281._12_4_;
  auVar281 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar21 + 0x16)) *
                           *(float *)(prim + lVar21 + 0x1a)));
  auVar282 = vshufps_avx(auVar281,auVar281,0);
  auVar281._8_8_ = 0;
  auVar281._0_8_ = *(ulong *)(prim + uVar135 * 7 + 6);
  auVar281 = vpmovsxwd_avx(auVar281);
  auVar281 = vcvtdq2ps_avx(auVar281);
  auVar215._8_8_ = 0;
  auVar215._0_8_ = *(ulong *)(prim + uVar135 * 0xb + 6);
  auVar215 = vpmovsxwd_avx(auVar215);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar215 = vsubps_avx(auVar215,auVar281);
  fVar208 = auVar282._0_4_;
  fVar228 = auVar282._4_4_;
  fVar226 = auVar282._8_4_;
  fVar293 = auVar282._12_4_;
  auVar308._0_4_ = auVar215._0_4_ * fVar208 + auVar281._0_4_;
  auVar308._4_4_ = auVar215._4_4_ * fVar228 + auVar281._4_4_;
  auVar308._8_4_ = auVar215._8_4_ * fVar226 + auVar281._8_4_;
  auVar308._12_4_ = auVar215._12_4_ * fVar293 + auVar281._12_4_;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *(ulong *)(prim + uVar135 * 9 + 6);
  auVar281 = vpmovsxwd_avx(auVar282);
  auVar281 = vcvtdq2ps_avx(auVar281);
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + uVar135 * 0xd + 6);
  auVar215 = vpmovsxwd_avx(auVar218);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar215 = vsubps_avx(auVar215,auVar281);
  auVar318._0_4_ = auVar215._0_4_ * fVar208 + auVar281._0_4_;
  auVar318._4_4_ = auVar215._4_4_ * fVar228 + auVar281._4_4_;
  auVar318._8_4_ = auVar215._8_4_ * fVar226 + auVar281._8_4_;
  auVar318._12_4_ = auVar215._12_4_ * fVar293 + auVar281._12_4_;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = *(ulong *)(prim + uVar135 * 0x12 + 6);
  auVar281 = vpmovsxwd_avx(auVar261);
  auVar281 = vcvtdq2ps_avx(auVar281);
  uVar141 = (ulong)(uint)((int)(uVar135 * 5) << 2);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar135 * 2 + uVar141 + 6);
  auVar215 = vpmovsxwd_avx(auVar234);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar215 = vsubps_avx(auVar215,auVar281);
  auVar325._0_4_ = auVar215._0_4_ * fVar208 + auVar281._0_4_;
  auVar325._4_4_ = auVar215._4_4_ * fVar228 + auVar281._4_4_;
  auVar325._8_4_ = auVar215._8_4_ * fVar226 + auVar281._8_4_;
  auVar325._12_4_ = auVar215._12_4_ * fVar293 + auVar281._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar141 + 6);
  auVar281 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar135 * 0x18 + 6);
  auVar215 = vpmovsxwd_avx(auVar24);
  auVar281 = vcvtdq2ps_avx(auVar281);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar215 = vsubps_avx(auVar215,auVar281);
  auVar337._0_4_ = auVar215._0_4_ * fVar208 + auVar281._0_4_;
  auVar337._4_4_ = auVar215._4_4_ * fVar228 + auVar281._4_4_;
  auVar337._8_4_ = auVar215._8_4_ * fVar226 + auVar281._8_4_;
  auVar337._12_4_ = auVar215._12_4_ * fVar293 + auVar281._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar135 * 0x1d + 6);
  auVar281 = vpmovsxwd_avx(auVar25);
  auVar281 = vcvtdq2ps_avx(auVar281);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar135 + (ulong)(byte)PVar13 * 0x20 + 6);
  auVar215 = vpmovsxwd_avx(auVar26);
  auVar215 = vcvtdq2ps_avx(auVar215);
  auVar282 = vsubps_avx(auVar215,auVar281);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar135) + 6);
  auVar215 = vpmovsxwd_avx(auVar27);
  auVar348._0_4_ = auVar282._0_4_ * fVar208 + auVar281._0_4_;
  auVar348._4_4_ = auVar282._4_4_ * fVar228 + auVar281._4_4_;
  auVar348._8_4_ = auVar282._8_4_ * fVar226 + auVar281._8_4_;
  auVar348._12_4_ = auVar282._12_4_ * fVar293 + auVar281._12_4_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar135 * 0x23 + 6);
  auVar282 = vpmovsxwd_avx(auVar28);
  auVar281 = vcvtdq2ps_avx(auVar215);
  auVar215 = vcvtdq2ps_avx(auVar282);
  auVar215 = vsubps_avx(auVar215,auVar281);
  auVar298._0_4_ = auVar281._0_4_ + auVar215._0_4_ * fVar208;
  auVar298._4_4_ = auVar281._4_4_ + auVar215._4_4_ * fVar228;
  auVar298._8_4_ = auVar281._8_4_ + auVar215._8_4_ * fVar226;
  auVar298._12_4_ = auVar281._12_4_ + auVar215._12_4_ * fVar293;
  auVar281 = vsubps_avx(auVar308,auVar212);
  auVar309._0_4_ = fVar229 * auVar281._0_4_;
  auVar309._4_4_ = fVar241 * auVar281._4_4_;
  auVar309._8_4_ = fVar243 * auVar281._8_4_;
  auVar309._12_4_ = fVar245 * auVar281._12_4_;
  auVar281 = vsubps_avx(auVar318,auVar212);
  auVar213._0_4_ = fVar229 * auVar281._0_4_;
  auVar213._4_4_ = fVar241 * auVar281._4_4_;
  auVar213._8_4_ = fVar243 * auVar281._8_4_;
  auVar213._12_4_ = fVar245 * auVar281._12_4_;
  auVar281 = vsubps_avx(auVar325,auVar189);
  auVar231._0_4_ = fVar254 * auVar281._0_4_;
  auVar231._4_4_ = fVar269 * auVar281._4_4_;
  auVar231._8_4_ = fVar272 * auVar281._8_4_;
  auVar231._12_4_ = fVar275 * auVar281._12_4_;
  auVar281 = vsubps_avx(auVar337,auVar189);
  auVar190._0_4_ = fVar254 * auVar281._0_4_;
  auVar190._4_4_ = fVar269 * auVar281._4_4_;
  auVar190._8_4_ = fVar272 * auVar281._8_4_;
  auVar190._12_4_ = fVar275 * auVar281._12_4_;
  auVar281 = vsubps_avx(auVar348,auVar145);
  auVar258._0_4_ = fVar279 * auVar281._0_4_;
  auVar258._4_4_ = fVar290 * auVar281._4_4_;
  auVar258._8_4_ = fVar291 * auVar281._8_4_;
  auVar258._12_4_ = fVar292 * auVar281._12_4_;
  auVar281 = vsubps_avx(auVar298,auVar145);
  auVar146._0_4_ = fVar279 * auVar281._0_4_;
  auVar146._4_4_ = fVar290 * auVar281._4_4_;
  auVar146._8_4_ = fVar291 * auVar281._8_4_;
  auVar146._12_4_ = fVar292 * auVar281._12_4_;
  auVar281 = vpminsd_avx(auVar309,auVar213);
  auVar215 = vpminsd_avx(auVar231,auVar190);
  auVar281 = vmaxps_avx(auVar281,auVar215);
  auVar215 = vpminsd_avx(auVar258,auVar146);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar319._4_4_ = uVar12;
  auVar319._0_4_ = uVar12;
  auVar319._8_4_ = uVar12;
  auVar319._12_4_ = uVar12;
  auVar215 = vmaxps_avx(auVar215,auVar319);
  auVar281 = vmaxps_avx(auVar281,auVar215);
  local_410._0_4_ = auVar281._0_4_ * 0.99999964;
  local_410._4_4_ = auVar281._4_4_ * 0.99999964;
  local_410._8_4_ = auVar281._8_4_ * 0.99999964;
  local_410._12_4_ = auVar281._12_4_ * 0.99999964;
  auVar281 = vpmaxsd_avx(auVar309,auVar213);
  auVar215 = vpmaxsd_avx(auVar231,auVar190);
  auVar281 = vminps_avx(auVar281,auVar215);
  auVar215 = vpmaxsd_avx(auVar258,auVar146);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar214._4_4_ = uVar12;
  auVar214._0_4_ = uVar12;
  auVar214._8_4_ = uVar12;
  auVar214._12_4_ = uVar12;
  auVar215 = vminps_avx(auVar215,auVar214);
  auVar281 = vminps_avx(auVar281,auVar215);
  auVar147._0_4_ = auVar281._0_4_ * 1.0000004;
  auVar147._4_4_ = auVar281._4_4_ * 1.0000004;
  auVar147._8_4_ = auVar281._8_4_ * 1.0000004;
  auVar147._12_4_ = auVar281._12_4_ * 1.0000004;
  auVar281 = vpshufd_avx(ZEXT116((byte)PVar13),0);
  auVar215 = vpcmpgtd_avx(auVar281,_DAT_01ff0cf0);
  auVar281 = vcmpps_avx(local_410,auVar147,2);
  auVar281 = vandps_avx(auVar281,auVar215);
  uVar133 = vmovmskps_avx(auVar281);
  local_92d = uVar133 != 0;
  if (local_92d) {
    uVar133 = uVar133 & 0xff;
    local_630 = pre->ray_space + k;
    local_620 = mm_lookupmask_ps._16_8_;
    uStack_618 = mm_lookupmask_ps._24_8_;
    uStack_610 = mm_lookupmask_ps._16_8_;
    uStack_608 = mm_lookupmask_ps._24_8_;
    uVar137 = 1 << ((byte)k & 0x1f);
    local_740 = (undefined1 (*) [32])&local_140;
    local_748 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar137 & 0xf) << 4));
    local_750 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar137 >> 4) * 0x10);
    local_738 = pre;
    local_628 = prim;
    do {
      lVar21 = 0;
      if (uVar133 != 0) {
        for (; (uVar133 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      uVar14 = *(uint *)(local_628 + 2);
      uVar15 = *(uint *)(local_628 + lVar21 * 4 + 6);
      pGVar17 = (context->scene->geometries).items[uVar14].ptr;
      local_560._0_8_ = CONCAT44(0,uVar15);
      uVar135 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                                CONCAT44(0,uVar15) *
                                pGVar17[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar208 = (pGVar17->time_range).lower;
      fVar208 = pGVar17->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar208) /
                ((pGVar17->time_range).upper - fVar208));
      auVar281 = vroundss_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),9);
      auVar281 = vminss_avx(auVar281,ZEXT416((uint)(pGVar17->fnumTimeSegments + -1.0)));
      auVar281 = vmaxss_avx(ZEXT816(0) << 0x20,auVar281);
      fVar208 = fVar208 - auVar281._0_4_;
      _Var18 = pGVar17[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar138 = (long)(int)auVar281._0_4_ * 0x38;
      lVar21 = *(long *)(_Var18 + 0x10 + lVar138);
      lVar142 = *(long *)(_Var18 + 0x38 + lVar138);
      lVar19 = *(long *)(_Var18 + 0x48 + lVar138);
      auVar281 = vshufps_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),0);
      pfVar1 = (float *)(lVar142 + uVar135 * lVar19);
      fVar228 = auVar281._0_4_;
      fVar226 = auVar281._4_4_;
      fVar293 = auVar281._8_4_;
      fVar229 = auVar281._12_4_;
      pfVar2 = (float *)(lVar142 + (uVar135 + 1) * lVar19);
      lVar140 = (uVar135 + 2) * lVar19;
      pfVar3 = (float *)(lVar142 + lVar140);
      pfVar4 = (float *)(lVar142 + lVar19 * (uVar135 + 3));
      lVar142 = *(long *)(_Var18 + lVar138);
      auVar281 = vshufps_avx(ZEXT416((uint)(1.0 - fVar208)),ZEXT416((uint)(1.0 - fVar208)),0);
      pfVar5 = (float *)(lVar142 + lVar21 * uVar135);
      fVar208 = auVar281._0_4_;
      fVar241 = auVar281._4_4_;
      fVar243 = auVar281._8_4_;
      fVar245 = auVar281._12_4_;
      pfVar6 = (float *)(lVar142 + lVar21 * (uVar135 + 1));
      pfVar7 = (float *)(lVar142 + lVar21 * (uVar135 + 2));
      pfVar8 = (float *)(lVar142 + lVar21 * (uVar135 + 3));
      uVar16 = (uint)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar21 = (long)(int)uVar16 * 0x44;
      local_760 = (undefined1  [8])
                  CONCAT44(fVar226 * pfVar1[1] + fVar241 * pfVar5[1],
                           fVar228 * *pfVar1 + fVar208 * *pfVar5);
      uStack_758._0_4_ = fVar293 * pfVar1[2] + fVar243 * pfVar5[2];
      uStack_758._4_4_ = fVar229 * pfVar1[3] + fVar245 * pfVar5[3];
      fVar358 = fVar208 * *pfVar6 + fVar228 * *pfVar2;
      fVar365 = fVar241 * pfVar6[1] + fVar226 * pfVar2[1];
      auVar360._0_8_ = CONCAT44(fVar365,fVar358);
      auVar360._8_4_ = fVar243 * pfVar6[2] + fVar293 * pfVar2[2];
      auVar360._12_4_ = fVar245 * pfVar6[3] + fVar229 * pfVar2[3];
      fVar374 = fVar208 * *pfVar7 + fVar228 * *pfVar3;
      fVar379 = fVar241 * pfVar7[1] + fVar226 * pfVar3[1];
      auVar376._0_8_ = CONCAT44(fVar379,fVar374);
      auVar376._8_4_ = fVar243 * pfVar7[2] + fVar293 * pfVar3[2];
      auVar376._12_4_ = fVar245 * pfVar7[3] + fVar229 * pfVar3[3];
      local_590._0_8_ =
           CONCAT44(fVar241 * pfVar8[1] + fVar226 * pfVar4[1],fVar208 * *pfVar8 + fVar228 * *pfVar4)
      ;
      local_590._8_4_ = fVar243 * pfVar8[2] + fVar293 * pfVar4[2];
      local_590._12_4_ = fVar245 * pfVar8[3] + fVar229 * pfVar4[3];
      auVar281 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar218 = vinsertps_avx(auVar281,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar282 = vsubps_avx(_local_760,auVar218);
      auVar281 = vshufps_avx(auVar282,auVar282,0);
      auVar215 = vshufps_avx(auVar282,auVar282,0x55);
      auVar282 = vshufps_avx(auVar282,auVar282,0xaa);
      fVar208 = (local_630->vx).field_0.m128[0];
      fVar228 = (local_630->vx).field_0.m128[1];
      fVar226 = (local_630->vx).field_0.m128[2];
      fVar293 = (local_630->vx).field_0.m128[3];
      fVar229 = (local_630->vy).field_0.m128[0];
      fVar241 = (local_630->vy).field_0.m128[1];
      fVar243 = (local_630->vy).field_0.m128[2];
      fVar245 = (local_630->vy).field_0.m128[3];
      fVar254 = (local_630->vz).field_0.m128[0];
      fVar269 = (local_630->vz).field_0.m128[1];
      fVar272 = (local_630->vz).field_0.m128[2];
      fVar275 = (local_630->vz).field_0.m128[3];
      auVar232._0_8_ =
           CONCAT44(auVar281._4_4_ * fVar228 + auVar215._4_4_ * fVar241 + fVar269 * auVar282._4_4_,
                    auVar281._0_4_ * fVar208 + auVar215._0_4_ * fVar229 + fVar254 * auVar282._0_4_);
      auVar232._8_4_ =
           auVar281._8_4_ * fVar226 + auVar215._8_4_ * fVar243 + fVar272 * auVar282._8_4_;
      auVar232._12_4_ =
           auVar281._12_4_ * fVar293 + auVar215._12_4_ * fVar245 + fVar275 * auVar282._12_4_;
      auVar281 = vblendps_avx(auVar232,_local_760,8);
      auVar261 = vsubps_avx(auVar360,auVar218);
      auVar215 = vshufps_avx(auVar261,auVar261,0);
      auVar282 = vshufps_avx(auVar261,auVar261,0x55);
      auVar261 = vshufps_avx(auVar261,auVar261,0xaa);
      auVar310._0_4_ =
           auVar215._0_4_ * fVar208 + auVar282._0_4_ * fVar229 + fVar254 * auVar261._0_4_;
      auVar310._4_4_ =
           auVar215._4_4_ * fVar228 + auVar282._4_4_ * fVar241 + fVar269 * auVar261._4_4_;
      auVar310._8_4_ =
           auVar215._8_4_ * fVar226 + auVar282._8_4_ * fVar243 + fVar272 * auVar261._8_4_;
      auVar310._12_4_ =
           auVar215._12_4_ * fVar293 + auVar282._12_4_ * fVar245 + fVar275 * auVar261._12_4_;
      auVar215 = vblendps_avx(auVar310,auVar360,8);
      auVar234 = vsubps_avx(auVar376,auVar218);
      auVar282 = vshufps_avx(auVar234,auVar234,0);
      auVar261 = vshufps_avx(auVar234,auVar234,0x55);
      auVar234 = vshufps_avx(auVar234,auVar234,0xaa);
      auVar320._0_4_ =
           auVar282._0_4_ * fVar208 + auVar261._0_4_ * fVar229 + auVar234._0_4_ * fVar254;
      auVar320._4_4_ =
           auVar282._4_4_ * fVar228 + auVar261._4_4_ * fVar241 + auVar234._4_4_ * fVar269;
      auVar320._8_4_ =
           auVar282._8_4_ * fVar226 + auVar261._8_4_ * fVar243 + auVar234._8_4_ * fVar272;
      auVar320._12_4_ =
           auVar282._12_4_ * fVar293 + auVar261._12_4_ * fVar245 + auVar234._12_4_ * fVar275;
      auVar282 = vblendps_avx(auVar320,auVar376,8);
      auVar234 = vsubps_avx(local_590,auVar218);
      auVar218 = vshufps_avx(auVar234,auVar234,0);
      auVar261 = vshufps_avx(auVar234,auVar234,0x55);
      auVar234 = vshufps_avx(auVar234,auVar234,0xaa);
      auVar191._0_4_ =
           auVar218._0_4_ * fVar208 + auVar261._0_4_ * fVar229 + fVar254 * auVar234._0_4_;
      auVar191._4_4_ =
           auVar218._4_4_ * fVar228 + auVar261._4_4_ * fVar241 + fVar269 * auVar234._4_4_;
      auVar191._8_4_ =
           auVar218._8_4_ * fVar226 + auVar261._8_4_ * fVar243 + fVar272 * auVar234._8_4_;
      auVar191._12_4_ =
           auVar218._12_4_ * fVar293 + auVar261._12_4_ * fVar245 + fVar275 * auVar234._12_4_;
      auVar218 = vblendps_avx(auVar191,local_590,8);
      auVar259._8_4_ = 0x7fffffff;
      auVar259._0_8_ = 0x7fffffff7fffffff;
      auVar259._12_4_ = 0x7fffffff;
      auVar281 = vandps_avx(auVar281,auVar259);
      auVar215 = vandps_avx(auVar215,auVar259);
      auVar261 = vmaxps_avx(auVar281,auVar215);
      auVar281 = vandps_avx(auVar282,auVar259);
      auVar215 = vandps_avx(auVar218,auVar259);
      auVar281 = vmaxps_avx(auVar281,auVar215);
      auVar281 = vmaxps_avx(auVar261,auVar281);
      auVar215 = vmovshdup_avx(auVar281);
      auVar215 = vmaxss_avx(auVar215,auVar281);
      auVar281 = vshufpd_avx(auVar281,auVar281,1);
      auVar281 = vmaxss_avx(auVar281,auVar215);
      fVar291 = *(float *)(bspline_basis0 + lVar21 + 0x908);
      fVar292 = *(float *)(bspline_basis0 + lVar21 + 0x90c);
      fVar351 = *(float *)(bspline_basis0 + lVar21 + 0x910);
      fVar247 = *(float *)(bspline_basis0 + lVar21 + 0x914);
      fVar352 = *(float *)(bspline_basis0 + lVar21 + 0x918);
      fVar251 = *(float *)(bspline_basis0 + lVar21 + 0x91c);
      fVar353 = *(float *)(bspline_basis0 + lVar21 + 0x920);
      auVar215 = vshufps_avx(auVar320,auVar320,0);
      register0x00001250 = auVar215;
      _local_680 = auVar215;
      auVar282 = vshufps_avx(auVar320,auVar320,0x55);
      register0x00001290 = auVar282;
      _local_5c0 = auVar282;
      fVar294 = *(float *)(bspline_basis0 + lVar21 + 0xd8c);
      fVar354 = *(float *)(bspline_basis0 + lVar21 + 0xd90);
      fVar250 = *(float *)(bspline_basis0 + lVar21 + 0xd94);
      fVar356 = *(float *)(bspline_basis0 + lVar21 + 0xd98);
      fVar355 = *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      fVar357 = *(float *)(bspline_basis0 + lVar21 + 0xda0);
      fVar253 = *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar218 = vshufps_avx(auVar191,auVar191,0);
      register0x00001550 = auVar218;
      _local_520 = auVar218;
      fVar335 = auVar218._0_4_;
      fVar369 = auVar218._4_4_;
      fVar370 = auVar218._8_4_;
      fVar372 = auVar218._12_4_;
      fVar186 = auVar215._0_4_;
      fVar202 = auVar215._4_4_;
      fVar204 = auVar215._8_4_;
      fVar206 = auVar215._12_4_;
      auVar215 = vshufps_avx(auVar191,auVar191,0x55);
      auVar193._16_16_ = auVar215;
      auVar193._0_16_ = auVar215;
      fVar187 = auVar215._0_4_;
      fVar203 = auVar215._4_4_;
      fVar205 = auVar215._8_4_;
      fVar207 = auVar215._12_4_;
      fVar211 = auVar282._0_4_;
      fVar224 = auVar282._4_4_;
      fVar225 = auVar282._8_4_;
      fVar227 = auVar282._12_4_;
      auVar215 = vshufps_avx(auVar376,auVar376,0xff);
      register0x000014d0 = auVar215;
      _local_80 = auVar215;
      auVar282 = vshufps_avx(local_590,local_590,0xff);
      register0x00001390 = auVar282;
      _local_a0 = auVar282;
      fVar256 = auVar282._0_4_;
      fVar271 = auVar282._4_4_;
      fVar274 = auVar282._8_4_;
      fVar277 = auVar282._12_4_;
      fVar315 = auVar215._0_4_;
      fVar316 = auVar215._4_4_;
      fVar317 = auVar215._8_4_;
      auVar282 = vshufps_avx(auVar310,auVar310,0);
      auVar262._16_16_ = auVar282;
      auVar262._0_16_ = auVar282;
      pauVar11 = (undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x484);
      fVar208 = *(float *)*pauVar11;
      fVar228 = *(float *)(bspline_basis0 + lVar21 + 0x488);
      fVar226 = *(float *)(bspline_basis0 + lVar21 + 0x48c);
      fVar293 = *(float *)(bspline_basis0 + lVar21 + 0x490);
      fVar229 = *(float *)(bspline_basis0 + lVar21 + 0x494);
      fVar241 = *(float *)(bspline_basis0 + lVar21 + 0x498);
      fVar243 = *(float *)(bspline_basis0 + lVar21 + 0x49c);
      auVar128 = *(undefined1 (*) [28])*pauVar11;
      fVar245 = *(float *)(bspline_basis0 + lVar21 + 0x4a0);
      fVar255 = auVar282._0_4_;
      fVar270 = auVar282._4_4_;
      fVar273 = auVar282._8_4_;
      fVar276 = auVar282._12_4_;
      auVar282 = vshufps_avx(auVar310,auVar310,0x55);
      register0x00001210 = auVar282;
      _local_600 = auVar282;
      fVar345 = auVar282._0_4_;
      fVar346 = auVar282._4_4_;
      fVar347 = auVar282._8_4_;
      fVar167 = auVar282._12_4_;
      auVar282 = vshufps_avx(auVar360,auVar360,0xff);
      register0x00001590 = auVar282;
      _local_c0 = auVar282;
      fVar371 = auVar282._0_4_;
      fVar373 = auVar282._4_4_;
      fVar375 = auVar282._8_4_;
      fVar144 = auVar282._12_4_;
      auVar113._8_4_ = auVar232._8_4_;
      auVar113._0_8_ = auVar232._0_8_;
      auVar113._12_4_ = auVar232._12_4_;
      auVar282 = vshufps_avx(auVar113,auVar113,0);
      register0x00001510 = auVar282;
      _local_460 = auVar282;
      pauVar9 = (undefined1 (*) [32])(bspline_basis0 + lVar21);
      fVar254 = *(float *)*pauVar9;
      fVar269 = *(float *)(bspline_basis0 + lVar21 + 4);
      fVar272 = *(float *)(bspline_basis0 + lVar21 + 8);
      fVar275 = *(float *)(bspline_basis0 + lVar21 + 0xc);
      fVar279 = *(float *)(bspline_basis0 + lVar21 + 0x10);
      fVar290 = *(float *)(bspline_basis0 + lVar21 + 0x14);
      fVar209 = *(float *)(bspline_basis0 + lVar21 + 0x18);
      auVar129 = *(undefined1 (*) [28])*pauVar9;
      fVar331 = auVar282._0_4_;
      fVar332 = auVar282._4_4_;
      fVar333 = auVar282._8_4_;
      fVar334 = auVar282._12_4_;
      auVar321._0_4_ = fVar331 * fVar254 + fVar255 * fVar208 + fVar186 * fVar291 + fVar335 * fVar294
      ;
      auVar321._4_4_ = fVar332 * fVar269 + fVar270 * fVar228 + fVar202 * fVar292 + fVar369 * fVar354
      ;
      auVar321._8_4_ = fVar333 * fVar272 + fVar273 * fVar226 + fVar204 * fVar351 + fVar370 * fVar250
      ;
      auVar321._12_4_ =
           fVar334 * fVar275 + fVar276 * fVar293 + fVar206 * fVar247 + fVar372 * fVar356;
      auVar321._16_4_ =
           fVar331 * fVar279 + fVar255 * fVar229 + fVar186 * fVar352 + fVar335 * fVar355;
      auVar321._20_4_ =
           fVar332 * fVar290 + fVar270 * fVar241 + fVar202 * fVar251 + fVar369 * fVar357;
      auVar321._24_4_ =
           fVar333 * fVar209 + fVar273 * fVar243 + fVar204 * fVar353 + fVar370 * fVar253;
      auVar321._28_4_ = fVar245 + fVar206 + 0.0 + 0.0;
      auVar218 = vshufps_avx(auVar113,auVar113,0x55);
      register0x000015d0 = auVar218;
      _local_260 = auVar218;
      fVar164 = auVar218._0_4_;
      fVar166 = auVar218._4_4_;
      fVar171 = auVar218._8_4_;
      fVar175 = auVar218._12_4_;
      auVar326._0_4_ = fVar164 * fVar254 + fVar345 * fVar208 + fVar211 * fVar291 + fVar187 * fVar294
      ;
      auVar326._4_4_ = fVar166 * fVar269 + fVar346 * fVar228 + fVar224 * fVar292 + fVar203 * fVar354
      ;
      auVar326._8_4_ = fVar171 * fVar272 + fVar347 * fVar226 + fVar225 * fVar351 + fVar205 * fVar250
      ;
      auVar326._12_4_ =
           fVar175 * fVar275 + fVar167 * fVar293 + fVar227 * fVar247 + fVar207 * fVar356;
      auVar326._16_4_ =
           fVar164 * fVar279 + fVar345 * fVar229 + fVar211 * fVar352 + fVar187 * fVar355;
      auVar326._20_4_ =
           fVar166 * fVar290 + fVar346 * fVar241 + fVar224 * fVar251 + fVar203 * fVar357;
      auVar326._24_4_ =
           fVar171 * fVar209 + fVar347 * fVar243 + fVar225 * fVar353 + fVar205 * fVar253;
      auVar326._28_4_ = fVar167 + fVar227 + fVar207 + 0.0;
      auVar218 = vpermilps_avx(_local_760,0xff);
      register0x00001490 = auVar218;
      _local_240 = auVar218;
      fVar304 = auVar218._0_4_;
      fVar313 = auVar218._4_4_;
      fVar314 = auVar218._8_4_;
      auVar150._0_4_ = fVar304 * fVar254 + fVar371 * fVar208 + fVar315 * fVar291 + fVar256 * fVar294
      ;
      auVar150._4_4_ = fVar313 * fVar269 + fVar373 * fVar228 + fVar316 * fVar292 + fVar271 * fVar354
      ;
      auVar150._8_4_ = fVar314 * fVar272 + fVar375 * fVar226 + fVar317 * fVar351 + fVar274 * fVar250
      ;
      auVar150._12_4_ =
           auVar218._12_4_ * fVar275 +
           fVar144 * fVar293 + auVar215._12_4_ * fVar247 + fVar277 * fVar356;
      auVar150._16_4_ =
           fVar304 * fVar279 + fVar371 * fVar229 + fVar315 * fVar352 + fVar256 * fVar355;
      auVar150._20_4_ =
           fVar313 * fVar290 + fVar373 * fVar241 + fVar316 * fVar251 + fVar271 * fVar357;
      auVar150._24_4_ =
           fVar314 * fVar209 + fVar375 * fVar243 + fVar317 * fVar353 + fVar274 * fVar253;
      auVar150._28_4_ = 0;
      fVar209 = *(float *)(bspline_basis1 + lVar21 + 0x908);
      fVar163 = *(float *)(bspline_basis1 + lVar21 + 0x90c);
      fVar165 = *(float *)(bspline_basis1 + lVar21 + 0x910);
      fVar170 = *(float *)(bspline_basis1 + lVar21 + 0x914);
      fVar174 = *(float *)(bspline_basis1 + lVar21 + 0x918);
      fVar178 = *(float *)(bspline_basis1 + lVar21 + 0x91c);
      fVar181 = *(float *)(bspline_basis1 + lVar21 + 0x920);
      fVar168 = *(float *)(bspline_basis1 + lVar21 + 0xd8c);
      fVar169 = *(float *)(bspline_basis1 + lVar21 + 0xd90);
      fVar172 = *(float *)(bspline_basis1 + lVar21 + 0xd94);
      fVar173 = *(float *)(bspline_basis1 + lVar21 + 0xd98);
      fVar176 = *(float *)(bspline_basis1 + lVar21 + 0xd9c);
      fVar177 = *(float *)(bspline_basis1 + lVar21 + 0xda0);
      fVar180 = *(float *)(bspline_basis1 + lVar21 + 0xda4);
      fVar143 = *(float *)(bspline_basis1 + lVar21 + 0x484);
      fVar183 = *(float *)(bspline_basis1 + lVar21 + 0x488);
      fVar278 = *(float *)(bspline_basis1 + lVar21 + 0x48c);
      fVar242 = *(float *)(bspline_basis1 + lVar21 + 0x490);
      fVar244 = *(float *)(bspline_basis1 + lVar21 + 0x494);
      fVar246 = *(float *)(bspline_basis1 + lVar21 + 0x498);
      fVar248 = *(float *)(bspline_basis1 + lVar21 + 0x49c);
      fVar228 = fVar372 + 0.0;
      fVar249 = *(float *)(bspline_basis1 + lVar21);
      fVar252 = *(float *)(bspline_basis1 + lVar21 + 4);
      fVar295 = *(float *)(bspline_basis1 + lVar21 + 8);
      fVar336 = *(float *)(bspline_basis1 + lVar21 + 0xc);
      fVar342 = *(float *)(bspline_basis1 + lVar21 + 0x10);
      fVar343 = *(float *)(bspline_basis1 + lVar21 + 0x14);
      fVar344 = *(float *)(bspline_basis1 + lVar21 + 0x18);
      auVar263._0_4_ = fVar331 * fVar249 + fVar255 * fVar143 + fVar209 * fVar186 + fVar335 * fVar168
      ;
      auVar263._4_4_ = fVar332 * fVar252 + fVar270 * fVar183 + fVar163 * fVar202 + fVar369 * fVar169
      ;
      auVar263._8_4_ = fVar333 * fVar295 + fVar273 * fVar278 + fVar165 * fVar204 + fVar370 * fVar172
      ;
      auVar263._12_4_ =
           fVar334 * fVar336 + fVar276 * fVar242 + fVar170 * fVar206 + fVar372 * fVar173;
      auVar263._16_4_ =
           fVar331 * fVar342 + fVar255 * fVar244 + fVar174 * fVar186 + fVar335 * fVar176;
      auVar263._20_4_ =
           fVar332 * fVar343 + fVar270 * fVar246 + fVar178 * fVar202 + fVar369 * fVar177;
      auVar263._24_4_ =
           fVar333 * fVar344 + fVar273 * fVar248 + fVar181 * fVar204 + fVar370 * fVar180;
      auVar263._28_4_ = fVar144 + fVar228;
      auVar235._0_4_ = fVar164 * fVar249 + fVar345 * fVar143 + fVar209 * fVar211 + fVar168 * fVar187
      ;
      auVar235._4_4_ = fVar166 * fVar252 + fVar346 * fVar183 + fVar163 * fVar224 + fVar169 * fVar203
      ;
      auVar235._8_4_ = fVar171 * fVar295 + fVar347 * fVar278 + fVar165 * fVar225 + fVar172 * fVar205
      ;
      auVar235._12_4_ =
           fVar175 * fVar336 + fVar167 * fVar242 + fVar170 * fVar227 + fVar173 * fVar207;
      auVar235._16_4_ =
           fVar164 * fVar342 + fVar345 * fVar244 + fVar174 * fVar211 + fVar176 * fVar187;
      auVar235._20_4_ =
           fVar166 * fVar343 + fVar346 * fVar246 + fVar178 * fVar224 + fVar177 * fVar203;
      auVar235._24_4_ =
           fVar171 * fVar344 + fVar347 * fVar248 + fVar181 * fVar225 + fVar180 * fVar205;
      auVar235._28_4_ = fVar228 + fVar372 + fVar245 + 0.0;
      auVar338._0_4_ = fVar371 * fVar143 + fVar315 * fVar209 + fVar256 * fVar168 + fVar304 * fVar249
      ;
      auVar338._4_4_ = fVar373 * fVar183 + fVar316 * fVar163 + fVar271 * fVar169 + fVar313 * fVar252
      ;
      auVar338._8_4_ = fVar375 * fVar278 + fVar317 * fVar165 + fVar274 * fVar172 + fVar314 * fVar295
      ;
      auVar338._12_4_ =
           fVar144 * fVar242 + auVar215._12_4_ * fVar170 + fVar277 * fVar173 +
           auVar218._12_4_ * fVar336;
      auVar338._16_4_ =
           fVar371 * fVar244 + fVar315 * fVar174 + fVar256 * fVar176 + fVar304 * fVar342;
      auVar338._20_4_ =
           fVar373 * fVar246 + fVar316 * fVar178 + fVar271 * fVar177 + fVar313 * fVar343;
      auVar338._24_4_ =
           fVar375 * fVar248 + fVar317 * fVar181 + fVar274 * fVar180 + fVar314 * fVar344;
      auVar338._28_4_ = fVar372 + fVar277 + fVar245 + fVar228;
      auVar29 = vsubps_avx(auVar263,auVar321);
      auVar30 = vsubps_avx(auVar235,auVar326);
      auStack_5d0 = auVar30._16_16_;
      fVar208 = auVar29._0_4_;
      fVar226 = auVar29._4_4_;
      auVar312._4_4_ = auVar326._4_4_ * fVar226;
      auVar312._0_4_ = auVar326._0_4_ * fVar208;
      fVar229 = auVar29._8_4_;
      auVar312._8_4_ = auVar326._8_4_ * fVar229;
      fVar243 = auVar29._12_4_;
      auVar312._12_4_ = auVar326._12_4_ * fVar243;
      fVar254 = auVar29._16_4_;
      auVar312._16_4_ = auVar326._16_4_ * fVar254;
      fVar272 = auVar29._20_4_;
      auVar312._20_4_ = auVar326._20_4_ * fVar272;
      fVar279 = auVar29._24_4_;
      auVar312._24_4_ = auVar326._24_4_ * fVar279;
      auVar312._28_4_ = fVar228;
      fVar228 = auVar30._0_4_;
      fVar293 = auVar30._4_4_;
      auVar287._4_4_ = auVar321._4_4_ * fVar293;
      auVar287._0_4_ = auVar321._0_4_ * fVar228;
      fVar241 = auVar30._8_4_;
      auVar287._8_4_ = auVar321._8_4_ * fVar241;
      fVar245 = auVar30._12_4_;
      auVar287._12_4_ = auVar321._12_4_ * fVar245;
      fVar269 = auVar30._16_4_;
      auVar287._16_4_ = auVar321._16_4_ * fVar269;
      fVar275 = auVar30._20_4_;
      auVar287._20_4_ = auVar321._20_4_ * fVar275;
      fVar290 = auVar30._24_4_;
      auVar287._24_4_ = auVar321._24_4_ * fVar290;
      auVar287._28_4_ = auVar235._28_4_;
      auVar287 = vsubps_avx(auVar312,auVar287);
      auVar312 = vmaxps_avx(auVar150,auVar338);
      auVar35._4_4_ = auVar312._4_4_ * auVar312._4_4_ * (fVar226 * fVar226 + fVar293 * fVar293);
      auVar35._0_4_ = auVar312._0_4_ * auVar312._0_4_ * (fVar208 * fVar208 + fVar228 * fVar228);
      auVar35._8_4_ = auVar312._8_4_ * auVar312._8_4_ * (fVar229 * fVar229 + fVar241 * fVar241);
      auVar35._12_4_ = auVar312._12_4_ * auVar312._12_4_ * (fVar243 * fVar243 + fVar245 * fVar245);
      auVar35._16_4_ = auVar312._16_4_ * auVar312._16_4_ * (fVar254 * fVar254 + fVar269 * fVar269);
      auVar35._20_4_ = auVar312._20_4_ * auVar312._20_4_ * (fVar272 * fVar272 + fVar275 * fVar275);
      auVar35._24_4_ = auVar312._24_4_ * auVar312._24_4_ * (fVar279 * fVar279 + fVar290 * fVar290);
      auVar35._28_4_ = auVar29._28_4_ + auVar235._28_4_;
      auVar22._4_4_ = auVar287._4_4_ * auVar287._4_4_;
      auVar22._0_4_ = auVar287._0_4_ * auVar287._0_4_;
      auVar22._8_4_ = auVar287._8_4_ * auVar287._8_4_;
      auVar22._12_4_ = auVar287._12_4_ * auVar287._12_4_;
      auVar22._16_4_ = auVar287._16_4_ * auVar287._16_4_;
      auVar22._20_4_ = auVar287._20_4_ * auVar287._20_4_;
      auVar22._24_4_ = auVar287._24_4_ * auVar287._24_4_;
      auVar22._28_4_ = auVar287._28_4_;
      auVar312 = vcmpps_avx(auVar22,auVar35,2);
      auVar233._0_4_ = (float)(int)uVar16;
      auVar233._4_12_ = auVar282._4_12_;
      local_540._0_16_ = auVar233;
      auVar215 = vshufps_avx(auVar233,auVar233,0);
      auVar236._16_16_ = auVar215;
      auVar236._0_16_ = auVar215;
      auVar287 = vcmpps_avx(_DAT_02020f40,auVar236,1);
      auVar240 = ZEXT3264(auVar287);
      auVar114._8_4_ = auVar232._8_4_;
      auVar114._0_8_ = auVar232._0_8_;
      auVar114._12_4_ = auVar232._12_4_;
      auVar215 = vpermilps_avx(auVar114,0xaa);
      auVar322._16_16_ = auVar215;
      auVar322._0_16_ = auVar215;
      auVar282 = vpermilps_avx(auVar310,0xaa);
      register0x00001550 = auVar282;
      _local_440 = auVar282;
      auVar218 = vpermilps_avx(auVar320,0xaa);
      register0x00001590 = auVar218;
      _local_e0 = auVar218;
      auVar261 = vpermilps_avx(auVar191,0xaa);
      register0x00001310 = auVar261;
      _local_6a0 = auVar261;
      auVar268 = ZEXT3264(_local_6a0);
      auVar35 = auVar287 & auVar312;
      uVar137 = *(uint *)(ray + k * 4 + 0x60);
      auVar281 = ZEXT416((uint)(auVar281._0_4_ * 4.7683716e-07));
      local_580 = auVar376;
      local_570 = auVar360;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar35 >> 0x7f,0) == '\0') &&
            (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar35 >> 0xbf,0) == '\0') &&
          (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar35[0x1f])
      {
        bVar139 = false;
        auVar312 = local_660;
      }
      else {
        auVar312 = vandps_avx(auVar312,auVar287);
        fVar304 = auVar215._0_4_;
        fVar313 = auVar215._4_4_;
        fVar314 = auVar215._8_4_;
        fVar315 = auVar215._12_4_;
        fVar316 = auVar282._0_4_;
        fVar317 = auVar282._4_4_;
        fVar371 = auVar282._8_4_;
        fVar373 = auVar282._12_4_;
        fVar375 = auVar218._0_4_;
        fVar144 = auVar218._4_4_;
        fVar179 = auVar218._8_4_;
        fVar182 = auVar218._12_4_;
        fVar256 = auVar261._0_4_;
        fVar271 = auVar261._4_4_;
        fVar274 = auVar261._8_4_;
        fVar277 = auVar261._12_4_;
        fVar208 = auVar287._28_4_ +
                  *(float *)(bspline_basis1 + lVar21 + 0x924) +
                  *(float *)(bspline_basis1 + lVar21 + 0x4a0);
        local_4c0._0_4_ =
             fVar304 * fVar249 + fVar316 * fVar143 + fVar375 * fVar209 + fVar256 * fVar168;
        local_4c0._4_4_ =
             fVar313 * fVar252 + fVar317 * fVar183 + fVar144 * fVar163 + fVar271 * fVar169;
        fStack_4b8 = fVar314 * fVar295 + fVar371 * fVar278 + fVar179 * fVar165 + fVar274 * fVar172;
        fStack_4b4 = fVar315 * fVar336 + fVar373 * fVar242 + fVar182 * fVar170 + fVar277 * fVar173;
        fStack_4b0 = fVar304 * fVar342 + fVar316 * fVar244 + fVar375 * fVar174 + fVar256 * fVar176;
        fStack_4ac = fVar313 * fVar343 + fVar317 * fVar246 + fVar144 * fVar178 + fVar271 * fVar177;
        fStack_4a8 = fVar314 * fVar344 + fVar371 * fVar248 + fVar179 * fVar181 + fVar274 * fVar180;
        fStack_4a4 = auVar312._28_4_ + fVar208;
        local_4a0._0_4_ = auVar129._0_4_;
        local_4a0._4_4_ = auVar129._4_4_;
        fStack_498 = auVar129._8_4_;
        fStack_494 = auVar129._12_4_;
        fStack_490 = auVar129._16_4_;
        fStack_48c = auVar129._20_4_;
        fStack_488 = auVar129._24_4_;
        local_480._0_4_ = auVar128._0_4_;
        local_480._4_4_ = auVar128._4_4_;
        fStack_478 = auVar128._8_4_;
        fStack_474 = auVar128._12_4_;
        fStack_470 = auVar128._16_4_;
        fStack_46c = auVar128._20_4_;
        fStack_468 = auVar128._24_4_;
        fVar163 = fVar304 * (float)local_4a0._0_4_ +
                  fVar316 * (float)local_480._0_4_ + fVar375 * fVar291 + fVar256 * fVar294;
        fVar170 = fVar313 * (float)local_4a0._4_4_ +
                  fVar317 * (float)local_480._4_4_ + fVar144 * fVar292 + fVar271 * fVar354;
        fVar178 = fVar314 * fStack_498 +
                  fVar371 * fStack_478 + fVar179 * fVar351 + fVar274 * fVar250;
        fVar168 = fVar315 * fStack_494 +
                  fVar373 * fStack_474 + fVar182 * fVar247 + fVar277 * fVar356;
        fVar172 = fVar304 * fStack_490 +
                  fVar316 * fStack_470 + fVar375 * fVar352 + fVar256 * fVar355;
        fVar176 = fVar313 * fStack_48c +
                  fVar317 * fStack_46c + fVar144 * fVar251 + fVar271 * fVar357;
        fVar180 = fVar314 * fStack_488 +
                  fVar371 * fStack_468 + fVar179 * fVar353 + fVar274 * fVar253;
        fVar183 = fStack_4a4 + fVar208 + auVar312._28_4_ + auVar287._28_4_;
        fVar208 = *(float *)(bspline_basis0 + lVar21 + 0x1210);
        fVar228 = *(float *)(bspline_basis0 + lVar21 + 0x1214);
        fVar226 = *(float *)(bspline_basis0 + lVar21 + 0x1218);
        fVar293 = *(float *)(bspline_basis0 + lVar21 + 0x121c);
        fVar229 = *(float *)(bspline_basis0 + lVar21 + 0x1220);
        fVar241 = *(float *)(bspline_basis0 + lVar21 + 0x1224);
        fVar243 = *(float *)(bspline_basis0 + lVar21 + 0x1228);
        fVar245 = *(float *)(bspline_basis0 + lVar21 + 0x1694);
        fVar254 = *(float *)(bspline_basis0 + lVar21 + 0x1698);
        fVar269 = *(float *)(bspline_basis0 + lVar21 + 0x169c);
        fVar272 = *(float *)(bspline_basis0 + lVar21 + 0x16a0);
        fVar275 = *(float *)(bspline_basis0 + lVar21 + 0x16a4);
        fVar279 = *(float *)(bspline_basis0 + lVar21 + 0x16a8);
        fVar290 = *(float *)(bspline_basis0 + lVar21 + 0x16ac);
        fVar291 = *(float *)(bspline_basis0 + lVar21 + 0x1b18);
        fVar292 = *(float *)(bspline_basis0 + lVar21 + 0x1b1c);
        fVar351 = *(float *)(bspline_basis0 + lVar21 + 0x1b20);
        fVar247 = *(float *)(bspline_basis0 + lVar21 + 0x1b24);
        fVar352 = *(float *)(bspline_basis0 + lVar21 + 0x1b28);
        fVar251 = *(float *)(bspline_basis0 + lVar21 + 0x1b2c);
        fVar353 = *(float *)(bspline_basis0 + lVar21 + 0x1b30);
        fVar294 = *(float *)(bspline_basis0 + lVar21 + 0x1f9c);
        fVar354 = *(float *)(bspline_basis0 + lVar21 + 0x1fa0);
        fVar250 = *(float *)(bspline_basis0 + lVar21 + 0x1fa4);
        fVar356 = *(float *)(bspline_basis0 + lVar21 + 0x1fa8);
        fVar355 = *(float *)(bspline_basis0 + lVar21 + 0x1fac);
        fVar357 = *(float *)(bspline_basis0 + lVar21 + 0x1fb0);
        fVar253 = *(float *)(bspline_basis0 + lVar21 + 0x1fb4);
        fVar165 = auVar326._28_4_ + *(float *)(bspline_basis1 + lVar21 + 0x4a0);
        fVar209 = *(float *)(bspline_basis0 + lVar21 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar21 + 0x1fb8);
        fVar174 = *(float *)(bspline_basis0 + lVar21 + 0x16b0) + fVar209;
        auVar151._0_4_ =
             fVar208 * fVar331 + fVar255 * fVar245 + fVar186 * fVar291 + fVar335 * fVar294;
        auVar151._4_4_ =
             fVar228 * fVar332 + fVar270 * fVar254 + fVar202 * fVar292 + fVar369 * fVar354;
        auVar151._8_4_ =
             fVar226 * fVar333 + fVar273 * fVar269 + fVar204 * fVar351 + fVar370 * fVar250;
        auVar151._12_4_ =
             fVar293 * fVar334 + fVar276 * fVar272 + fVar206 * fVar247 + fVar372 * fVar356;
        auVar151._16_4_ =
             fVar229 * fVar331 + fVar255 * fVar275 + fVar186 * fVar352 + fVar335 * fVar355;
        auVar151._20_4_ =
             fVar241 * fVar332 + fVar270 * fVar279 + fVar202 * fVar251 + fVar369 * fVar357;
        auVar151._24_4_ =
             fVar243 * fVar333 + fVar273 * fVar290 + fVar204 * fVar353 + fVar370 * fVar253;
        auVar151._28_4_ =
             *(float *)(bspline_basis0 + lVar21 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar21 + 0x1fb8) + fVar165;
        auVar194._0_4_ =
             fVar164 * fVar208 + fVar291 * fVar211 + fVar187 * fVar294 + fVar345 * fVar245;
        auVar194._4_4_ =
             fVar166 * fVar228 + fVar292 * fVar224 + fVar203 * fVar354 + fVar346 * fVar254;
        auVar194._8_4_ =
             fVar171 * fVar226 + fVar351 * fVar225 + fVar205 * fVar250 + fVar347 * fVar269;
        auVar194._12_4_ =
             fVar175 * fVar293 + fVar247 * fVar227 + fVar207 * fVar356 + fVar167 * fVar272;
        auVar194._16_4_ =
             fVar164 * fVar229 + fVar352 * fVar211 + fVar187 * fVar355 + fVar345 * fVar275;
        auVar194._20_4_ =
             fVar166 * fVar241 + fVar251 * fVar224 + fVar203 * fVar357 + fVar346 * fVar279;
        auVar194._24_4_ =
             fVar171 * fVar243 + fVar353 * fVar225 + fVar205 * fVar253 + fVar347 * fVar290;
        auVar194._28_4_ =
             fVar209 + auVar326._28_4_ + *(float *)(bspline_basis1 + lVar21 + 0x1c) + fVar165;
        auVar283._0_4_ =
             fVar316 * fVar245 + fVar375 * fVar291 + fVar256 * fVar294 + fVar304 * fVar208;
        auVar283._4_4_ =
             fVar317 * fVar254 + fVar144 * fVar292 + fVar271 * fVar354 + fVar313 * fVar228;
        auVar283._8_4_ =
             fVar371 * fVar269 + fVar179 * fVar351 + fVar274 * fVar250 + fVar314 * fVar226;
        auVar283._12_4_ =
             fVar373 * fVar272 + fVar182 * fVar247 + fVar277 * fVar356 + fVar315 * fVar293;
        auVar283._16_4_ =
             fVar316 * fVar275 + fVar375 * fVar352 + fVar256 * fVar355 + fVar304 * fVar229;
        auVar283._20_4_ =
             fVar317 * fVar279 + fVar144 * fVar251 + fVar271 * fVar357 + fVar313 * fVar241;
        auVar283._24_4_ =
             fVar371 * fVar290 + fVar179 * fVar353 + fVar274 * fVar253 + fVar314 * fVar243;
        auVar283._28_4_ = fVar174 + *(float *)(bspline_basis0 + lVar21 + 0x122c);
        fVar208 = *(float *)(bspline_basis1 + lVar21 + 0x1b18);
        fVar228 = *(float *)(bspline_basis1 + lVar21 + 0x1b1c);
        fVar226 = *(float *)(bspline_basis1 + lVar21 + 0x1b20);
        fVar293 = *(float *)(bspline_basis1 + lVar21 + 0x1b24);
        fVar229 = *(float *)(bspline_basis1 + lVar21 + 0x1b28);
        fVar241 = *(float *)(bspline_basis1 + lVar21 + 0x1b2c);
        fVar243 = *(float *)(bspline_basis1 + lVar21 + 0x1b30);
        fVar245 = *(float *)(bspline_basis1 + lVar21 + 0x1f9c);
        fVar254 = *(float *)(bspline_basis1 + lVar21 + 0x1fa0);
        fVar269 = *(float *)(bspline_basis1 + lVar21 + 0x1fa4);
        fVar272 = *(float *)(bspline_basis1 + lVar21 + 0x1fa8);
        fVar275 = *(float *)(bspline_basis1 + lVar21 + 0x1fac);
        fVar279 = *(float *)(bspline_basis1 + lVar21 + 0x1fb0);
        fVar290 = *(float *)(bspline_basis1 + lVar21 + 0x1fb4);
        fVar291 = *(float *)(bspline_basis1 + lVar21 + 0x1694);
        fVar292 = *(float *)(bspline_basis1 + lVar21 + 0x1698);
        fVar351 = *(float *)(bspline_basis1 + lVar21 + 0x169c);
        fVar247 = *(float *)(bspline_basis1 + lVar21 + 0x16a0);
        fVar352 = *(float *)(bspline_basis1 + lVar21 + 0x16a4);
        fVar251 = *(float *)(bspline_basis1 + lVar21 + 0x16a8);
        fVar353 = *(float *)(bspline_basis1 + lVar21 + 0x16ac);
        fVar294 = *(float *)(bspline_basis1 + lVar21 + 0x1210);
        fVar354 = *(float *)(bspline_basis1 + lVar21 + 0x1214);
        fVar250 = *(float *)(bspline_basis1 + lVar21 + 0x1218);
        fVar356 = *(float *)(bspline_basis1 + lVar21 + 0x121c);
        fVar355 = *(float *)(bspline_basis1 + lVar21 + 0x1220);
        fVar357 = *(float *)(bspline_basis1 + lVar21 + 0x1224);
        fVar253 = *(float *)(bspline_basis1 + lVar21 + 0x1228);
        auVar299._0_4_ =
             fVar331 * fVar294 + fVar255 * fVar291 + fVar186 * fVar208 + fVar335 * fVar245;
        auVar299._4_4_ =
             fVar332 * fVar354 + fVar270 * fVar292 + fVar202 * fVar228 + fVar369 * fVar254;
        auVar299._8_4_ =
             fVar333 * fVar250 + fVar273 * fVar351 + fVar204 * fVar226 + fVar370 * fVar269;
        auVar299._12_4_ =
             fVar334 * fVar356 + fVar276 * fVar247 + fVar206 * fVar293 + fVar372 * fVar272;
        auVar299._16_4_ =
             fVar331 * fVar355 + fVar255 * fVar352 + fVar186 * fVar229 + fVar335 * fVar275;
        auVar299._20_4_ =
             fVar332 * fVar357 + fVar270 * fVar251 + fVar202 * fVar241 + fVar369 * fVar279;
        auVar299._24_4_ =
             fVar333 * fVar253 + fVar273 * fVar353 + fVar204 * fVar243 + fVar370 * fVar290;
        auVar299._28_4_ = fVar206 + fVar206 + fVar174 + fVar372;
        auVar327._0_4_ =
             fVar164 * fVar294 + fVar345 * fVar291 + fVar208 * fVar211 + fVar187 * fVar245;
        auVar327._4_4_ =
             fVar166 * fVar354 + fVar346 * fVar292 + fVar228 * fVar224 + fVar203 * fVar254;
        auVar327._8_4_ =
             fVar171 * fVar250 + fVar347 * fVar351 + fVar226 * fVar225 + fVar205 * fVar269;
        auVar327._12_4_ =
             fVar175 * fVar356 + fVar167 * fVar247 + fVar293 * fVar227 + fVar207 * fVar272;
        auVar327._16_4_ =
             fVar164 * fVar355 + fVar345 * fVar352 + fVar229 * fVar211 + fVar187 * fVar275;
        auVar327._20_4_ =
             fVar166 * fVar357 + fVar346 * fVar251 + fVar241 * fVar224 + fVar203 * fVar279;
        auVar327._24_4_ =
             fVar171 * fVar253 + fVar347 * fVar353 + fVar243 * fVar225 + fVar205 * fVar290;
        auVar327._28_4_ = fVar206 + fVar206 + fVar206 + fVar174;
        auVar220._0_4_ =
             fVar304 * fVar294 + fVar316 * fVar291 + fVar375 * fVar208 + fVar245 * fVar256;
        auVar220._4_4_ =
             fVar313 * fVar354 + fVar317 * fVar292 + fVar144 * fVar228 + fVar254 * fVar271;
        auVar220._8_4_ =
             fVar314 * fVar250 + fVar371 * fVar351 + fVar179 * fVar226 + fVar269 * fVar274;
        auVar220._12_4_ =
             fVar315 * fVar356 + fVar373 * fVar247 + fVar182 * fVar293 + fVar272 * fVar277;
        auVar220._16_4_ =
             fVar304 * fVar355 + fVar316 * fVar352 + fVar375 * fVar229 + fVar275 * fVar256;
        auVar220._20_4_ =
             fVar313 * fVar357 + fVar317 * fVar251 + fVar144 * fVar241 + fVar279 * fVar271;
        auVar220._24_4_ =
             fVar314 * fVar253 + fVar371 * fVar353 + fVar179 * fVar243 + fVar290 * fVar274;
        auVar220._28_4_ =
             *(float *)(bspline_basis1 + lVar21 + 0x122c) +
             *(float *)(bspline_basis1 + lVar21 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar21 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar21 + 0x1fb8);
        auVar264._8_4_ = 0x7fffffff;
        auVar264._0_8_ = 0x7fffffff7fffffff;
        auVar264._12_4_ = 0x7fffffff;
        auVar264._16_4_ = 0x7fffffff;
        auVar264._20_4_ = 0x7fffffff;
        auVar264._24_4_ = 0x7fffffff;
        auVar264._28_4_ = 0x7fffffff;
        auVar287 = vandps_avx(auVar151,auVar264);
        auVar35 = vandps_avx(auVar194,auVar264);
        auVar35 = vmaxps_avx(auVar287,auVar35);
        auVar287 = vandps_avx(auVar283,auVar264);
        auVar287 = vmaxps_avx(auVar35,auVar287);
        auVar215 = vpermilps_avx(auVar281,0);
        auVar284._16_16_ = auVar215;
        auVar284._0_16_ = auVar215;
        auVar287 = vcmpps_avx(auVar287,auVar284,1);
        auVar22 = vblendvps_avx(auVar151,auVar29,auVar287);
        auVar236 = vblendvps_avx(auVar194,auVar30,auVar287);
        auVar287 = vandps_avx(auVar299,auVar264);
        auVar35 = vandps_avx(auVar327,auVar264);
        auVar31 = vmaxps_avx(auVar287,auVar35);
        auVar287 = vandps_avx(auVar220,auVar264);
        auVar287 = vmaxps_avx(auVar31,auVar287);
        auVar31 = vcmpps_avx(auVar287,auVar284,1);
        auVar287 = vblendvps_avx(auVar299,auVar29,auVar31);
        auVar29 = vblendvps_avx(auVar327,auVar30,auVar31);
        fVar165 = auVar22._0_4_;
        fVar174 = auVar22._4_4_;
        fVar181 = auVar22._8_4_;
        fVar169 = auVar22._12_4_;
        fVar173 = auVar22._16_4_;
        fVar177 = auVar22._20_4_;
        fVar143 = auVar22._24_4_;
        fVar295 = -auVar22._28_4_;
        fVar278 = auVar287._0_4_;
        fVar242 = auVar287._4_4_;
        fVar244 = auVar287._8_4_;
        fVar246 = auVar287._12_4_;
        fVar248 = auVar287._16_4_;
        fVar249 = auVar287._20_4_;
        fVar252 = auVar287._24_4_;
        fVar208 = auVar236._0_4_;
        fVar229 = auVar236._4_4_;
        fVar254 = auVar236._8_4_;
        fVar279 = auVar236._12_4_;
        fVar351 = auVar236._16_4_;
        fVar353 = auVar236._20_4_;
        fVar356 = auVar236._24_4_;
        auVar152._0_4_ = fVar208 * fVar208 + fVar165 * fVar165;
        auVar152._4_4_ = fVar229 * fVar229 + fVar174 * fVar174;
        auVar152._8_4_ = fVar254 * fVar254 + fVar181 * fVar181;
        auVar152._12_4_ = fVar279 * fVar279 + fVar169 * fVar169;
        auVar152._16_4_ = fVar351 * fVar351 + fVar173 * fVar173;
        auVar152._20_4_ = fVar353 * fVar353 + fVar177 * fVar177;
        auVar152._24_4_ = fVar356 * fVar356 + fVar143 * fVar143;
        auVar152._28_4_ = auVar327._28_4_ + auVar22._28_4_;
        auVar30 = vrsqrtps_avx(auVar152);
        fVar228 = auVar30._0_4_;
        fVar226 = auVar30._4_4_;
        auVar31._4_4_ = fVar226 * 1.5;
        auVar31._0_4_ = fVar228 * 1.5;
        fVar293 = auVar30._8_4_;
        auVar31._8_4_ = fVar293 * 1.5;
        fVar241 = auVar30._12_4_;
        auVar31._12_4_ = fVar241 * 1.5;
        fVar243 = auVar30._16_4_;
        auVar31._16_4_ = fVar243 * 1.5;
        fVar245 = auVar30._20_4_;
        auVar31._20_4_ = fVar245 * 1.5;
        fVar269 = auVar30._24_4_;
        fVar209 = auVar35._28_4_;
        auVar31._24_4_ = fVar269 * 1.5;
        auVar31._28_4_ = fVar209;
        auVar30._4_4_ = fVar226 * fVar226 * fVar226 * auVar152._4_4_ * 0.5;
        auVar30._0_4_ = fVar228 * fVar228 * fVar228 * auVar152._0_4_ * 0.5;
        auVar30._8_4_ = fVar293 * fVar293 * fVar293 * auVar152._8_4_ * 0.5;
        auVar30._12_4_ = fVar241 * fVar241 * fVar241 * auVar152._12_4_ * 0.5;
        auVar30._16_4_ = fVar243 * fVar243 * fVar243 * auVar152._16_4_ * 0.5;
        auVar30._20_4_ = fVar245 * fVar245 * fVar245 * auVar152._20_4_ * 0.5;
        auVar30._24_4_ = fVar269 * fVar269 * fVar269 * auVar152._24_4_ * 0.5;
        auVar30._28_4_ = auVar152._28_4_;
        auVar30 = vsubps_avx(auVar31,auVar30);
        fVar228 = auVar30._0_4_;
        fVar241 = auVar30._4_4_;
        fVar269 = auVar30._8_4_;
        fVar290 = auVar30._12_4_;
        fVar247 = auVar30._16_4_;
        fVar294 = auVar30._20_4_;
        fVar355 = auVar30._24_4_;
        fVar226 = auVar29._0_4_;
        fVar243 = auVar29._4_4_;
        fVar272 = auVar29._8_4_;
        fVar291 = auVar29._12_4_;
        fVar352 = auVar29._16_4_;
        fVar354 = auVar29._20_4_;
        fVar357 = auVar29._24_4_;
        auVar153._0_4_ = fVar226 * fVar226 + fVar278 * fVar278;
        auVar153._4_4_ = fVar243 * fVar243 + fVar242 * fVar242;
        auVar153._8_4_ = fVar272 * fVar272 + fVar244 * fVar244;
        auVar153._12_4_ = fVar291 * fVar291 + fVar246 * fVar246;
        auVar153._16_4_ = fVar352 * fVar352 + fVar248 * fVar248;
        auVar153._20_4_ = fVar354 * fVar354 + fVar249 * fVar249;
        auVar153._24_4_ = fVar357 * fVar357 + fVar252 * fVar252;
        auVar153._28_4_ = auVar287._28_4_ + auVar30._28_4_;
        auVar287 = vrsqrtps_avx(auVar153);
        fVar293 = auVar287._0_4_;
        fVar245 = auVar287._4_4_;
        auVar32._4_4_ = fVar245 * 1.5;
        auVar32._0_4_ = fVar293 * 1.5;
        fVar275 = auVar287._8_4_;
        auVar32._8_4_ = fVar275 * 1.5;
        fVar292 = auVar287._12_4_;
        auVar32._12_4_ = fVar292 * 1.5;
        fVar251 = auVar287._16_4_;
        auVar32._16_4_ = fVar251 * 1.5;
        fVar250 = auVar287._20_4_;
        auVar32._20_4_ = fVar250 * 1.5;
        fVar253 = auVar287._24_4_;
        auVar32._24_4_ = fVar253 * 1.5;
        auVar32._28_4_ = fVar209;
        auVar33._4_4_ = fVar245 * fVar245 * fVar245 * auVar153._4_4_ * 0.5;
        auVar33._0_4_ = fVar293 * fVar293 * fVar293 * auVar153._0_4_ * 0.5;
        auVar33._8_4_ = fVar275 * fVar275 * fVar275 * auVar153._8_4_ * 0.5;
        auVar33._12_4_ = fVar292 * fVar292 * fVar292 * auVar153._12_4_ * 0.5;
        auVar33._16_4_ = fVar251 * fVar251 * fVar251 * auVar153._16_4_ * 0.5;
        auVar33._20_4_ = fVar250 * fVar250 * fVar250 * auVar153._20_4_ * 0.5;
        auVar33._24_4_ = fVar253 * fVar253 * fVar253 * auVar153._24_4_ * 0.5;
        auVar33._28_4_ = auVar153._28_4_;
        auVar287 = vsubps_avx(auVar32,auVar33);
        fVar293 = auVar287._0_4_;
        fVar245 = auVar287._4_4_;
        fVar275 = auVar287._8_4_;
        fVar292 = auVar287._12_4_;
        fVar251 = auVar287._16_4_;
        fVar250 = auVar287._20_4_;
        fVar253 = auVar287._24_4_;
        fVar336 = auVar150._0_4_ * fVar208 * fVar228;
        fVar342 = auVar150._4_4_ * fVar229 * fVar241;
        auVar34._4_4_ = fVar342;
        auVar34._0_4_ = fVar336;
        fVar343 = auVar150._8_4_ * fVar254 * fVar269;
        auVar34._8_4_ = fVar343;
        fVar344 = auVar150._12_4_ * fVar279 * fVar290;
        auVar34._12_4_ = fVar344;
        fVar345 = auVar150._16_4_ * fVar351 * fVar247;
        auVar34._16_4_ = fVar345;
        fVar346 = auVar150._20_4_ * fVar353 * fVar294;
        auVar34._20_4_ = fVar346;
        fVar347 = auVar150._24_4_ * fVar356 * fVar355;
        auVar34._24_4_ = fVar347;
        auVar34._28_4_ = fVar209;
        fVar208 = auVar150._0_4_ * fVar228 * -fVar165;
        fVar229 = auVar150._4_4_ * fVar241 * -fVar174;
        auVar36._4_4_ = fVar229;
        auVar36._0_4_ = fVar208;
        fVar254 = auVar150._8_4_ * fVar269 * -fVar181;
        auVar36._8_4_ = fVar254;
        fVar279 = auVar150._12_4_ * fVar290 * -fVar169;
        auVar36._12_4_ = fVar279;
        fVar351 = auVar150._16_4_ * fVar247 * -fVar173;
        auVar36._16_4_ = fVar351;
        fVar353 = auVar150._20_4_ * fVar294 * -fVar177;
        auVar36._20_4_ = fVar353;
        fVar356 = auVar150._24_4_ * fVar355 * -fVar143;
        auVar36._24_4_ = fVar356;
        auVar36._28_4_ = fVar295;
        local_6e0._4_4_ = auVar326._4_4_ + fVar229;
        local_6e0._0_4_ = auVar326._0_4_ + fVar208;
        uStack_6d8._0_4_ = auVar326._8_4_ + fVar254;
        uStack_6d8._4_4_ = auVar326._12_4_ + fVar279;
        fStack_6d0 = auVar326._16_4_ + fVar351;
        fStack_6cc = auVar326._20_4_ + fVar353;
        fStack_6c8 = auVar326._24_4_ + fVar356;
        fStack_6c4 = auVar326._28_4_ + fVar295;
        fVar208 = fVar228 * 0.0 * auVar150._0_4_;
        fVar228 = fVar241 * 0.0 * auVar150._4_4_;
        auVar37._4_4_ = fVar228;
        auVar37._0_4_ = fVar208;
        fVar229 = fVar269 * 0.0 * auVar150._8_4_;
        auVar37._8_4_ = fVar229;
        fVar241 = fVar290 * 0.0 * auVar150._12_4_;
        auVar37._12_4_ = fVar241;
        fVar254 = fVar247 * 0.0 * auVar150._16_4_;
        auVar37._16_4_ = fVar254;
        fVar269 = fVar294 * 0.0 * auVar150._20_4_;
        auVar37._20_4_ = fVar269;
        fVar279 = fVar355 * 0.0 * auVar150._24_4_;
        auVar37._24_4_ = fVar279;
        auVar37._28_4_ = fVar373;
        auVar118._4_4_ = fVar170;
        auVar118._0_4_ = fVar163;
        auVar118._8_4_ = fVar178;
        auVar118._12_4_ = fVar168;
        auVar118._16_4_ = fVar172;
        auVar118._20_4_ = fVar176;
        auVar118._24_4_ = fVar180;
        auVar118._28_4_ = fVar183;
        auVar300._0_4_ = fVar163 + fVar208;
        auVar300._4_4_ = fVar170 + fVar228;
        auVar300._8_4_ = fVar178 + fVar229;
        auVar300._12_4_ = fVar168 + fVar241;
        auVar300._16_4_ = fVar172 + fVar254;
        auVar300._20_4_ = fVar176 + fVar269;
        auVar300._24_4_ = fVar180 + fVar279;
        auVar300._28_4_ = fVar183 + fVar373;
        fVar208 = auVar338._0_4_ * fVar226 * fVar293;
        fVar228 = auVar338._4_4_ * fVar243 * fVar245;
        auVar38._4_4_ = fVar228;
        auVar38._0_4_ = fVar208;
        fVar226 = auVar338._8_4_ * fVar272 * fVar275;
        auVar38._8_4_ = fVar226;
        fVar229 = auVar338._12_4_ * fVar291 * fVar292;
        auVar38._12_4_ = fVar229;
        fVar241 = auVar338._16_4_ * fVar352 * fVar251;
        auVar38._16_4_ = fVar241;
        fVar243 = auVar338._20_4_ * fVar354 * fVar250;
        auVar38._20_4_ = fVar243;
        fVar254 = auVar338._24_4_ * fVar357 * fVar253;
        auVar38._24_4_ = fVar254;
        auVar38._28_4_ = auVar29._28_4_;
        auVar236 = vsubps_avx(auVar321,auVar34);
        auVar339._0_4_ = auVar263._0_4_ + fVar208;
        auVar339._4_4_ = auVar263._4_4_ + fVar228;
        auVar339._8_4_ = auVar263._8_4_ + fVar226;
        auVar339._12_4_ = auVar263._12_4_ + fVar229;
        auVar339._16_4_ = auVar263._16_4_ + fVar241;
        auVar339._20_4_ = auVar263._20_4_ + fVar243;
        auVar339._24_4_ = auVar263._24_4_ + fVar254;
        auVar339._28_4_ = auVar263._28_4_ + auVar29._28_4_;
        fVar208 = auVar338._0_4_ * fVar293 * -fVar278;
        fVar228 = auVar338._4_4_ * fVar245 * -fVar242;
        auVar29._4_4_ = fVar228;
        auVar29._0_4_ = fVar208;
        fVar226 = auVar338._8_4_ * fVar275 * -fVar244;
        auVar29._8_4_ = fVar226;
        fVar229 = auVar338._12_4_ * fVar292 * -fVar246;
        auVar29._12_4_ = fVar229;
        fVar241 = auVar338._16_4_ * fVar251 * -fVar248;
        auVar29._16_4_ = fVar241;
        fVar243 = auVar338._20_4_ * fVar250 * -fVar249;
        auVar29._20_4_ = fVar243;
        fVar254 = auVar338._24_4_ * fVar253 * -fVar252;
        auVar29._24_4_ = fVar254;
        auVar29._28_4_ = fVar182;
        auVar31 = vsubps_avx(auVar326,auVar36);
        auVar349._0_4_ = fVar208 + auVar235._0_4_;
        auVar349._4_4_ = fVar228 + auVar235._4_4_;
        auVar349._8_4_ = fVar226 + auVar235._8_4_;
        auVar349._12_4_ = fVar229 + auVar235._12_4_;
        auVar349._16_4_ = fVar241 + auVar235._16_4_;
        auVar349._20_4_ = fVar243 + auVar235._20_4_;
        auVar349._24_4_ = fVar254 + auVar235._24_4_;
        auVar349._28_4_ = fVar182 + auVar235._28_4_;
        fVar208 = fVar293 * 0.0 * auVar338._0_4_;
        fVar228 = fVar245 * 0.0 * auVar338._4_4_;
        auVar39._4_4_ = fVar228;
        auVar39._0_4_ = fVar208;
        fVar226 = fVar275 * 0.0 * auVar338._8_4_;
        auVar39._8_4_ = fVar226;
        fVar293 = fVar292 * 0.0 * auVar338._12_4_;
        auVar39._12_4_ = fVar293;
        fVar229 = fVar251 * 0.0 * auVar338._16_4_;
        auVar39._16_4_ = fVar229;
        fVar241 = fVar250 * 0.0 * auVar338._20_4_;
        auVar39._20_4_ = fVar241;
        fVar243 = fVar253 * 0.0 * auVar338._24_4_;
        auVar39._24_4_ = fVar243;
        auVar39._28_4_ = fVar295;
        auVar32 = vsubps_avx(auVar118,auVar37);
        auVar380._0_4_ = (float)local_4c0._0_4_ + fVar208;
        auVar380._4_4_ = (float)local_4c0._4_4_ + fVar228;
        auVar380._8_4_ = fStack_4b8 + fVar226;
        auVar380._12_4_ = fStack_4b4 + fVar293;
        auVar380._16_4_ = fStack_4b0 + fVar229;
        auVar380._20_4_ = fStack_4ac + fVar241;
        auVar380._24_4_ = fStack_4a8 + fVar243;
        auVar380._28_4_ = fStack_4a4 + fVar295;
        auVar287 = vsubps_avx(auVar263,auVar38);
        auVar29 = vsubps_avx(auVar235,auVar29);
        auVar30 = vsubps_avx(_local_4c0,auVar39);
        auVar35 = vsubps_avx(auVar349,auVar31);
        auVar22 = vsubps_avx(auVar380,auVar32);
        auVar40._4_4_ = auVar32._4_4_ * auVar35._4_4_;
        auVar40._0_4_ = auVar32._0_4_ * auVar35._0_4_;
        auVar40._8_4_ = auVar32._8_4_ * auVar35._8_4_;
        auVar40._12_4_ = auVar32._12_4_ * auVar35._12_4_;
        auVar40._16_4_ = auVar32._16_4_ * auVar35._16_4_;
        auVar40._20_4_ = auVar32._20_4_ * auVar35._20_4_;
        auVar40._24_4_ = auVar32._24_4_ * auVar35._24_4_;
        auVar40._28_4_ = fVar182;
        auVar41._4_4_ = auVar31._4_4_ * auVar22._4_4_;
        auVar41._0_4_ = auVar31._0_4_ * auVar22._0_4_;
        auVar41._8_4_ = auVar31._8_4_ * auVar22._8_4_;
        auVar41._12_4_ = auVar31._12_4_ * auVar22._12_4_;
        auVar41._16_4_ = auVar31._16_4_ * auVar22._16_4_;
        auVar41._20_4_ = auVar31._20_4_ * auVar22._20_4_;
        auVar41._24_4_ = auVar31._24_4_ * auVar22._24_4_;
        auVar41._28_4_ = auVar235._28_4_;
        auVar235 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = auVar236._4_4_ * auVar22._4_4_;
        auVar42._0_4_ = auVar236._0_4_ * auVar22._0_4_;
        auVar42._8_4_ = auVar236._8_4_ * auVar22._8_4_;
        auVar42._12_4_ = auVar236._12_4_ * auVar22._12_4_;
        auVar42._16_4_ = auVar236._16_4_ * auVar22._16_4_;
        auVar42._20_4_ = auVar236._20_4_ * auVar22._20_4_;
        auVar42._24_4_ = auVar236._24_4_ * auVar22._24_4_;
        auVar42._28_4_ = auVar22._28_4_;
        auVar326 = vsubps_avx(auVar339,auVar236);
        auVar43._4_4_ = auVar32._4_4_ * auVar326._4_4_;
        auVar43._0_4_ = auVar32._0_4_ * auVar326._0_4_;
        auVar43._8_4_ = auVar32._8_4_ * auVar326._8_4_;
        auVar43._12_4_ = auVar32._12_4_ * auVar326._12_4_;
        auVar43._16_4_ = auVar32._16_4_ * auVar326._16_4_;
        auVar43._20_4_ = auVar32._20_4_ * auVar326._20_4_;
        auVar43._24_4_ = auVar32._24_4_ * auVar326._24_4_;
        auVar43._28_4_ = auVar263._28_4_;
        auVar263 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar326._4_4_ * auVar31._4_4_;
        auVar44._0_4_ = auVar326._0_4_ * auVar31._0_4_;
        auVar44._8_4_ = auVar326._8_4_ * auVar31._8_4_;
        auVar44._12_4_ = auVar326._12_4_ * auVar31._12_4_;
        auVar44._16_4_ = auVar326._16_4_ * auVar31._16_4_;
        auVar44._20_4_ = auVar326._20_4_ * auVar31._20_4_;
        auVar44._24_4_ = auVar326._24_4_ * auVar31._24_4_;
        auVar44._28_4_ = auVar22._28_4_;
        auVar45._4_4_ = auVar236._4_4_ * auVar35._4_4_;
        auVar45._0_4_ = auVar236._0_4_ * auVar35._0_4_;
        auVar45._8_4_ = auVar236._8_4_ * auVar35._8_4_;
        auVar45._12_4_ = auVar236._12_4_ * auVar35._12_4_;
        auVar45._16_4_ = auVar236._16_4_ * auVar35._16_4_;
        auVar45._20_4_ = auVar236._20_4_ * auVar35._20_4_;
        auVar45._24_4_ = auVar236._24_4_ * auVar35._24_4_;
        auVar45._28_4_ = auVar35._28_4_;
        auVar35 = vsubps_avx(auVar45,auVar44);
        auVar154._0_4_ = auVar235._0_4_ * 0.0 + auVar35._0_4_ + auVar263._0_4_ * 0.0;
        auVar154._4_4_ = auVar235._4_4_ * 0.0 + auVar35._4_4_ + auVar263._4_4_ * 0.0;
        auVar154._8_4_ = auVar235._8_4_ * 0.0 + auVar35._8_4_ + auVar263._8_4_ * 0.0;
        auVar154._12_4_ = auVar235._12_4_ * 0.0 + auVar35._12_4_ + auVar263._12_4_ * 0.0;
        auVar154._16_4_ = auVar235._16_4_ * 0.0 + auVar35._16_4_ + auVar263._16_4_ * 0.0;
        auVar154._20_4_ = auVar235._20_4_ * 0.0 + auVar35._20_4_ + auVar263._20_4_ * 0.0;
        auVar154._24_4_ = auVar235._24_4_ * 0.0 + auVar35._24_4_ + auVar263._24_4_ * 0.0;
        auVar154._28_4_ = auVar35._28_4_ + auVar35._28_4_ + auVar263._28_4_;
        auVar326 = vcmpps_avx(auVar154,ZEXT432(0) << 0x20,2);
        auVar116._4_4_ = fVar342 + auVar321._4_4_;
        auVar116._0_4_ = fVar336 + auVar321._0_4_;
        auVar116._8_4_ = fVar343 + auVar321._8_4_;
        auVar116._12_4_ = fVar344 + auVar321._12_4_;
        auVar116._16_4_ = fVar345 + auVar321._16_4_;
        auVar116._20_4_ = fVar346 + auVar321._20_4_;
        auVar116._24_4_ = fVar347 + auVar321._24_4_;
        auVar116._28_4_ = fVar209 + auVar321._28_4_;
        auVar287 = vblendvps_avx(auVar287,auVar116,auVar326);
        auVar29 = vblendvps_avx(auVar29,_local_6e0,auVar326);
        auVar30 = vblendvps_avx(auVar30,auVar300,auVar326);
        auVar35 = vblendvps_avx(auVar236,auVar339,auVar326);
        auVar22 = vblendvps_avx(auVar31,auVar349,auVar326);
        auVar235 = vblendvps_avx(auVar32,auVar380,auVar326);
        auVar236 = vblendvps_avx(auVar339,auVar236,auVar326);
        auVar263 = vblendvps_avx(auVar349,auVar31,auVar326);
        auVar215 = vpackssdw_avx(auVar312._0_16_,auVar312._16_16_);
        auVar312 = vblendvps_avx(auVar380,auVar32,auVar326);
        auVar236 = vsubps_avx(auVar236,auVar287);
        auVar321 = vsubps_avx(auVar263,auVar29);
        auVar31 = vsubps_avx(auVar312,auVar30);
        auVar312 = vsubps_avx(auVar29,auVar22);
        fVar208 = auVar321._0_4_;
        fVar168 = auVar30._0_4_;
        fVar241 = auVar321._4_4_;
        fVar169 = auVar30._4_4_;
        auVar46._4_4_ = fVar169 * fVar241;
        auVar46._0_4_ = fVar168 * fVar208;
        fVar272 = auVar321._8_4_;
        fVar172 = auVar30._8_4_;
        auVar46._8_4_ = fVar172 * fVar272;
        fVar292 = auVar321._12_4_;
        fVar173 = auVar30._12_4_;
        auVar46._12_4_ = fVar173 * fVar292;
        fVar353 = auVar321._16_4_;
        fVar176 = auVar30._16_4_;
        auVar46._16_4_ = fVar176 * fVar353;
        fVar355 = auVar321._20_4_;
        fVar177 = auVar30._20_4_;
        auVar46._20_4_ = fVar177 * fVar355;
        fVar165 = auVar321._24_4_;
        fVar180 = auVar30._24_4_;
        auVar46._24_4_ = fVar180 * fVar165;
        auVar46._28_4_ = auVar263._28_4_;
        fVar228 = auVar29._0_4_;
        fVar249 = auVar31._0_4_;
        fVar243 = auVar29._4_4_;
        fVar252 = auVar31._4_4_;
        auVar47._4_4_ = fVar252 * fVar243;
        auVar47._0_4_ = fVar249 * fVar228;
        fVar275 = auVar29._8_4_;
        fVar295 = auVar31._8_4_;
        auVar47._8_4_ = fVar295 * fVar275;
        fVar351 = auVar29._12_4_;
        fVar336 = auVar31._12_4_;
        auVar47._12_4_ = fVar336 * fVar351;
        fVar294 = auVar29._16_4_;
        fVar342 = auVar31._16_4_;
        auVar47._16_4_ = fVar342 * fVar294;
        fVar357 = auVar29._20_4_;
        fVar343 = auVar31._20_4_;
        auVar47._20_4_ = fVar343 * fVar357;
        fVar170 = auVar29._24_4_;
        fVar344 = auVar31._24_4_;
        auVar47._24_4_ = fVar344 * fVar170;
        auVar47._28_4_ = auVar349._28_4_;
        auVar29 = vsubps_avx(auVar47,auVar46);
        fVar226 = auVar287._0_4_;
        fVar245 = auVar287._4_4_;
        auVar48._4_4_ = fVar252 * fVar245;
        auVar48._0_4_ = fVar249 * fVar226;
        fVar279 = auVar287._8_4_;
        auVar48._8_4_ = fVar295 * fVar279;
        fVar247 = auVar287._12_4_;
        auVar48._12_4_ = fVar336 * fVar247;
        fVar354 = auVar287._16_4_;
        auVar48._16_4_ = fVar342 * fVar354;
        fVar253 = auVar287._20_4_;
        auVar48._20_4_ = fVar343 * fVar253;
        fVar174 = auVar287._24_4_;
        auVar48._24_4_ = fVar344 * fVar174;
        auVar48._28_4_ = auVar349._28_4_;
        fVar293 = auVar236._0_4_;
        auVar377._0_4_ = fVar168 * fVar293;
        fVar254 = auVar236._4_4_;
        auVar377._4_4_ = fVar169 * fVar254;
        fVar290 = auVar236._8_4_;
        auVar377._8_4_ = fVar172 * fVar290;
        fVar352 = auVar236._12_4_;
        auVar377._12_4_ = fVar173 * fVar352;
        fVar250 = auVar236._16_4_;
        auVar377._16_4_ = fVar176 * fVar250;
        fVar209 = auVar236._20_4_;
        auVar377._20_4_ = fVar177 * fVar209;
        fVar178 = auVar236._24_4_;
        auVar377._24_4_ = fVar180 * fVar178;
        auVar377._28_4_ = 0;
        auVar263 = vsubps_avx(auVar377,auVar48);
        auVar49._4_4_ = fVar243 * fVar254;
        auVar49._0_4_ = fVar228 * fVar293;
        auVar49._8_4_ = fVar275 * fVar290;
        auVar49._12_4_ = fVar351 * fVar352;
        auVar49._16_4_ = fVar294 * fVar250;
        auVar49._20_4_ = fVar357 * fVar209;
        auVar49._24_4_ = fVar170 * fVar178;
        auVar49._28_4_ = auVar349._28_4_;
        auVar50._4_4_ = fVar245 * fVar241;
        auVar50._0_4_ = fVar226 * fVar208;
        auVar50._8_4_ = fVar279 * fVar272;
        auVar50._12_4_ = fVar247 * fVar292;
        auVar50._16_4_ = fVar354 * fVar353;
        auVar50._20_4_ = fVar253 * fVar355;
        auVar50._24_4_ = fVar174 * fVar165;
        auVar50._28_4_ = auVar380._28_4_;
        auVar32 = vsubps_avx(auVar50,auVar49);
        auVar33 = vsubps_avx(auVar30,auVar235);
        fVar229 = auVar32._28_4_ + auVar263._28_4_;
        auVar195._0_4_ = auVar32._0_4_ + auVar263._0_4_ * 0.0 + auVar29._0_4_ * 0.0;
        auVar195._4_4_ = auVar32._4_4_ + auVar263._4_4_ * 0.0 + auVar29._4_4_ * 0.0;
        auVar195._8_4_ = auVar32._8_4_ + auVar263._8_4_ * 0.0 + auVar29._8_4_ * 0.0;
        auVar195._12_4_ = auVar32._12_4_ + auVar263._12_4_ * 0.0 + auVar29._12_4_ * 0.0;
        auVar195._16_4_ = auVar32._16_4_ + auVar263._16_4_ * 0.0 + auVar29._16_4_ * 0.0;
        auVar195._20_4_ = auVar32._20_4_ + auVar263._20_4_ * 0.0 + auVar29._20_4_ * 0.0;
        auVar195._24_4_ = auVar32._24_4_ + auVar263._24_4_ * 0.0 + auVar29._24_4_ * 0.0;
        auVar195._28_4_ = fVar229 + auVar29._28_4_;
        fVar143 = auVar312._0_4_;
        fVar183 = auVar312._4_4_;
        auVar51._4_4_ = fVar183 * auVar235._4_4_;
        auVar51._0_4_ = fVar143 * auVar235._0_4_;
        fVar278 = auVar312._8_4_;
        auVar51._8_4_ = fVar278 * auVar235._8_4_;
        fVar242 = auVar312._12_4_;
        auVar51._12_4_ = fVar242 * auVar235._12_4_;
        fVar244 = auVar312._16_4_;
        auVar51._16_4_ = fVar244 * auVar235._16_4_;
        fVar246 = auVar312._20_4_;
        auVar51._20_4_ = fVar246 * auVar235._20_4_;
        fVar248 = auVar312._24_4_;
        auVar51._24_4_ = fVar248 * auVar235._24_4_;
        auVar51._28_4_ = fVar229;
        fVar229 = auVar33._0_4_;
        fVar269 = auVar33._4_4_;
        auVar52._4_4_ = auVar22._4_4_ * fVar269;
        auVar52._0_4_ = auVar22._0_4_ * fVar229;
        fVar291 = auVar33._8_4_;
        auVar52._8_4_ = auVar22._8_4_ * fVar291;
        fVar251 = auVar33._12_4_;
        auVar52._12_4_ = auVar22._12_4_ * fVar251;
        fVar356 = auVar33._16_4_;
        auVar52._16_4_ = auVar22._16_4_ * fVar356;
        fVar163 = auVar33._20_4_;
        auVar52._20_4_ = auVar22._20_4_ * fVar163;
        fVar181 = auVar33._24_4_;
        auVar52._24_4_ = auVar22._24_4_ * fVar181;
        auVar52._28_4_ = auVar32._28_4_;
        auVar312 = vsubps_avx(auVar52,auVar51);
        auVar263 = vsubps_avx(auVar287,auVar35);
        fVar345 = auVar263._0_4_;
        fVar346 = auVar263._4_4_;
        auVar53._4_4_ = fVar346 * auVar235._4_4_;
        auVar53._0_4_ = fVar345 * auVar235._0_4_;
        fVar347 = auVar263._8_4_;
        auVar53._8_4_ = fVar347 * auVar235._8_4_;
        fVar167 = auVar263._12_4_;
        auVar53._12_4_ = fVar167 * auVar235._12_4_;
        fVar186 = auVar263._16_4_;
        auVar53._16_4_ = fVar186 * auVar235._16_4_;
        fVar202 = auVar263._20_4_;
        auVar53._20_4_ = fVar202 * auVar235._20_4_;
        fVar204 = auVar263._24_4_;
        auVar53._24_4_ = fVar204 * auVar235._24_4_;
        auVar53._28_4_ = auVar235._28_4_;
        auVar54._4_4_ = auVar35._4_4_ * fVar269;
        auVar54._0_4_ = auVar35._0_4_ * fVar229;
        auVar54._8_4_ = auVar35._8_4_ * fVar291;
        auVar54._12_4_ = auVar35._12_4_ * fVar251;
        auVar54._16_4_ = auVar35._16_4_ * fVar356;
        auVar54._20_4_ = auVar35._20_4_ * fVar163;
        auVar54._24_4_ = auVar35._24_4_ * fVar181;
        auVar54._28_4_ = auVar29._28_4_;
        auVar29 = vsubps_avx(auVar53,auVar54);
        auVar55._4_4_ = auVar22._4_4_ * fVar346;
        auVar55._0_4_ = auVar22._0_4_ * fVar345;
        auVar55._8_4_ = auVar22._8_4_ * fVar347;
        auVar55._12_4_ = auVar22._12_4_ * fVar167;
        auVar55._16_4_ = auVar22._16_4_ * fVar186;
        auVar55._20_4_ = auVar22._20_4_ * fVar202;
        auVar55._24_4_ = auVar22._24_4_ * fVar204;
        auVar55._28_4_ = auVar235._28_4_;
        auVar56._4_4_ = auVar35._4_4_ * fVar183;
        auVar56._0_4_ = auVar35._0_4_ * fVar143;
        auVar56._8_4_ = auVar35._8_4_ * fVar278;
        auVar56._12_4_ = auVar35._12_4_ * fVar242;
        auVar56._16_4_ = auVar35._16_4_ * fVar244;
        auVar56._20_4_ = auVar35._20_4_ * fVar246;
        auVar56._24_4_ = auVar35._24_4_ * fVar248;
        auVar56._28_4_ = auVar35._28_4_;
        auVar35 = vsubps_avx(auVar56,auVar55);
        auVar330 = ZEXT864(0) << 0x20;
        auVar265._0_4_ = auVar312._0_4_ * 0.0 + auVar35._0_4_ + auVar29._0_4_ * 0.0;
        auVar265._4_4_ = auVar312._4_4_ * 0.0 + auVar35._4_4_ + auVar29._4_4_ * 0.0;
        auVar265._8_4_ = auVar312._8_4_ * 0.0 + auVar35._8_4_ + auVar29._8_4_ * 0.0;
        auVar265._12_4_ = auVar312._12_4_ * 0.0 + auVar35._12_4_ + auVar29._12_4_ * 0.0;
        auVar265._16_4_ = auVar312._16_4_ * 0.0 + auVar35._16_4_ + auVar29._16_4_ * 0.0;
        auVar265._20_4_ = auVar312._20_4_ * 0.0 + auVar35._20_4_ + auVar29._20_4_ * 0.0;
        auVar265._24_4_ = auVar312._24_4_ * 0.0 + auVar35._24_4_ + auVar29._24_4_ * 0.0;
        auVar265._28_4_ = auVar35._28_4_ + auVar35._28_4_ + auVar29._28_4_;
        auVar312 = vmaxps_avx(auVar195,auVar265);
        auVar312 = vcmpps_avx(auVar312,ZEXT832(0) << 0x20,2);
        auVar282 = vpackssdw_avx(auVar312._0_16_,auVar312._16_16_);
        auVar215 = vpand_avx(auVar282,auVar215);
        auVar282 = vpmovsxwd_avx(auVar215);
        auVar218 = vpunpckhwd_avx(auVar215,auVar215);
        auVar237._16_16_ = auVar218;
        auVar237._0_16_ = auVar282;
        if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar237 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar237 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar237 >> 0x7f,0) == '\0') &&
              (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar218 >> 0x3f,0) == '\0') &&
            (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar218[0xf]) {
LAB_01026eb2:
          auVar268 = ZEXT3264(CONCAT824(uStack_608,
                                        CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
          auVar240 = ZEXT3264(auVar237);
          auVar350 = ZEXT3264(local_660);
        }
        else {
          auVar57._4_4_ = fVar269 * fVar241;
          auVar57._0_4_ = fVar229 * fVar208;
          auVar57._8_4_ = fVar291 * fVar272;
          auVar57._12_4_ = fVar251 * fVar292;
          auVar57._16_4_ = fVar356 * fVar353;
          auVar57._20_4_ = fVar163 * fVar355;
          auVar57._24_4_ = fVar181 * fVar165;
          auVar57._28_4_ = auVar218._12_4_;
          auVar361._0_4_ = fVar143 * fVar249;
          auVar361._4_4_ = fVar183 * fVar252;
          auVar361._8_4_ = fVar278 * fVar295;
          auVar361._12_4_ = fVar242 * fVar336;
          auVar361._16_4_ = fVar244 * fVar342;
          auVar361._20_4_ = fVar246 * fVar343;
          auVar361._24_4_ = fVar248 * fVar344;
          auVar361._28_4_ = 0;
          auVar312 = vsubps_avx(auVar361,auVar57);
          auVar58._4_4_ = fVar346 * fVar252;
          auVar58._0_4_ = fVar345 * fVar249;
          auVar58._8_4_ = fVar347 * fVar295;
          auVar58._12_4_ = fVar167 * fVar336;
          auVar58._16_4_ = fVar186 * fVar342;
          auVar58._20_4_ = fVar202 * fVar343;
          auVar58._24_4_ = fVar204 * fVar344;
          auVar58._28_4_ = auVar31._28_4_;
          auVar59._4_4_ = fVar269 * fVar254;
          auVar59._0_4_ = fVar229 * fVar293;
          auVar59._8_4_ = fVar291 * fVar290;
          auVar59._12_4_ = fVar251 * fVar352;
          auVar59._16_4_ = fVar356 * fVar250;
          auVar59._20_4_ = fVar163 * fVar209;
          auVar59._24_4_ = fVar181 * fVar178;
          auVar59._28_4_ = auVar33._28_4_;
          auVar35 = vsubps_avx(auVar59,auVar58);
          auVar60._4_4_ = fVar183 * fVar254;
          auVar60._0_4_ = fVar143 * fVar293;
          auVar60._8_4_ = fVar278 * fVar290;
          auVar60._12_4_ = fVar242 * fVar352;
          auVar60._16_4_ = fVar244 * fVar250;
          auVar60._20_4_ = fVar246 * fVar209;
          auVar60._24_4_ = fVar248 * fVar178;
          auVar60._28_4_ = auVar195._28_4_;
          auVar61._4_4_ = fVar346 * fVar241;
          auVar61._0_4_ = fVar345 * fVar208;
          auVar61._8_4_ = fVar347 * fVar272;
          auVar61._12_4_ = fVar167 * fVar292;
          auVar61._16_4_ = fVar186 * fVar353;
          auVar61._20_4_ = fVar202 * fVar355;
          auVar61._24_4_ = fVar204 * fVar165;
          auVar61._28_4_ = auVar321._28_4_;
          auVar22 = vsubps_avx(auVar61,auVar60);
          auVar311._0_4_ = auVar312._0_4_ * 0.0 + auVar22._0_4_ + auVar35._0_4_ * 0.0;
          auVar311._4_4_ = auVar312._4_4_ * 0.0 + auVar22._4_4_ + auVar35._4_4_ * 0.0;
          auVar311._8_4_ = auVar312._8_4_ * 0.0 + auVar22._8_4_ + auVar35._8_4_ * 0.0;
          auVar311._12_4_ = auVar312._12_4_ * 0.0 + auVar22._12_4_ + auVar35._12_4_ * 0.0;
          auVar311._16_4_ = auVar312._16_4_ * 0.0 + auVar22._16_4_ + auVar35._16_4_ * 0.0;
          auVar311._20_4_ = auVar312._20_4_ * 0.0 + auVar22._20_4_ + auVar35._20_4_ * 0.0;
          auVar311._24_4_ = auVar312._24_4_ * 0.0 + auVar22._24_4_ + auVar35._24_4_ * 0.0;
          auVar311._28_4_ = auVar321._28_4_ + auVar22._28_4_ + auVar195._28_4_;
          auVar29 = vrcpps_avx(auVar311);
          fVar208 = auVar29._0_4_;
          fVar293 = auVar29._4_4_;
          auVar62._4_4_ = auVar311._4_4_ * fVar293;
          auVar62._0_4_ = auVar311._0_4_ * fVar208;
          fVar229 = auVar29._8_4_;
          auVar62._8_4_ = auVar311._8_4_ * fVar229;
          fVar241 = auVar29._12_4_;
          auVar62._12_4_ = auVar311._12_4_ * fVar241;
          fVar254 = auVar29._16_4_;
          auVar62._16_4_ = auVar311._16_4_ * fVar254;
          fVar269 = auVar29._20_4_;
          auVar62._20_4_ = auVar311._20_4_ * fVar269;
          fVar272 = auVar29._24_4_;
          auVar62._24_4_ = auVar311._24_4_ * fVar272;
          auVar62._28_4_ = auVar33._28_4_;
          auVar362._8_4_ = 0x3f800000;
          auVar362._0_8_ = &DAT_3f8000003f800000;
          auVar362._12_4_ = 0x3f800000;
          auVar362._16_4_ = 0x3f800000;
          auVar362._20_4_ = 0x3f800000;
          auVar362._24_4_ = 0x3f800000;
          auVar362._28_4_ = 0x3f800000;
          auVar235 = vsubps_avx(auVar362,auVar62);
          fVar208 = auVar235._0_4_ * fVar208 + fVar208;
          fVar293 = auVar235._4_4_ * fVar293 + fVar293;
          fVar229 = auVar235._8_4_ * fVar229 + fVar229;
          fVar241 = auVar235._12_4_ * fVar241 + fVar241;
          fVar254 = auVar235._16_4_ * fVar254 + fVar254;
          fVar269 = auVar235._20_4_ * fVar269 + fVar269;
          fVar272 = auVar235._24_4_ * fVar272 + fVar272;
          auVar63._4_4_ =
               (auVar312._4_4_ * fVar245 + auVar35._4_4_ * fVar243 + auVar22._4_4_ * fVar169) *
               fVar293;
          auVar63._0_4_ =
               (auVar312._0_4_ * fVar226 + auVar35._0_4_ * fVar228 + auVar22._0_4_ * fVar168) *
               fVar208;
          auVar63._8_4_ =
               (auVar312._8_4_ * fVar279 + auVar35._8_4_ * fVar275 + auVar22._8_4_ * fVar172) *
               fVar229;
          auVar63._12_4_ =
               (auVar312._12_4_ * fVar247 + auVar35._12_4_ * fVar351 + auVar22._12_4_ * fVar173) *
               fVar241;
          auVar63._16_4_ =
               (auVar312._16_4_ * fVar354 + auVar35._16_4_ * fVar294 + auVar22._16_4_ * fVar176) *
               fVar254;
          auVar63._20_4_ =
               (auVar312._20_4_ * fVar253 + auVar35._20_4_ * fVar357 + auVar22._20_4_ * fVar177) *
               fVar269;
          auVar63._24_4_ =
               (auVar312._24_4_ * fVar174 + auVar35._24_4_ * fVar170 + auVar22._24_4_ * fVar180) *
               fVar272;
          auVar63._28_4_ = auVar287._28_4_ + auVar236._28_4_ + auVar30._28_4_;
          auVar282 = vpermilps_avx(ZEXT416(uVar137),0);
          auVar238._16_16_ = auVar282;
          auVar238._0_16_ = auVar282;
          auVar312 = vcmpps_avx(auVar238,auVar63,2);
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar285._4_4_ = uVar12;
          auVar285._0_4_ = uVar12;
          auVar285._8_4_ = uVar12;
          auVar285._12_4_ = uVar12;
          auVar285._16_4_ = uVar12;
          auVar285._20_4_ = uVar12;
          auVar285._24_4_ = uVar12;
          auVar285._28_4_ = uVar12;
          auVar287 = vcmpps_avx(auVar63,auVar285,2);
          auVar312 = vandps_avx(auVar287,auVar312);
          auVar282 = vpackssdw_avx(auVar312._0_16_,auVar312._16_16_);
          auVar215 = vpand_avx(auVar215,auVar282);
          auVar282 = vpmovsxwd_avx(auVar215);
          auVar218 = vpshufd_avx(auVar215,0xee);
          auVar218 = vpmovsxwd_avx(auVar218);
          auVar237._16_16_ = auVar218;
          auVar237._0_16_ = auVar282;
          if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar237 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar237 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar237 >> 0x7f,0) == '\0') &&
                (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar218 >> 0x3f,0) == '\0') &&
              (auVar237 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar218[0xf]) goto LAB_01026eb2;
          auVar312 = vcmpps_avx(ZEXT832(0) << 0x20,auVar311,4);
          auVar282 = vpackssdw_avx(auVar312._0_16_,auVar312._16_16_);
          auVar215 = vpand_avx(auVar215,auVar282);
          auVar282 = vpmovsxwd_avx(auVar215);
          auVar215 = vpunpckhwd_avx(auVar215,auVar215);
          auVar240 = ZEXT1664(auVar215);
          auVar301._16_16_ = auVar215;
          auVar301._0_16_ = auVar282;
          auVar268 = ZEXT3264(CONCAT824(uStack_608,
                                        CONCAT816(uStack_610,CONCAT88(uStack_618,local_620))));
          auVar350 = ZEXT3264(local_660);
          if ((((((((auVar301 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar301 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar301 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar301 >> 0x7f,0) != '\0') ||
                (auVar301 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar215 >> 0x3f,0) != '\0') ||
              (auVar301 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar215[0xf] < '\0') {
            auVar239._0_4_ = auVar195._0_4_ * fVar208;
            auVar239._4_4_ = auVar195._4_4_ * fVar293;
            auVar239._8_4_ = auVar195._8_4_ * fVar229;
            auVar239._12_4_ = auVar195._12_4_ * fVar241;
            auVar239._16_4_ = auVar195._16_4_ * fVar254;
            auVar239._20_4_ = auVar195._20_4_ * fVar269;
            auVar239._24_4_ = auVar195._24_4_ * fVar272;
            auVar239._28_4_ = 0;
            auVar64._4_4_ = auVar265._4_4_ * fVar293;
            auVar64._0_4_ = auVar265._0_4_ * fVar208;
            auVar64._8_4_ = auVar265._8_4_ * fVar229;
            auVar64._12_4_ = auVar265._12_4_ * fVar241;
            auVar64._16_4_ = auVar265._16_4_ * fVar254;
            auVar64._20_4_ = auVar265._20_4_ * fVar269;
            auVar64._24_4_ = auVar265._24_4_ * fVar272;
            auVar64._28_4_ = auVar235._28_4_ + auVar29._28_4_;
            auVar286._8_4_ = 0x3f800000;
            auVar286._0_8_ = &DAT_3f8000003f800000;
            auVar286._12_4_ = 0x3f800000;
            auVar286._16_4_ = 0x3f800000;
            auVar286._20_4_ = 0x3f800000;
            auVar286._24_4_ = 0x3f800000;
            auVar286._28_4_ = 0x3f800000;
            auVar312 = vsubps_avx(auVar286,auVar239);
            auVar312 = vblendvps_avx(auVar312,auVar239,auVar326);
            auVar350 = ZEXT3264(auVar312);
            auVar312 = vsubps_avx(auVar286,auVar64);
            auVar240 = ZEXT3264(auVar312);
            _local_4e0 = vblendvps_avx(auVar312,auVar64,auVar326);
            auVar268 = ZEXT3264(auVar301);
            local_280 = auVar63;
          }
        }
        auVar162 = ZEXT3264(auVar322);
        auVar312 = auVar350._0_32_;
        auVar287 = auVar268._0_32_;
        if ((((((((auVar287 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar287 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar287 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar287 >> 0x7f,0) == '\0') &&
              (auVar268 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar287 >> 0xbf,0) == '\0') &&
            (auVar268 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar268[0x1f]) {
          bVar139 = false;
          auVar268 = ZEXT3264(_local_6a0);
        }
        else {
          auVar29 = vsubps_avx(auVar338,auVar150);
          fVar228 = auVar150._0_4_ + auVar29._0_4_ * auVar350._0_4_;
          fVar226 = auVar150._4_4_ + auVar29._4_4_ * auVar350._4_4_;
          fVar293 = auVar150._8_4_ + auVar29._8_4_ * auVar350._8_4_;
          fVar229 = auVar150._12_4_ + auVar29._12_4_ * auVar350._12_4_;
          fVar241 = auVar150._16_4_ + auVar29._16_4_ * auVar350._16_4_;
          fVar243 = auVar150._20_4_ + auVar29._20_4_ * auVar350._20_4_;
          fVar245 = auVar150._24_4_ + auVar29._24_4_ * auVar350._24_4_;
          fVar254 = auVar29._28_4_ + 0.0;
          fVar208 = *(float *)((long)local_738->ray_space + k * 4 + -0x20);
          auVar65._4_4_ = (fVar226 + fVar226) * fVar208;
          auVar65._0_4_ = (fVar228 + fVar228) * fVar208;
          auVar65._8_4_ = (fVar293 + fVar293) * fVar208;
          auVar65._12_4_ = (fVar229 + fVar229) * fVar208;
          auVar65._16_4_ = (fVar241 + fVar241) * fVar208;
          auVar65._20_4_ = (fVar243 + fVar243) * fVar208;
          auVar65._24_4_ = (fVar245 + fVar245) * fVar208;
          auVar65._28_4_ = fVar254 + fVar254;
          auVar240 = ZEXT3264(local_280);
          auVar29 = vcmpps_avx(local_280,auVar65,6);
          auVar30 = auVar287 & auVar29;
          auVar268 = ZEXT3264(_local_6a0);
          if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0x7f,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar30 >> 0xbf,0) != '\0') ||
              (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar30[0x1f] < '\0') {
            local_340 = vandps_avx(auVar29,auVar287);
            local_3e0 = (float)local_4e0._0_4_ + (float)local_4e0._0_4_ + -1.0;
            fStack_3dc = (float)local_4e0._4_4_ + (float)local_4e0._4_4_ + -1.0;
            fStack_3d8 = (float)uStack_4d8 + (float)uStack_4d8 + -1.0;
            fStack_3d4 = uStack_4d8._4_4_ + uStack_4d8._4_4_ + -1.0;
            fStack_3d0 = (float)uStack_4d0 + (float)uStack_4d0 + -1.0;
            fStack_3cc = uStack_4d0._4_4_ + uStack_4d0._4_4_ + -1.0;
            fStack_3c8 = (float)uStack_4c8 + (float)uStack_4c8 + -1.0;
            fStack_3c4 = uStack_4c8._4_4_ + uStack_4c8._4_4_ + -1.0;
            local_3c0 = local_280;
            local_3a0 = 0;
            uStack_388 = uStack_758;
            local_570._8_8_ = auVar360._8_8_;
            uStack_378 = local_570._8_8_;
            local_580._8_8_ = auVar376._8_8_;
            uStack_368 = local_580._8_8_;
            uStack_358 = local_590._8_8_;
            local_4e0._4_4_ = fStack_3dc;
            local_4e0._0_4_ = local_3e0;
            uStack_4d8._0_4_ = fStack_3d8;
            uStack_4d8._4_4_ = fStack_3d4;
            uStack_4d0._0_4_ = fStack_3d0;
            uStack_4d0._4_4_ = fStack_3cc;
            auVar131 = _local_4e0;
            uStack_4c8._0_4_ = fStack_3c8;
            uStack_4c8._4_4_ = fStack_3c4;
            auVar287 = _local_4e0;
            if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              _local_4e0 = auVar287;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar139 = true, pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar217._0_4_ = 1.0 / auVar233._0_4_;
                auVar217._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar215 = vshufps_avx(auVar217,auVar217,0);
                local_320[0] = auVar215._0_4_ * (auVar350._0_4_ + 0.0);
                local_320[1] = auVar215._4_4_ * (auVar350._4_4_ + 1.0);
                local_320[2] = auVar215._8_4_ * (auVar350._8_4_ + 2.0);
                local_320[3] = auVar215._12_4_ * (auVar350._12_4_ + 3.0);
                fStack_310 = auVar215._0_4_ * (auVar350._16_4_ + 4.0);
                fStack_30c = auVar215._4_4_ * (auVar350._20_4_ + 5.0);
                fStack_308 = auVar215._8_4_ * (auVar350._24_4_ + 6.0);
                fStack_304 = auVar350._28_4_ + 7.0;
                uStack_4d0 = auVar131._16_8_;
                uStack_4c8 = auVar287._24_8_;
                local_300 = local_4e0;
                uStack_2f8 = uStack_4d8;
                uStack_2f0 = uStack_4d0;
                uStack_2e8 = uStack_4c8;
                local_2e0 = local_280._0_8_;
                uStack_2d8 = local_280._8_8_;
                uStack_2d0 = local_280._16_8_;
                uStack_2c8 = local_280._24_8_;
                iVar134 = vmovmskps_avx(local_340);
                uVar141 = CONCAT44((int)((ulong)lVar140 >> 0x20),iVar134);
                uVar135 = 0;
                if (uVar141 != 0) {
                  for (; (uVar141 >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                  }
                }
                bVar139 = iVar134 != 0;
                if (bVar139) {
                  auVar215 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
                  _auStack_6b0 = auVar215;
                  _local_6c0 = auVar215;
                  auVar215 = vshufps_avx(ZEXT416(uVar15),ZEXT416(uVar15),0);
                  uStack_6d8 = local_590._8_8_;
                  local_6e0 = (undefined1  [8])local_590._0_8_;
                  auStack_5d0._0_8_ = *local_750;
                  local_5e0 = *local_748;
                  auStack_5d0._8_8_ = local_750[1];
                  _local_700 = auVar322;
                  local_660 = auVar312;
                  _local_4a0 = *pauVar9;
                  _local_480 = *pauVar11;
                  local_400 = auVar312;
                  local_39c = uVar16;
                  local_390 = local_760;
                  local_380 = auVar360._0_8_;
                  local_370 = auVar376._0_8_;
                  local_360 = local_590._0_8_;
                  do {
                    uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_1c0 = local_320[uVar135];
                    local_1a0 = *(undefined4 *)((long)&local_300 + uVar135 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)((long)&local_2e0 + uVar135 * 4);
                    fVar228 = 1.0 - local_1c0;
                    fVar208 = local_1c0 * fVar228 * 4.0;
                    auVar282 = ZEXT416((uint)(local_1c0 * local_1c0 * 0.5));
                    auVar282 = vshufps_avx(auVar282,auVar282,0);
                    auVar218 = ZEXT416((uint)((fVar228 * fVar228 + fVar208) * 0.5));
                    auVar218 = vshufps_avx(auVar218,auVar218,0);
                    auVar261 = ZEXT416((uint)((-local_1c0 * local_1c0 - fVar208) * 0.5));
                    auVar261 = vshufps_avx(auVar261,auVar261,0);
                    local_730.context = context->user;
                    auVar234 = ZEXT416((uint)(fVar228 * -fVar228 * 0.5));
                    auVar234 = vshufps_avx(auVar234,auVar234,0);
                    auVar219._0_4_ =
                         auVar234._0_4_ * (float)local_760._0_4_ +
                         auVar261._0_4_ * fVar358 +
                         auVar282._0_4_ * (float)local_6e0._0_4_ + auVar218._0_4_ * fVar374;
                    auVar219._4_4_ =
                         auVar234._4_4_ * (float)local_760._4_4_ +
                         auVar261._4_4_ * fVar365 +
                         auVar282._4_4_ * (float)local_6e0._4_4_ + auVar218._4_4_ * fVar379;
                    auVar219._8_4_ =
                         auVar234._8_4_ * (float)uStack_758 +
                         auVar261._8_4_ * auVar360._8_4_ +
                         auVar282._8_4_ * (float)uStack_6d8 + auVar218._8_4_ * auVar376._8_4_;
                    auVar219._12_4_ =
                         auVar234._12_4_ * uStack_758._4_4_ +
                         auVar261._12_4_ * auVar360._12_4_ +
                         auVar282._12_4_ * uStack_6d8._4_4_ + auVar218._12_4_ * auVar376._12_4_;
                    local_210 = vshufps_avx(auVar219,auVar219,0);
                    local_220[0] = (RTCHitN)local_210[0];
                    local_220[1] = (RTCHitN)local_210[1];
                    local_220[2] = (RTCHitN)local_210[2];
                    local_220[3] = (RTCHitN)local_210[3];
                    local_220[4] = (RTCHitN)local_210[4];
                    local_220[5] = (RTCHitN)local_210[5];
                    local_220[6] = (RTCHitN)local_210[6];
                    local_220[7] = (RTCHitN)local_210[7];
                    local_220[8] = (RTCHitN)local_210[8];
                    local_220[9] = (RTCHitN)local_210[9];
                    local_220[10] = (RTCHitN)local_210[10];
                    local_220[0xb] = (RTCHitN)local_210[0xb];
                    local_220[0xc] = (RTCHitN)local_210[0xc];
                    local_220[0xd] = (RTCHitN)local_210[0xd];
                    local_220[0xe] = (RTCHitN)local_210[0xe];
                    local_220[0xf] = (RTCHitN)local_210[0xf];
                    local_1f0 = vshufps_avx(auVar219,auVar219,0x55);
                    auVar240 = ZEXT1664(local_1f0);
                    local_200 = local_1f0;
                    local_1d0 = vshufps_avx(auVar219,auVar219,0xaa);
                    local_1e0 = local_1d0;
                    fStack_1bc = local_1c0;
                    fStack_1b8 = local_1c0;
                    fStack_1b4 = local_1c0;
                    fStack_1b0 = local_1c0;
                    fStack_1ac = local_1c0;
                    fStack_1a8 = local_1c0;
                    fStack_1a4 = local_1c0;
                    uStack_19c = local_1a0;
                    uStack_198 = local_1a0;
                    uStack_194 = local_1a0;
                    uStack_190 = local_1a0;
                    uStack_18c = local_1a0;
                    uStack_188 = local_1a0;
                    uStack_184 = local_1a0;
                    local_7a0 = auVar215._0_8_;
                    uStack_798 = auVar215._8_8_;
                    local_180 = local_7a0;
                    uStack_178 = uStack_798;
                    uStack_170 = local_7a0;
                    uStack_168 = uStack_798;
                    local_160 = local_6c0;
                    uStack_158 = uStack_6b8;
                    uStack_150 = auStack_6b0;
                    uStack_148 = uStack_6a8;
                    auVar312 = vcmpps_avx(auVar330._0_32_,auVar330._0_32_,0xf);
                    local_740[1] = auVar312;
                    *local_740 = auVar312;
                    local_140 = (local_730.context)->instID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_120 = (local_730.context)->instPrimID[0];
                    uStack_11c = local_120;
                    uStack_118 = local_120;
                    uStack_114 = local_120;
                    uStack_110 = local_120;
                    uStack_10c = local_120;
                    uStack_108 = local_120;
                    uStack_104 = local_120;
                    local_780 = local_5e0._0_8_;
                    uStack_778 = local_5e0._8_8_;
                    uStack_770 = auStack_5d0._0_8_;
                    uStack_768 = auStack_5d0._8_8_;
                    local_730.valid = (int *)&local_780;
                    local_730.geometryUserPtr = pGVar17->userPtr;
                    local_730.hit = local_220;
                    local_730.N = 8;
                    local_730.ray = (RTCRayN *)ray;
                    if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar240 = ZEXT1664(local_1f0);
                      (*pGVar17->occlusionFilterN)(&local_730);
                      auVar162 = ZEXT3264(_local_700);
                      auVar350 = ZEXT3264(local_660);
                      auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
                    }
                    auVar122._8_8_ = uStack_778;
                    auVar122._0_8_ = local_780;
                    auVar282 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar122);
                    auVar126._8_8_ = uStack_768;
                    auVar126._0_8_ = uStack_770;
                    auVar218 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar126);
                    auVar160._16_16_ = auVar218;
                    auVar160._0_16_ = auVar282;
                    auVar287 = auVar312 & ~auVar160;
                    auVar268 = ZEXT3264(_local_6a0);
                    if ((((((((auVar287 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar287 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar287 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar287 >> 0x7f,0) == '\0') &&
                          (auVar287 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar287 >> 0xbf,0) == '\0') &&
                        (auVar287 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar287[0x1f]) {
                      auVar161._0_4_ = auVar282._0_4_ ^ auVar312._0_4_;
                      auVar161._4_4_ = auVar282._4_4_ ^ auVar312._4_4_;
                      auVar161._8_4_ = auVar282._8_4_ ^ auVar312._8_4_;
                      auVar161._12_4_ = auVar282._12_4_ ^ auVar312._12_4_;
                      auVar161._16_4_ = auVar218._0_4_ ^ auVar312._16_4_;
                      auVar161._20_4_ = auVar218._4_4_ ^ auVar312._20_4_;
                      auVar161._24_4_ = auVar218._8_4_ ^ auVar312._24_4_;
                      auVar161._28_4_ = auVar218._12_4_ ^ auVar312._28_4_;
                    }
                    else {
                      p_Var20 = context->args->filter;
                      if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar240 = ZEXT1664(auVar240._0_16_);
                        (*p_Var20)(&local_730);
                        auVar268 = ZEXT3264(_local_6a0);
                        auVar162 = ZEXT3264(_local_700);
                        auVar350 = ZEXT3264(local_660);
                        auVar330 = ZEXT1664(ZEXT816(0) << 0x40);
                      }
                      auVar123._8_8_ = uStack_778;
                      auVar123._0_8_ = local_780;
                      auVar282 = vpcmpeqd_avx((undefined1  [16])0x0,auVar123);
                      auVar127._8_8_ = uStack_768;
                      auVar127._0_8_ = uStack_770;
                      auVar218 = vpcmpeqd_avx((undefined1  [16])0x0,auVar127);
                      auVar201._16_16_ = auVar218;
                      auVar201._0_16_ = auVar282;
                      auVar161._0_4_ = auVar282._0_4_ ^ auVar312._0_4_;
                      auVar161._4_4_ = auVar282._4_4_ ^ auVar312._4_4_;
                      auVar161._8_4_ = auVar282._8_4_ ^ auVar312._8_4_;
                      auVar161._12_4_ = auVar282._12_4_ ^ auVar312._12_4_;
                      auVar161._16_4_ = auVar218._0_4_ ^ auVar312._16_4_;
                      auVar161._20_4_ = auVar218._4_4_ ^ auVar312._20_4_;
                      auVar161._24_4_ = auVar218._8_4_ ^ auVar312._24_4_;
                      auVar161._28_4_ = auVar218._12_4_ ^ auVar312._28_4_;
                      auVar223._8_4_ = 0xff800000;
                      auVar223._0_8_ = 0xff800000ff800000;
                      auVar223._12_4_ = 0xff800000;
                      auVar223._16_4_ = 0xff800000;
                      auVar223._20_4_ = 0xff800000;
                      auVar223._24_4_ = 0xff800000;
                      auVar223._28_4_ = 0xff800000;
                      auVar312 = vblendvps_avx(auVar223,*(undefined1 (*) [32])
                                                         (local_730.ray + 0x100),auVar201);
                      *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar312;
                    }
                    auVar322 = auVar162._0_32_;
                    auVar312 = auVar350._0_32_;
                    if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar161 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar161 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar161 >> 0x7f,0) != '\0') ||
                          (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar161 >> 0xbf,0) != '\0') ||
                        (auVar161 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar161[0x1f] < '\0') break;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar12;
                    uVar141 = uVar141 ^ 1L << (uVar135 & 0x3f);
                    uVar135 = 0;
                    if (uVar141 != 0) {
                      for (; (uVar141 >> uVar135 & 1) == 0; uVar135 = uVar135 + 1) {
                      }
                    }
                    bVar139 = uVar141 != 0;
                  } while (bVar139);
                }
              }
              goto LAB_01025f14;
            }
          }
          bVar139 = false;
        }
      }
LAB_01025f14:
      auVar350 = ZEXT3264(auVar193);
      auVar330 = ZEXT3264(auVar262);
      local_660 = auVar312;
      if (8 < (int)uVar16) {
        _local_6a0 = auVar268._0_32_;
        local_5e0 = vpshufd_avx(ZEXT416(uVar16),0);
        auVar281 = vshufps_avx(auVar281,auVar281,0);
        register0x00001210 = auVar281;
        _local_4a0 = auVar281;
        auVar281 = vpermilps_avx(ZEXT416(uVar137),0);
        register0x00001210 = auVar281;
        _local_4c0 = auVar281;
        auVar149._0_4_ = 1.0 / (float)local_540._0_4_;
        auVar149._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar281 = vshufps_avx(auVar149,auVar149,0);
        register0x00001210 = auVar281;
        _local_100 = auVar281;
        auVar281 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
        local_540._16_16_ = auVar281;
        local_540._0_16_ = auVar281;
        auVar281 = vshufps_avx(ZEXT416((uint)local_560._0_4_),ZEXT416((uint)local_560._0_4_),0);
        local_560._16_16_ = auVar281;
        local_560._0_16_ = auVar281;
        auVar162 = ZEXT3264(local_560);
        lVar142 = 8;
        fVar208 = (float)local_600._0_4_;
        fVar228 = (float)local_600._4_4_;
        fVar226 = fStack_5f8;
        fVar293 = fStack_5f4;
        fVar229 = fStack_5f0;
        fVar241 = fStack_5ec;
        fVar243 = fStack_5e8;
        fVar245 = (float)local_680._0_4_;
        fVar254 = (float)local_680._4_4_;
        fVar269 = fStack_678;
        fVar272 = fStack_674;
        fVar275 = fStack_670;
        fVar279 = fStack_66c;
        fVar290 = fStack_668;
        _local_700 = auVar322;
        do {
          auVar282 = local_580;
          pauVar10 = (undefined1 (*) [28])(bspline_basis0 + lVar142 * 4 + lVar21);
          fVar291 = *(float *)*pauVar10;
          fVar292 = *(float *)(*pauVar10 + 4);
          fVar351 = *(float *)(*pauVar10 + 8);
          fVar247 = *(float *)(*pauVar10 + 0xc);
          fVar352 = *(float *)(*pauVar10 + 0x10);
          fVar251 = *(float *)(*pauVar10 + 0x14);
          fVar353 = *(float *)(*pauVar10 + 0x18);
          auVar130 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar21 + 0x222bfac + lVar142 * 4);
          fVar294 = *(float *)*pauVar10;
          fVar354 = *(float *)(*pauVar10 + 4);
          fVar250 = *(float *)(*pauVar10 + 8);
          fVar356 = *(float *)(*pauVar10 + 0xc);
          fVar355 = *(float *)(*pauVar10 + 0x10);
          fVar357 = *(float *)(*pauVar10 + 0x14);
          fVar253 = *(float *)(*pauVar10 + 0x18);
          auVar129 = *pauVar10;
          pauVar10 = (undefined1 (*) [28])(lVar21 + 0x222c430 + lVar142 * 4);
          fVar209 = *(float *)*pauVar10;
          fVar163 = *(float *)(*pauVar10 + 4);
          fVar165 = *(float *)(*pauVar10 + 8);
          fVar170 = *(float *)(*pauVar10 + 0xc);
          fVar174 = *(float *)(*pauVar10 + 0x10);
          fVar178 = *(float *)(*pauVar10 + 0x14);
          fVar181 = *(float *)(*pauVar10 + 0x18);
          auVar128 = *pauVar10;
          pfVar1 = (float *)(lVar21 + 0x222c8b4 + lVar142 * 4);
          fVar168 = *pfVar1;
          fVar169 = pfVar1[1];
          fVar172 = pfVar1[2];
          fVar173 = pfVar1[3];
          fVar176 = pfVar1[4];
          fVar177 = pfVar1[5];
          fVar180 = pfVar1[6];
          fVar336 = auVar350._0_4_;
          fVar342 = auVar350._4_4_;
          fVar343 = auVar350._8_4_;
          fVar344 = auVar350._12_4_;
          fVar345 = auVar350._16_4_;
          fVar346 = auVar350._20_4_;
          fVar347 = auVar350._24_4_;
          fVar143 = auVar240._28_4_;
          fVar242 = auVar330._0_4_;
          fVar244 = auVar330._4_4_;
          fVar246 = auVar330._8_4_;
          fVar248 = auVar330._12_4_;
          fVar249 = auVar330._16_4_;
          fVar252 = auVar330._20_4_;
          fVar295 = auVar330._24_4_;
          fVar183 = fVar143 + fVar143 + auVar162._28_4_;
          fVar278 = fVar143 + fVar143 + pfVar1[7];
          auVar381._0_4_ =
               (float)local_460._0_4_ * fVar291 +
               fVar242 * fVar294 + fVar245 * fVar209 + (float)local_520._0_4_ * fVar168;
          auVar381._4_4_ =
               (float)local_460._4_4_ * fVar292 +
               fVar244 * fVar354 + fVar254 * fVar163 + (float)local_520._4_4_ * fVar169;
          auVar381._8_4_ =
               fStack_458 * fVar351 + fVar246 * fVar250 + fVar269 * fVar165 + fStack_518 * fVar172;
          auVar381._12_4_ =
               fStack_454 * fVar247 + fVar248 * fVar356 + fVar272 * fVar170 + fStack_514 * fVar173;
          auVar381._16_4_ =
               fStack_450 * fVar352 + fVar249 * fVar355 + fVar275 * fVar174 + fStack_510 * fVar176;
          auVar381._20_4_ =
               fStack_44c * fVar251 + fVar252 * fVar357 + fVar279 * fVar178 + fStack_50c * fVar177;
          auVar381._24_4_ =
               fStack_448 * fVar353 + fVar295 * fVar253 + fVar290 * fVar181 + fStack_508 * fVar180;
          auVar381._28_4_ = fVar143 + pfVar1[7] + fVar183;
          auVar221._0_4_ =
               (float)local_260._0_4_ * fVar291 +
               fVar294 * fVar208 + (float)local_5c0._0_4_ * fVar209 + fVar336 * fVar168;
          auVar221._4_4_ =
               (float)local_260._4_4_ * fVar292 +
               fVar354 * fVar228 + (float)local_5c0._4_4_ * fVar163 + fVar342 * fVar169;
          auVar221._8_4_ =
               fStack_258 * fVar351 + fVar250 * fVar226 + fStack_5b8 * fVar165 + fVar343 * fVar172;
          auVar221._12_4_ =
               fStack_254 * fVar247 + fVar356 * fVar293 + fStack_5b4 * fVar170 + fVar344 * fVar173;
          auVar221._16_4_ =
               fStack_250 * fVar352 + fVar355 * fVar229 + fStack_5b0 * fVar174 + fVar345 * fVar176;
          auVar221._20_4_ =
               fStack_24c * fVar251 + fVar357 * fVar241 + fStack_5ac * fVar178 + fVar346 * fVar177;
          auVar221._24_4_ =
               fStack_248 * fVar353 + fVar253 * fVar243 + fStack_5a8 * fVar181 + fVar347 * fVar180;
          auVar221._28_4_ = fVar183 + fVar143 + fVar143 + auVar268._28_4_;
          fVar143 = fVar291 * (float)local_240._0_4_ +
                    (float)local_c0._0_4_ * fVar294 +
                    (float)local_80._0_4_ * fVar209 + (float)local_a0._0_4_ * fVar168;
          fVar163 = fVar292 * (float)local_240._4_4_ +
                    (float)local_c0._4_4_ * fVar354 +
                    (float)local_80._4_4_ * fVar163 + (float)local_a0._4_4_ * fVar169;
          fVar165 = fVar351 * fStack_238 +
                    fStack_b8 * fVar250 + fStack_78 * fVar165 + fStack_98 * fVar172;
          fVar170 = fVar247 * fStack_234 +
                    fStack_b4 * fVar356 + fStack_74 * fVar170 + fStack_94 * fVar173;
          fVar174 = fVar352 * fStack_230 +
                    fStack_b0 * fVar355 + fStack_70 * fVar174 + fStack_90 * fVar176;
          fVar178 = fVar251 * fStack_22c +
                    fStack_ac * fVar357 + fStack_6c * fVar178 + fStack_8c * fVar177;
          fVar181 = fVar353 * fStack_228 +
                    fStack_a8 * fVar253 + fStack_68 * fVar181 + fStack_88 * fVar180;
          fVar183 = fVar183 + fVar278;
          auVar131 = *(undefined1 (*) [24])(bspline_basis1 + lVar142 * 4 + lVar21);
          uVar109 = *(undefined8 *)((undefined1 (*) [24])(bspline_basis1 + lVar142 * 4 + lVar21))[1]
          ;
          auVar312 = *(undefined1 (*) [32])(lVar21 + 0x222e3cc + lVar142 * 4);
          auVar162 = ZEXT3264(auVar312);
          pfVar1 = (float *)(lVar21 + 0x222e850 + lVar142 * 4);
          fVar354 = *pfVar1;
          fVar250 = pfVar1[1];
          fVar356 = pfVar1[2];
          fVar355 = pfVar1[3];
          fVar357 = pfVar1[4];
          fVar253 = pfVar1[5];
          fVar209 = pfVar1[6];
          pauVar10 = (undefined1 (*) [28])(lVar21 + 0x222ecd4 + lVar142 * 4);
          fVar208 = *(float *)*pauVar10;
          fVar228 = *(float *)(*pauVar10 + 4);
          fVar226 = *(float *)(*pauVar10 + 8);
          fVar293 = *(float *)(*pauVar10 + 0xc);
          fVar229 = *(float *)(*pauVar10 + 0x10);
          fVar241 = *(float *)(*pauVar10 + 0x14);
          fVar243 = *(float *)(*pauVar10 + 0x18);
          auVar132 = *pauVar10;
          fVar294 = auVar330._28_4_;
          fVar254 = fStack_84 + *(float *)pauVar10[1];
          fVar291 = auVar312._0_4_;
          fVar292 = auVar312._4_4_;
          fVar351 = auVar312._8_4_;
          fVar247 = auVar312._12_4_;
          fVar352 = auVar312._16_4_;
          fVar251 = auVar312._20_4_;
          fVar353 = auVar312._24_4_;
          fVar245 = fStack_84 + fStack_84 + fVar278;
          local_920 = auVar131._0_4_;
          fStack_91c = auVar131._4_4_;
          fStack_918 = auVar131._8_4_;
          fStack_914 = auVar131._12_4_;
          fStack_910 = auVar131._16_4_;
          fStack_90c = auVar131._20_4_;
          fStack_908 = (float)uVar109;
          fStack_904 = (float)((ulong)uVar109 >> 0x20);
          auVar302._0_4_ =
               (float)local_460._0_4_ * local_920 +
               fVar242 * fVar291 +
               fVar354 * (float)local_680._0_4_ + (float)local_520._0_4_ * fVar208;
          auVar302._4_4_ =
               (float)local_460._4_4_ * fStack_91c +
               fVar244 * fVar292 +
               fVar250 * (float)local_680._4_4_ + (float)local_520._4_4_ * fVar228;
          auVar302._8_4_ =
               fStack_458 * fStack_918 +
               fVar246 * fVar351 + fVar356 * fStack_678 + fStack_518 * fVar226;
          auVar302._12_4_ =
               fStack_454 * fStack_914 +
               fVar248 * fVar247 + fVar355 * fStack_674 + fStack_514 * fVar293;
          auVar302._16_4_ =
               fStack_450 * fStack_910 +
               fVar249 * fVar352 + fVar357 * fStack_670 + fStack_510 * fVar229;
          auVar302._20_4_ =
               fStack_44c * fStack_90c +
               fVar252 * fVar251 + fVar253 * fStack_66c + fStack_50c * fVar241;
          auVar302._24_4_ =
               fStack_448 * fStack_908 +
               fVar295 * fVar353 + fVar209 * fStack_668 + fStack_508 * fVar243;
          auVar302._28_4_ = fVar254 + fVar245;
          auVar288._0_4_ =
               (float)local_260._0_4_ * local_920 +
               fVar336 * fVar208 + (float)local_5c0._0_4_ * fVar354 +
               (float)local_600._0_4_ * fVar291;
          auVar288._4_4_ =
               (float)local_260._4_4_ * fStack_91c +
               fVar342 * fVar228 + (float)local_5c0._4_4_ * fVar250 +
               (float)local_600._4_4_ * fVar292;
          auVar288._8_4_ =
               fStack_258 * fStack_918 +
               fVar343 * fVar226 + fStack_5b8 * fVar356 + fStack_5f8 * fVar351;
          auVar288._12_4_ =
               fStack_254 * fStack_914 +
               fVar344 * fVar293 + fStack_5b4 * fVar355 + fStack_5f4 * fVar247;
          auVar288._16_4_ =
               fStack_250 * fStack_910 +
               fVar345 * fVar229 + fStack_5b0 * fVar357 + fStack_5f0 * fVar352;
          auVar288._20_4_ =
               fStack_24c * fStack_90c +
               fVar346 * fVar241 + fStack_5ac * fVar253 + fStack_5ec * fVar251;
          auVar288._24_4_ =
               fStack_248 * fStack_908 +
               fVar347 * fVar243 + fStack_5a8 * fVar209 + fStack_5e8 * fVar353;
          auVar288._28_4_ = fVar245 + fVar294 + fStack_84 + fStack_84;
          auVar378._0_4_ =
               (float)local_c0._0_4_ * fVar291 +
               (float)local_80._0_4_ * fVar354 + (float)local_a0._0_4_ * fVar208 +
               local_920 * (float)local_240._0_4_;
          auVar378._4_4_ =
               (float)local_c0._4_4_ * fVar292 +
               (float)local_80._4_4_ * fVar250 + (float)local_a0._4_4_ * fVar228 +
               fStack_91c * (float)local_240._4_4_;
          auVar378._8_4_ =
               fStack_b8 * fVar351 + fStack_78 * fVar356 + fStack_98 * fVar226 +
               fStack_918 * fStack_238;
          auVar378._12_4_ =
               fStack_b4 * fVar247 + fStack_74 * fVar355 + fStack_94 * fVar293 +
               fStack_914 * fStack_234;
          auVar378._16_4_ =
               fStack_b0 * fVar352 + fStack_70 * fVar357 + fStack_90 * fVar229 +
               fStack_910 * fStack_230;
          auVar378._20_4_ =
               fStack_ac * fVar251 + fStack_6c * fVar253 + fStack_8c * fVar241 +
               fStack_90c * fStack_22c;
          auVar378._24_4_ =
               fStack_a8 * fVar353 + fStack_68 * fVar209 + fStack_88 * fVar243 +
               fStack_908 * fStack_228;
          auVar378._28_4_ = fStack_84 + fVar254 + fVar245;
          auVar29 = vsubps_avx(auVar302,auVar381);
          auVar30 = vsubps_avx(auVar288,auVar221);
          fVar254 = auVar29._0_4_;
          fVar269 = auVar29._4_4_;
          auVar66._4_4_ = fVar269 * auVar221._4_4_;
          auVar66._0_4_ = fVar254 * auVar221._0_4_;
          fVar272 = auVar29._8_4_;
          auVar66._8_4_ = fVar272 * auVar221._8_4_;
          fVar275 = auVar29._12_4_;
          auVar66._12_4_ = fVar275 * auVar221._12_4_;
          fVar279 = auVar29._16_4_;
          auVar66._16_4_ = fVar279 * auVar221._16_4_;
          fVar290 = auVar29._20_4_;
          auVar66._20_4_ = fVar290 * auVar221._20_4_;
          fVar278 = auVar29._24_4_;
          auVar66._24_4_ = fVar278 * auVar221._24_4_;
          auVar66._28_4_ = fVar245;
          fVar208 = auVar30._0_4_;
          fVar228 = auVar30._4_4_;
          auVar67._4_4_ = auVar381._4_4_ * fVar228;
          auVar67._0_4_ = auVar381._0_4_ * fVar208;
          fVar226 = auVar30._8_4_;
          auVar67._8_4_ = auVar381._8_4_ * fVar226;
          fVar293 = auVar30._12_4_;
          auVar67._12_4_ = auVar381._12_4_ * fVar293;
          fVar229 = auVar30._16_4_;
          auVar67._16_4_ = auVar381._16_4_ * fVar229;
          fVar241 = auVar30._20_4_;
          auVar67._20_4_ = auVar381._20_4_ * fVar241;
          fVar243 = auVar30._24_4_;
          auVar67._24_4_ = auVar381._24_4_ * fVar243;
          auVar67._28_4_ = auVar288._28_4_;
          auVar35 = vsubps_avx(auVar66,auVar67);
          auVar115._4_4_ = fVar163;
          auVar115._0_4_ = fVar143;
          auVar115._8_4_ = fVar165;
          auVar115._12_4_ = fVar170;
          auVar115._16_4_ = fVar174;
          auVar115._20_4_ = fVar178;
          auVar115._24_4_ = fVar181;
          auVar115._28_4_ = fVar183;
          auVar287 = vmaxps_avx(auVar115,auVar378);
          auVar68._4_4_ = auVar287._4_4_ * auVar287._4_4_ * (fVar269 * fVar269 + fVar228 * fVar228);
          auVar68._0_4_ = auVar287._0_4_ * auVar287._0_4_ * (fVar254 * fVar254 + fVar208 * fVar208);
          auVar68._8_4_ = auVar287._8_4_ * auVar287._8_4_ * (fVar272 * fVar272 + fVar226 * fVar226);
          auVar68._12_4_ =
               auVar287._12_4_ * auVar287._12_4_ * (fVar275 * fVar275 + fVar293 * fVar293);
          auVar68._16_4_ =
               auVar287._16_4_ * auVar287._16_4_ * (fVar279 * fVar279 + fVar229 * fVar229);
          auVar68._20_4_ =
               auVar287._20_4_ * auVar287._20_4_ * (fVar290 * fVar290 + fVar241 * fVar241);
          auVar68._24_4_ =
               auVar287._24_4_ * auVar287._24_4_ * (fVar278 * fVar278 + fVar243 * fVar243);
          auVar68._28_4_ = auVar302._28_4_ + auVar288._28_4_;
          auVar69._4_4_ = auVar35._4_4_ * auVar35._4_4_;
          auVar69._0_4_ = auVar35._0_4_ * auVar35._0_4_;
          auVar69._8_4_ = auVar35._8_4_ * auVar35._8_4_;
          auVar69._12_4_ = auVar35._12_4_ * auVar35._12_4_;
          auVar69._16_4_ = auVar35._16_4_ * auVar35._16_4_;
          auVar69._20_4_ = auVar35._20_4_ * auVar35._20_4_;
          auVar69._24_4_ = auVar35._24_4_ * auVar35._24_4_;
          auVar69._28_4_ = auVar35._28_4_;
          auVar268 = ZEXT3264(auVar69);
          auVar287 = vcmpps_avx(auVar69,auVar68,2);
          local_3a0 = (uint)lVar142;
          auVar215 = vpshufd_avx(ZEXT416(local_3a0),0);
          auVar281 = vpor_avx(auVar215,_DAT_01ff0cf0);
          auVar215 = vpor_avx(auVar215,_DAT_02020ea0);
          auVar281 = vpcmpgtd_avx(local_5e0,auVar281);
          auVar215 = vpcmpgtd_avx(local_5e0,auVar215);
          register0x000012d0 = auVar215;
          _local_480 = auVar281;
          auVar240 = ZEXT3264(_local_480);
          auVar35 = _local_480 & auVar287;
          fVar208 = (float)local_600._0_4_;
          fVar228 = (float)local_600._4_4_;
          fVar226 = fStack_5f8;
          fVar293 = fStack_5f4;
          fVar229 = fStack_5f0;
          fVar241 = fStack_5ec;
          fVar243 = fStack_5e8;
          fVar245 = (float)local_680._0_4_;
          fVar254 = (float)local_680._4_4_;
          fVar269 = fStack_678;
          fVar272 = fStack_674;
          fVar275 = fStack_670;
          fVar279 = fStack_66c;
          fVar290 = fStack_668;
          if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar35 >> 0x7f,0) == '\0') &&
                (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar35 >> 0xbf,0) == '\0') &&
              (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar35[0x1f]) {
            auVar350 = ZEXT3264(auVar350._0_32_);
            auVar330 = ZEXT3264(auVar330._0_32_);
          }
          else {
            local_6e0._0_4_ = auVar132._0_4_;
            local_6e0._4_4_ = auVar132._4_4_;
            uStack_6d8._0_4_ = auVar132._8_4_;
            uStack_6d8._4_4_ = auVar132._12_4_;
            fStack_6d0 = auVar132._16_4_;
            fStack_6cc = auVar132._20_4_;
            fStack_6c8 = auVar132._24_4_;
            fVar144 = local_920 * (float)local_700._0_4_ +
                      (float)local_440._0_4_ * fVar291 +
                      (float)local_e0._0_4_ * fVar354 +
                      (float)local_6a0._0_4_ * (float)local_6e0._0_4_;
            fVar164 = fStack_91c * (float)local_700._4_4_ +
                      (float)local_440._4_4_ * fVar292 +
                      (float)local_e0._4_4_ * fVar250 +
                      (float)local_6a0._4_4_ * (float)local_6e0._4_4_;
            fVar166 = fStack_918 * fStack_6f8 +
                      fStack_438 * fVar351 + fStack_d8 * fVar356 + fStack_698 * (float)uStack_6d8;
            fVar171 = fStack_914 * fStack_6f4 +
                      fStack_434 * fVar247 + fStack_d4 * fVar355 + fStack_694 * uStack_6d8._4_4_;
            fVar175 = fStack_910 * fStack_6f0 +
                      fStack_430 * fVar352 + fStack_d0 * fVar357 + fStack_690 * fStack_6d0;
            fVar179 = fStack_90c * fStack_6ec +
                      fStack_42c * fVar251 + fStack_cc * fVar253 + fStack_68c * fStack_6cc;
            fVar182 = fStack_908 * fStack_6e8 +
                      fStack_428 * fVar353 + fStack_c8 * fVar209 + fStack_688 * fStack_6c8;
            fVar184 = fStack_904 + auVar312._28_4_ + fVar294 + 0.0;
            local_6c0._0_4_ = auVar129._0_4_;
            local_6c0._4_4_ = auVar129._4_4_;
            uStack_6b8._0_4_ = auVar129._8_4_;
            uStack_6b8._4_4_ = auVar129._12_4_;
            auStack_6b0._0_4_ = auVar129._16_4_;
            auStack_6b0._4_4_ = auVar129._20_4_;
            uStack_6a8._0_4_ = auVar129._24_4_;
            local_7a0._0_4_ = auVar128._0_4_;
            local_7a0._4_4_ = auVar128._4_4_;
            uStack_798._0_4_ = auVar128._8_4_;
            uStack_798._4_4_ = auVar128._12_4_;
            fStack_790 = auVar128._16_4_;
            fStack_78c = auVar128._20_4_;
            fStack_788 = auVar128._24_4_;
            pfVar1 = (float *)(lVar21 + 0x222d640 + lVar142 * 4);
            fVar291 = *pfVar1;
            fVar292 = pfVar1[1];
            fVar351 = pfVar1[2];
            fVar247 = pfVar1[3];
            fVar352 = pfVar1[4];
            fVar251 = pfVar1[5];
            fVar353 = pfVar1[6];
            pfVar2 = (float *)(lVar21 + 0x222dac4 + lVar142 * 4);
            fVar354 = *pfVar2;
            fVar250 = pfVar2[1];
            fVar356 = pfVar2[2];
            fVar355 = pfVar2[3];
            fVar357 = pfVar2[4];
            fVar253 = pfVar2[5];
            fVar209 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x222d1bc + lVar142 * 4);
            fVar278 = *pfVar3;
            fVar167 = pfVar3[1];
            fVar186 = pfVar3[2];
            fVar202 = pfVar3[3];
            fVar204 = pfVar3[4];
            fVar206 = pfVar3[5];
            fVar211 = pfVar3[6];
            fVar185 = pfVar1[7] + pfVar2[7];
            fVar210 = pfVar2[7] + auVar378._28_4_ + 0.0;
            fVar304 = auVar378._28_4_ + fStack_244 + auVar378._28_4_ + 0.0;
            pfVar1 = (float *)(lVar21 + 0x222cd38 + lVar142 * 4);
            fVar224 = *pfVar1;
            fVar225 = pfVar1[1];
            fVar227 = pfVar1[2];
            fVar256 = pfVar1[3];
            fVar271 = pfVar1[4];
            fVar274 = pfVar1[5];
            fVar277 = pfVar1[6];
            auVar196._0_4_ =
                 fVar224 * (float)local_260._0_4_ +
                 (float)local_5c0._0_4_ * fVar291 + fVar336 * fVar354 +
                 (float)local_600._0_4_ * fVar278;
            auVar196._4_4_ =
                 fVar225 * (float)local_260._4_4_ +
                 (float)local_5c0._4_4_ * fVar292 + fVar342 * fVar250 +
                 (float)local_600._4_4_ * fVar167;
            auVar196._8_4_ =
                 fVar227 * fStack_258 +
                 fStack_5b8 * fVar351 + fVar343 * fVar356 + fStack_5f8 * fVar186;
            auVar196._12_4_ =
                 fVar256 * fStack_254 +
                 fStack_5b4 * fVar247 + fVar344 * fVar355 + fStack_5f4 * fVar202;
            auVar196._16_4_ =
                 fVar271 * fStack_250 +
                 fStack_5b0 * fVar352 + fVar345 * fVar357 + fStack_5f0 * fVar204;
            auVar196._20_4_ =
                 fVar274 * fStack_24c +
                 fStack_5ac * fVar251 + fVar346 * fVar253 + fStack_5ec * fVar206;
            auVar196._24_4_ =
                 fVar277 * fStack_248 +
                 fStack_5a8 * fVar353 + fVar347 * fVar209 + fStack_5e8 * fVar211;
            auVar196._28_4_ = fVar210 + fVar304;
            auVar367._0_4_ =
                 fVar278 * (float)local_440._0_4_ +
                 (float)local_e0._0_4_ * fVar291 + (float)local_6a0._0_4_ * fVar354 +
                 fVar224 * (float)local_700._0_4_;
            auVar367._4_4_ =
                 fVar167 * (float)local_440._4_4_ +
                 (float)local_e0._4_4_ * fVar292 + (float)local_6a0._4_4_ * fVar250 +
                 fVar225 * (float)local_700._4_4_;
            auVar367._8_4_ =
                 fVar186 * fStack_438 + fStack_d8 * fVar351 + fStack_698 * fVar356 +
                 fVar227 * fStack_6f8;
            auVar367._12_4_ =
                 fVar202 * fStack_434 + fStack_d4 * fVar247 + fStack_694 * fVar355 +
                 fVar256 * fStack_6f4;
            auVar367._16_4_ =
                 fVar204 * fStack_430 + fStack_d0 * fVar352 + fStack_690 * fVar357 +
                 fVar271 * fStack_6f0;
            auVar367._20_4_ =
                 fVar206 * fStack_42c + fStack_cc * fVar251 + fStack_68c * fVar253 +
                 fVar274 * fStack_6ec;
            auVar367._24_4_ =
                 fVar211 * fStack_428 + fStack_c8 * fVar353 + fStack_688 * fVar209 +
                 fVar277 * fStack_6e8;
            auVar367._28_4_ = pfVar3[7] + fVar185 + fVar304;
            pfVar1 = (float *)(lVar21 + 0x222fa60 + lVar142 * 4);
            fVar336 = *pfVar1;
            fVar342 = pfVar1[1];
            fVar343 = pfVar1[2];
            fVar344 = pfVar1[3];
            fVar345 = pfVar1[4];
            fVar346 = pfVar1[5];
            fVar347 = pfVar1[6];
            pfVar2 = (float *)(lVar21 + 0x222fee4 + lVar142 * 4);
            fVar304 = *pfVar2;
            fVar313 = pfVar2[1];
            fVar314 = pfVar2[2];
            fVar315 = pfVar2[3];
            fVar316 = pfVar2[4];
            fVar317 = pfVar2[5];
            fVar358 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x222f5dc + lVar142 * 4);
            fVar331 = *pfVar3;
            fVar365 = pfVar3[1];
            fVar332 = pfVar3[2];
            fVar333 = pfVar3[3];
            fVar334 = pfVar3[4];
            fVar335 = pfVar3[5];
            fVar369 = pfVar3[6];
            pfVar4 = (float *)(lVar21 + 0x222f158 + lVar142 * 4);
            fVar370 = *pfVar4;
            fVar372 = pfVar4[1];
            fVar374 = pfVar4[2];
            fVar371 = pfVar4[3];
            fVar379 = pfVar4[4];
            fVar373 = pfVar4[5];
            fVar375 = pfVar4[6];
            auVar328._0_4_ =
                 fVar370 * (float)local_460._0_4_ +
                 fVar331 * fVar255 +
                 (float)local_680._0_4_ * fVar336 + (float)local_520._0_4_ * fVar304;
            auVar328._4_4_ =
                 fVar372 * (float)local_460._4_4_ +
                 fVar365 * fVar270 +
                 (float)local_680._4_4_ * fVar342 + (float)local_520._4_4_ * fVar313;
            auVar328._8_4_ =
                 fVar374 * fStack_458 +
                 fVar332 * fVar273 + fStack_678 * fVar343 + fStack_518 * fVar314;
            auVar328._12_4_ =
                 fVar371 * fStack_454 +
                 fVar333 * fVar276 + fStack_674 * fVar344 + fStack_514 * fVar315;
            auVar328._16_4_ =
                 fVar379 * fStack_450 +
                 fVar334 * fVar255 + fStack_670 * fVar345 + fStack_510 * fVar316;
            auVar328._20_4_ =
                 fVar373 * fStack_44c +
                 fVar335 * fVar270 + fStack_66c * fVar346 + fStack_50c * fVar317;
            auVar328._24_4_ =
                 fVar375 * fStack_448 +
                 fVar369 * fVar273 + fStack_668 * fVar347 + fStack_508 * fVar358;
            auVar328._28_4_ = fVar294 + fVar294 + fStack_504 + fVar294;
            auVar363._0_4_ =
                 fVar370 * (float)local_260._0_4_ +
                 (float)local_600._0_4_ * fVar331 +
                 (float)local_5c0._0_4_ * fVar336 + fVar304 * fVar187;
            auVar363._4_4_ =
                 fVar372 * (float)local_260._4_4_ +
                 (float)local_600._4_4_ * fVar365 +
                 (float)local_5c0._4_4_ * fVar342 + fVar313 * fVar203;
            auVar363._8_4_ =
                 fVar374 * fStack_258 +
                 fStack_5f8 * fVar332 + fStack_5b8 * fVar343 + fVar314 * fVar205;
            auVar363._12_4_ =
                 fVar371 * fStack_254 +
                 fStack_5f4 * fVar333 + fStack_5b4 * fVar344 + fVar315 * fVar207;
            auVar363._16_4_ =
                 fVar379 * fStack_250 +
                 fStack_5f0 * fVar334 + fStack_5b0 * fVar345 + fVar316 * fVar187;
            auVar363._20_4_ =
                 fVar373 * fStack_24c +
                 fStack_5ec * fVar335 + fStack_5ac * fVar346 + fVar317 * fVar203;
            auVar363._24_4_ =
                 fVar375 * fStack_248 +
                 fStack_5e8 * fVar369 + fStack_5a8 * fVar347 + fVar358 * fVar205;
            auVar363._28_4_ = fVar294 + fVar294 + fStack_664 + fVar294;
            auVar289._8_4_ = 0x7fffffff;
            auVar289._0_8_ = 0x7fffffff7fffffff;
            auVar289._12_4_ = 0x7fffffff;
            auVar289._16_4_ = 0x7fffffff;
            auVar289._20_4_ = 0x7fffffff;
            auVar289._24_4_ = 0x7fffffff;
            auVar289._28_4_ = 0x7fffffff;
            auVar119._4_4_ =
                 fVar225 * (float)local_460._4_4_ +
                 fVar244 * fVar167 +
                 (float)local_680._4_4_ * fVar292 + (float)local_520._4_4_ * fVar250;
            auVar119._0_4_ =
                 fVar224 * (float)local_460._0_4_ +
                 fVar242 * fVar278 +
                 (float)local_680._0_4_ * fVar291 + (float)local_520._0_4_ * fVar354;
            auVar119._8_4_ =
                 fVar227 * fStack_458 +
                 fVar246 * fVar186 + fStack_678 * fVar351 + fStack_518 * fVar356;
            auVar119._12_4_ =
                 fVar256 * fStack_454 +
                 fVar248 * fVar202 + fStack_674 * fVar247 + fStack_514 * fVar355;
            auVar119._16_4_ =
                 fVar271 * fStack_450 +
                 fVar249 * fVar204 + fStack_670 * fVar352 + fStack_510 * fVar357;
            auVar119._20_4_ =
                 fVar274 * fStack_44c +
                 fVar252 * fVar206 + fStack_66c * fVar251 + fStack_50c * fVar253;
            auVar119._24_4_ =
                 fVar277 * fStack_448 +
                 fVar295 * fVar211 + fStack_668 * fVar353 + fStack_508 * fVar209;
            auVar119._28_4_ = fVar185 + fVar210;
            auVar312 = vandps_avx(auVar119,auVar289);
            auVar35 = vandps_avx(auVar196,auVar289);
            auVar35 = vmaxps_avx(auVar312,auVar35);
            auVar312 = vandps_avx(auVar367,auVar289);
            auVar35 = vmaxps_avx(auVar35,auVar312);
            auVar35 = vcmpps_avx(auVar35,_local_4a0,1);
            auVar22 = vblendvps_avx(auVar119,auVar29,auVar35);
            auVar155._0_4_ =
                 fVar370 * (float)local_700._0_4_ +
                 fVar331 * (float)local_440._0_4_ +
                 fVar304 * (float)local_6a0._0_4_ + (float)local_e0._0_4_ * fVar336;
            auVar155._4_4_ =
                 fVar372 * (float)local_700._4_4_ +
                 fVar365 * (float)local_440._4_4_ +
                 fVar313 * (float)local_6a0._4_4_ + (float)local_e0._4_4_ * fVar342;
            auVar155._8_4_ =
                 fVar374 * fStack_6f8 +
                 fVar332 * fStack_438 + fVar314 * fStack_698 + fStack_d8 * fVar343;
            auVar155._12_4_ =
                 fVar371 * fStack_6f4 +
                 fVar333 * fStack_434 + fVar315 * fStack_694 + fStack_d4 * fVar344;
            auVar155._16_4_ =
                 fVar379 * fStack_6f0 +
                 fVar334 * fStack_430 + fVar316 * fStack_690 + fStack_d0 * fVar345;
            auVar155._20_4_ =
                 fVar373 * fStack_6ec +
                 fVar335 * fStack_42c + fVar317 * fStack_68c + fStack_cc * fVar346;
            auVar155._24_4_ =
                 fVar375 * fStack_6e8 +
                 fVar369 * fStack_428 + fVar358 * fStack_688 + fStack_c8 * fVar347;
            auVar155._28_4_ = auVar312._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar150 = vblendvps_avx(auVar196,auVar30,auVar35);
            auVar312 = vandps_avx(auVar328,auVar289);
            auVar35 = vandps_avx(auVar363,auVar289);
            auVar235 = vmaxps_avx(auVar312,auVar35);
            auVar312 = vandps_avx(auVar155,auVar289);
            auVar312 = vmaxps_avx(auVar235,auVar312);
            local_880._0_4_ = auVar130._0_4_;
            local_880._4_4_ = auVar130._4_4_;
            fStack_878 = auVar130._8_4_;
            fStack_874 = auVar130._12_4_;
            fStack_870 = auVar130._16_4_;
            fStack_86c = auVar130._20_4_;
            fStack_868 = auVar130._24_4_;
            auVar35 = vcmpps_avx(auVar312,_local_4a0,1);
            auVar312 = vblendvps_avx(auVar328,auVar29,auVar35);
            auVar156._0_4_ =
                 (float)local_700._0_4_ * (float)local_880._0_4_ +
                 (float)local_440._0_4_ * (float)local_6c0._0_4_ +
                 (float)local_e0._0_4_ * (float)local_7a0._0_4_ + (float)local_6a0._0_4_ * fVar168;
            auVar156._4_4_ =
                 (float)local_700._4_4_ * (float)local_880._4_4_ +
                 (float)local_440._4_4_ * (float)local_6c0._4_4_ +
                 (float)local_e0._4_4_ * (float)local_7a0._4_4_ + (float)local_6a0._4_4_ * fVar169;
            auVar156._8_4_ =
                 fStack_6f8 * fStack_878 +
                 fStack_438 * (float)uStack_6b8 +
                 fStack_d8 * (float)uStack_798 + fStack_698 * fVar172;
            auVar156._12_4_ =
                 fStack_6f4 * fStack_874 +
                 fStack_434 * uStack_6b8._4_4_ + fStack_d4 * uStack_798._4_4_ + fStack_694 * fVar173
            ;
            auVar156._16_4_ =
                 fStack_6f0 * fStack_870 +
                 fStack_430 * (float)auStack_6b0._0_4_ +
                 fStack_d0 * fStack_790 + fStack_690 * fVar176;
            auVar156._20_4_ =
                 fStack_6ec * fStack_86c +
                 fStack_42c * (float)auStack_6b0._4_4_ +
                 fStack_cc * fStack_78c + fStack_68c * fVar177;
            auVar156._24_4_ =
                 fStack_6e8 * fStack_868 +
                 fStack_428 * (float)uStack_6a8 + fStack_c8 * fStack_788 + fStack_688 * fVar180;
            auVar156._28_4_ = auVar235._28_4_ + fVar184 + fVar294 + 0.0;
            auVar35 = vblendvps_avx(auVar363,auVar30,auVar35);
            fVar346 = auVar22._0_4_;
            fVar347 = auVar22._4_4_;
            fVar167 = auVar22._8_4_;
            fVar186 = auVar22._12_4_;
            fVar202 = auVar22._16_4_;
            fVar204 = auVar22._20_4_;
            fVar206 = auVar22._24_4_;
            fVar211 = auVar22._28_4_;
            fVar209 = auVar312._0_4_;
            fVar169 = auVar312._4_4_;
            fVar173 = auVar312._8_4_;
            fVar177 = auVar312._12_4_;
            fVar278 = auVar312._16_4_;
            fVar244 = auVar312._20_4_;
            fVar248 = auVar312._24_4_;
            fVar291 = auVar150._0_4_;
            fVar351 = auVar150._4_4_;
            fVar352 = auVar150._8_4_;
            fVar353 = auVar150._12_4_;
            fVar354 = auVar150._16_4_;
            fVar356 = auVar150._20_4_;
            fVar357 = auVar150._24_4_;
            auVar340._0_4_ = fVar291 * fVar291 + fVar346 * fVar346;
            auVar340._4_4_ = fVar351 * fVar351 + fVar347 * fVar347;
            auVar340._8_4_ = fVar352 * fVar352 + fVar167 * fVar167;
            auVar340._12_4_ = fVar353 * fVar353 + fVar186 * fVar186;
            auVar340._16_4_ = fVar354 * fVar354 + fVar202 * fVar202;
            auVar340._20_4_ = fVar356 * fVar356 + fVar204 * fVar204;
            auVar340._24_4_ = fVar357 * fVar357 + fVar206 * fVar206;
            auVar340._28_4_ = auVar29._28_4_ + fStack_5a4;
            auVar29 = vrsqrtps_avx(auVar340);
            fVar292 = auVar29._0_4_;
            fVar247 = auVar29._4_4_;
            auVar70._4_4_ = fVar247 * 1.5;
            auVar70._0_4_ = fVar292 * 1.5;
            fVar251 = auVar29._8_4_;
            auVar70._8_4_ = fVar251 * 1.5;
            fVar294 = auVar29._12_4_;
            auVar70._12_4_ = fVar294 * 1.5;
            fVar250 = auVar29._16_4_;
            auVar70._16_4_ = fVar250 * 1.5;
            fVar355 = auVar29._20_4_;
            auVar70._20_4_ = fVar355 * 1.5;
            fVar253 = auVar29._24_4_;
            auVar70._24_4_ = fVar253 * 1.5;
            auVar70._28_4_ = auVar363._28_4_;
            auVar71._4_4_ = fVar247 * fVar247 * fVar247 * auVar340._4_4_ * 0.5;
            auVar71._0_4_ = fVar292 * fVar292 * fVar292 * auVar340._0_4_ * 0.5;
            auVar71._8_4_ = fVar251 * fVar251 * fVar251 * auVar340._8_4_ * 0.5;
            auVar71._12_4_ = fVar294 * fVar294 * fVar294 * auVar340._12_4_ * 0.5;
            auVar71._16_4_ = fVar250 * fVar250 * fVar250 * auVar340._16_4_ * 0.5;
            auVar71._20_4_ = fVar355 * fVar355 * fVar355 * auVar340._20_4_ * 0.5;
            auVar71._24_4_ = fVar253 * fVar253 * fVar253 * auVar340._24_4_ * 0.5;
            auVar71._28_4_ = auVar340._28_4_;
            auVar22 = vsubps_avx(auVar70,auVar71);
            fVar252 = auVar22._0_4_;
            fVar295 = auVar22._4_4_;
            fVar336 = auVar22._8_4_;
            fVar342 = auVar22._12_4_;
            fVar343 = auVar22._16_4_;
            fVar344 = auVar22._20_4_;
            fVar345 = auVar22._24_4_;
            fVar292 = auVar35._0_4_;
            fVar247 = auVar35._4_4_;
            fVar251 = auVar35._8_4_;
            fVar294 = auVar35._12_4_;
            fVar250 = auVar35._16_4_;
            fVar355 = auVar35._20_4_;
            fVar253 = auVar35._24_4_;
            auVar323._0_4_ = fVar292 * fVar292 + fVar209 * fVar209;
            auVar323._4_4_ = fVar247 * fVar247 + fVar169 * fVar169;
            auVar323._8_4_ = fVar251 * fVar251 + fVar173 * fVar173;
            auVar323._12_4_ = fVar294 * fVar294 + fVar177 * fVar177;
            auVar323._16_4_ = fVar250 * fVar250 + fVar278 * fVar278;
            auVar323._20_4_ = fVar355 * fVar355 + fVar244 * fVar244;
            auVar323._24_4_ = fVar253 * fVar253 + fVar248 * fVar248;
            auVar323._28_4_ = auVar29._28_4_ + auVar312._28_4_;
            auVar312 = vrsqrtps_avx(auVar323);
            fVar168 = auVar312._0_4_;
            fVar172 = auVar312._4_4_;
            auVar72._4_4_ = fVar172 * 1.5;
            auVar72._0_4_ = fVar168 * 1.5;
            fVar176 = auVar312._8_4_;
            auVar72._8_4_ = fVar176 * 1.5;
            fVar180 = auVar312._12_4_;
            auVar72._12_4_ = fVar180 * 1.5;
            fVar242 = auVar312._16_4_;
            auVar72._16_4_ = fVar242 * 1.5;
            fVar246 = auVar312._20_4_;
            auVar72._20_4_ = fVar246 * 1.5;
            fVar249 = auVar312._24_4_;
            auVar72._24_4_ = fVar249 * 1.5;
            auVar72._28_4_ = auVar363._28_4_;
            auVar73._4_4_ = fVar172 * fVar172 * fVar172 * auVar323._4_4_ * 0.5;
            auVar73._0_4_ = fVar168 * fVar168 * fVar168 * auVar323._0_4_ * 0.5;
            auVar73._8_4_ = fVar176 * fVar176 * fVar176 * auVar323._8_4_ * 0.5;
            auVar73._12_4_ = fVar180 * fVar180 * fVar180 * auVar323._12_4_ * 0.5;
            auVar73._16_4_ = fVar242 * fVar242 * fVar242 * auVar323._16_4_ * 0.5;
            auVar73._20_4_ = fVar246 * fVar246 * fVar246 * auVar323._20_4_ * 0.5;
            auVar73._24_4_ = fVar249 * fVar249 * fVar249 * auVar323._24_4_ * 0.5;
            auVar73._28_4_ = auVar323._28_4_;
            auVar29 = vsubps_avx(auVar72,auVar73);
            fVar168 = auVar29._0_4_;
            fVar172 = auVar29._4_4_;
            fVar176 = auVar29._8_4_;
            fVar180 = auVar29._12_4_;
            fVar242 = auVar29._16_4_;
            fVar246 = auVar29._20_4_;
            fVar249 = auVar29._24_4_;
            fVar291 = fVar143 * fVar252 * fVar291;
            fVar351 = fVar163 * fVar295 * fVar351;
            auVar74._4_4_ = fVar351;
            auVar74._0_4_ = fVar291;
            fVar352 = fVar165 * fVar336 * fVar352;
            auVar74._8_4_ = fVar352;
            fVar353 = fVar170 * fVar342 * fVar353;
            auVar74._12_4_ = fVar353;
            fVar354 = fVar174 * fVar343 * fVar354;
            auVar74._16_4_ = fVar354;
            fVar356 = fVar178 * fVar344 * fVar356;
            auVar74._20_4_ = fVar356;
            fVar357 = fVar181 * fVar345 * fVar357;
            auVar74._24_4_ = fVar357;
            auVar74._28_4_ = auVar312._28_4_;
            local_880._4_4_ = fVar351 + auVar381._4_4_;
            local_880._0_4_ = fVar291 + auVar381._0_4_;
            fStack_878 = fVar352 + auVar381._8_4_;
            fStack_874 = fVar353 + auVar381._12_4_;
            fStack_870 = fVar354 + auVar381._16_4_;
            fStack_86c = fVar356 + auVar381._20_4_;
            fStack_868 = fVar357 + auVar381._24_4_;
            fStack_864 = auVar312._28_4_ + auVar381._28_4_;
            auVar36 = _local_880;
            fVar291 = fVar143 * fVar252 * -fVar346;
            fVar351 = fVar163 * fVar295 * -fVar347;
            auVar75._4_4_ = fVar351;
            auVar75._0_4_ = fVar291;
            fVar352 = fVar165 * fVar336 * -fVar167;
            auVar75._8_4_ = fVar352;
            fVar353 = fVar170 * fVar342 * -fVar186;
            auVar75._12_4_ = fVar353;
            fVar354 = fVar174 * fVar343 * -fVar202;
            auVar75._16_4_ = fVar354;
            fVar356 = fVar178 * fVar344 * -fVar204;
            auVar75._20_4_ = fVar356;
            fVar357 = fVar181 * fVar345 * -fVar206;
            auVar75._24_4_ = fVar357;
            auVar75._28_4_ = -fVar211;
            local_7a0._4_4_ = auVar221._4_4_ + fVar351;
            local_7a0._0_4_ = auVar221._0_4_ + fVar291;
            uStack_798._0_4_ = auVar221._8_4_ + fVar352;
            uStack_798._4_4_ = auVar221._12_4_ + fVar353;
            fStack_790 = auVar221._16_4_ + fVar354;
            fStack_78c = auVar221._20_4_ + fVar356;
            fStack_788 = auVar221._24_4_ + fVar357;
            fStack_784 = auVar221._28_4_ + -fVar211;
            fVar291 = fVar252 * 0.0 * fVar143;
            fVar351 = fVar295 * 0.0 * fVar163;
            auVar76._4_4_ = fVar351;
            auVar76._0_4_ = fVar291;
            fVar352 = fVar336 * 0.0 * fVar165;
            auVar76._8_4_ = fVar352;
            fVar353 = fVar342 * 0.0 * fVar170;
            auVar76._12_4_ = fVar353;
            fVar354 = fVar343 * 0.0 * fVar174;
            auVar76._16_4_ = fVar354;
            fVar356 = fVar344 * 0.0 * fVar178;
            auVar76._20_4_ = fVar356;
            fVar357 = fVar345 * 0.0 * fVar181;
            auVar76._24_4_ = fVar357;
            auVar76._28_4_ = fVar211;
            auVar312 = vsubps_avx(auVar381,auVar74);
            auVar382._0_4_ = fVar291 + auVar156._0_4_;
            auVar382._4_4_ = fVar351 + auVar156._4_4_;
            auVar382._8_4_ = fVar352 + auVar156._8_4_;
            auVar382._12_4_ = fVar353 + auVar156._12_4_;
            auVar382._16_4_ = fVar354 + auVar156._16_4_;
            auVar382._20_4_ = fVar356 + auVar156._20_4_;
            auVar382._24_4_ = fVar357 + auVar156._24_4_;
            auVar382._28_4_ = fVar211 + auVar156._28_4_;
            fVar291 = auVar378._0_4_ * fVar168 * fVar292;
            fVar292 = auVar378._4_4_ * fVar172 * fVar247;
            auVar77._4_4_ = fVar292;
            auVar77._0_4_ = fVar291;
            fVar351 = auVar378._8_4_ * fVar176 * fVar251;
            auVar77._8_4_ = fVar351;
            fVar247 = auVar378._12_4_ * fVar180 * fVar294;
            auVar77._12_4_ = fVar247;
            fVar352 = auVar378._16_4_ * fVar242 * fVar250;
            auVar77._16_4_ = fVar352;
            fVar251 = auVar378._20_4_ * fVar246 * fVar355;
            auVar77._20_4_ = fVar251;
            fVar353 = auVar378._24_4_ * fVar249 * fVar253;
            auVar77._24_4_ = fVar353;
            auVar77._28_4_ = fVar183;
            auVar338 = vsubps_avx(auVar221,auVar75);
            auVar368._0_4_ = auVar302._0_4_ + fVar291;
            auVar368._4_4_ = auVar302._4_4_ + fVar292;
            auVar368._8_4_ = auVar302._8_4_ + fVar351;
            auVar368._12_4_ = auVar302._12_4_ + fVar247;
            auVar368._16_4_ = auVar302._16_4_ + fVar352;
            auVar368._20_4_ = auVar302._20_4_ + fVar251;
            auVar368._24_4_ = auVar302._24_4_ + fVar353;
            auVar368._28_4_ = auVar302._28_4_ + fVar183;
            fVar291 = fVar168 * -fVar209 * auVar378._0_4_;
            fVar292 = fVar172 * -fVar169 * auVar378._4_4_;
            auVar78._4_4_ = fVar292;
            auVar78._0_4_ = fVar291;
            fVar351 = fVar176 * -fVar173 * auVar378._8_4_;
            auVar78._8_4_ = fVar351;
            fVar247 = fVar180 * -fVar177 * auVar378._12_4_;
            auVar78._12_4_ = fVar247;
            fVar352 = fVar242 * -fVar278 * auVar378._16_4_;
            auVar78._16_4_ = fVar352;
            fVar251 = fVar246 * -fVar244 * auVar378._20_4_;
            auVar78._20_4_ = fVar251;
            fVar353 = fVar249 * -fVar248 * auVar378._24_4_;
            auVar78._24_4_ = fVar353;
            auVar78._28_4_ = auVar381._28_4_;
            auVar31 = vsubps_avx(auVar156,auVar76);
            auVar266._0_4_ = auVar288._0_4_ + fVar291;
            auVar266._4_4_ = auVar288._4_4_ + fVar292;
            auVar266._8_4_ = auVar288._8_4_ + fVar351;
            auVar266._12_4_ = auVar288._12_4_ + fVar247;
            auVar266._16_4_ = auVar288._16_4_ + fVar352;
            auVar266._20_4_ = auVar288._20_4_ + fVar251;
            auVar266._24_4_ = auVar288._24_4_ + fVar353;
            auVar266._28_4_ = auVar288._28_4_ + auVar381._28_4_;
            fVar291 = fVar168 * 0.0 * auVar378._0_4_;
            fVar292 = fVar172 * 0.0 * auVar378._4_4_;
            auVar79._4_4_ = fVar292;
            auVar79._0_4_ = fVar291;
            fVar351 = fVar176 * 0.0 * auVar378._8_4_;
            auVar79._8_4_ = fVar351;
            fVar247 = fVar180 * 0.0 * auVar378._12_4_;
            auVar79._12_4_ = fVar247;
            fVar352 = fVar242 * 0.0 * auVar378._16_4_;
            auVar79._16_4_ = fVar352;
            fVar251 = fVar246 * 0.0 * auVar378._20_4_;
            auVar79._20_4_ = fVar251;
            fVar353 = fVar249 * 0.0 * auVar378._24_4_;
            auVar79._24_4_ = fVar353;
            auVar79._28_4_ = auVar156._28_4_;
            auVar35 = vsubps_avx(auVar302,auVar77);
            auVar117._4_4_ = fVar164;
            auVar117._0_4_ = fVar144;
            auVar117._8_4_ = fVar166;
            auVar117._12_4_ = fVar171;
            auVar117._16_4_ = fVar175;
            auVar117._20_4_ = fVar179;
            auVar117._24_4_ = fVar182;
            auVar117._28_4_ = fVar184;
            auVar329._0_4_ = fVar144 + fVar291;
            auVar329._4_4_ = fVar164 + fVar292;
            auVar329._8_4_ = fVar166 + fVar351;
            auVar329._12_4_ = fVar171 + fVar247;
            auVar329._16_4_ = fVar175 + fVar352;
            auVar329._20_4_ = fVar179 + fVar251;
            auVar329._24_4_ = fVar182 + fVar353;
            auVar329._28_4_ = fVar184 + auVar156._28_4_;
            auVar22 = vsubps_avx(auVar288,auVar78);
            auVar150 = vsubps_avx(auVar117,auVar79);
            auVar235 = vsubps_avx(auVar266,auVar338);
            auVar236 = vsubps_avx(auVar329,auVar31);
            auVar80._4_4_ = auVar31._4_4_ * auVar235._4_4_;
            auVar80._0_4_ = auVar31._0_4_ * auVar235._0_4_;
            auVar80._8_4_ = auVar31._8_4_ * auVar235._8_4_;
            auVar80._12_4_ = auVar31._12_4_ * auVar235._12_4_;
            auVar80._16_4_ = auVar31._16_4_ * auVar235._16_4_;
            auVar80._20_4_ = auVar31._20_4_ * auVar235._20_4_;
            auVar80._24_4_ = auVar31._24_4_ * auVar235._24_4_;
            auVar80._28_4_ = auVar363._28_4_;
            auVar81._4_4_ = auVar338._4_4_ * auVar236._4_4_;
            auVar81._0_4_ = auVar338._0_4_ * auVar236._0_4_;
            auVar81._8_4_ = auVar338._8_4_ * auVar236._8_4_;
            auVar81._12_4_ = auVar338._12_4_ * auVar236._12_4_;
            auVar81._16_4_ = auVar338._16_4_ * auVar236._16_4_;
            auVar81._20_4_ = auVar338._20_4_ * auVar236._20_4_;
            auVar81._24_4_ = auVar338._24_4_ * auVar236._24_4_;
            auVar81._28_4_ = fVar184;
            auVar263 = vsubps_avx(auVar81,auVar80);
            auVar82._4_4_ = auVar312._4_4_ * auVar236._4_4_;
            auVar82._0_4_ = auVar312._0_4_ * auVar236._0_4_;
            auVar82._8_4_ = auVar312._8_4_ * auVar236._8_4_;
            auVar82._12_4_ = auVar312._12_4_ * auVar236._12_4_;
            auVar82._16_4_ = auVar312._16_4_ * auVar236._16_4_;
            auVar82._20_4_ = auVar312._20_4_ * auVar236._20_4_;
            auVar82._24_4_ = auVar312._24_4_ * auVar236._24_4_;
            auVar82._28_4_ = auVar236._28_4_;
            auVar236 = vsubps_avx(auVar368,auVar312);
            auVar83._4_4_ = auVar31._4_4_ * auVar236._4_4_;
            auVar83._0_4_ = auVar31._0_4_ * auVar236._0_4_;
            auVar83._8_4_ = auVar31._8_4_ * auVar236._8_4_;
            auVar83._12_4_ = auVar31._12_4_ * auVar236._12_4_;
            auVar83._16_4_ = auVar31._16_4_ * auVar236._16_4_;
            auVar83._20_4_ = auVar31._20_4_ * auVar236._20_4_;
            auVar83._24_4_ = auVar31._24_4_ * auVar236._24_4_;
            auVar83._28_4_ = auVar29._28_4_;
            auVar321 = vsubps_avx(auVar83,auVar82);
            auVar84._4_4_ = auVar338._4_4_ * auVar236._4_4_;
            auVar84._0_4_ = auVar338._0_4_ * auVar236._0_4_;
            auVar84._8_4_ = auVar338._8_4_ * auVar236._8_4_;
            auVar84._12_4_ = auVar338._12_4_ * auVar236._12_4_;
            auVar84._16_4_ = auVar338._16_4_ * auVar236._16_4_;
            auVar84._20_4_ = auVar338._20_4_ * auVar236._20_4_;
            auVar84._24_4_ = auVar338._24_4_ * auVar236._24_4_;
            auVar84._28_4_ = auVar29._28_4_;
            auVar85._4_4_ = auVar312._4_4_ * auVar235._4_4_;
            auVar85._0_4_ = auVar312._0_4_ * auVar235._0_4_;
            auVar85._8_4_ = auVar312._8_4_ * auVar235._8_4_;
            auVar85._12_4_ = auVar312._12_4_ * auVar235._12_4_;
            auVar85._16_4_ = auVar312._16_4_ * auVar235._16_4_;
            auVar85._20_4_ = auVar312._20_4_ * auVar235._20_4_;
            auVar85._24_4_ = auVar312._24_4_ * auVar235._24_4_;
            auVar85._28_4_ = auVar235._28_4_;
            auVar29 = vsubps_avx(auVar85,auVar84);
            auVar197._0_4_ = auVar263._0_4_ * 0.0 + auVar29._0_4_ + auVar321._0_4_ * 0.0;
            auVar197._4_4_ = auVar263._4_4_ * 0.0 + auVar29._4_4_ + auVar321._4_4_ * 0.0;
            auVar197._8_4_ = auVar263._8_4_ * 0.0 + auVar29._8_4_ + auVar321._8_4_ * 0.0;
            auVar197._12_4_ = auVar263._12_4_ * 0.0 + auVar29._12_4_ + auVar321._12_4_ * 0.0;
            auVar197._16_4_ = auVar263._16_4_ * 0.0 + auVar29._16_4_ + auVar321._16_4_ * 0.0;
            auVar197._20_4_ = auVar263._20_4_ * 0.0 + auVar29._20_4_ + auVar321._20_4_ * 0.0;
            auVar197._24_4_ = auVar263._24_4_ * 0.0 + auVar29._24_4_ + auVar321._24_4_ * 0.0;
            auVar197._28_4_ = auVar263._28_4_ + auVar29._28_4_ + auVar321._28_4_;
            auVar326 = vcmpps_avx(auVar197,ZEXT832(0) << 0x20,2);
            auVar29 = vblendvps_avx(auVar35,_local_880,auVar326);
            auVar240 = ZEXT3264(auVar29);
            auVar35 = vblendvps_avx(auVar22,_local_7a0,auVar326);
            auVar22 = vblendvps_avx(auVar150,auVar382,auVar326);
            auVar150 = vblendvps_avx(auVar312,auVar368,auVar326);
            auVar235 = vblendvps_avx(auVar338,auVar266,auVar326);
            auVar236 = vblendvps_avx(auVar31,auVar329,auVar326);
            auVar263 = vblendvps_avx(auVar368,auVar312,auVar326);
            auVar321 = vblendvps_avx(auVar266,auVar338,auVar326);
            auVar322 = vblendvps_avx(auVar329,auVar31,auVar326);
            auVar312 = vandps_avx(auVar287,_local_480);
            auVar263 = vsubps_avx(auVar263,auVar29);
            auVar32 = vsubps_avx(auVar321,auVar35);
            auVar322 = vsubps_avx(auVar322,auVar22);
            auVar33 = vsubps_avx(auVar35,auVar235);
            fVar291 = auVar32._0_4_;
            fVar277 = auVar22._0_4_;
            fVar294 = auVar32._4_4_;
            fVar304 = auVar22._4_4_;
            auVar86._4_4_ = fVar304 * fVar294;
            auVar86._0_4_ = fVar277 * fVar291;
            fVar209 = auVar32._8_4_;
            fVar313 = auVar22._8_4_;
            auVar86._8_4_ = fVar313 * fVar209;
            fVar180 = auVar32._12_4_;
            fVar314 = auVar22._12_4_;
            auVar86._12_4_ = fVar314 * fVar180;
            fVar252 = auVar32._16_4_;
            fVar315 = auVar22._16_4_;
            auVar86._16_4_ = fVar315 * fVar252;
            fVar346 = auVar32._20_4_;
            fVar316 = auVar22._20_4_;
            auVar86._20_4_ = fVar316 * fVar346;
            fVar211 = auVar32._24_4_;
            fVar317 = auVar22._24_4_;
            auVar86._24_4_ = fVar317 * fVar211;
            auVar86._28_4_ = auVar321._28_4_;
            fVar292 = auVar35._0_4_;
            fVar358 = auVar322._0_4_;
            fVar354 = auVar35._4_4_;
            fVar331 = auVar322._4_4_;
            auVar87._4_4_ = fVar331 * fVar354;
            auVar87._0_4_ = fVar358 * fVar292;
            fVar168 = auVar35._8_4_;
            fVar365 = auVar322._8_4_;
            auVar87._8_4_ = fVar365 * fVar168;
            fVar278 = auVar35._12_4_;
            fVar332 = auVar322._12_4_;
            auVar87._12_4_ = fVar332 * fVar278;
            fVar295 = auVar35._16_4_;
            fVar333 = auVar322._16_4_;
            auVar87._16_4_ = fVar333 * fVar295;
            fVar347 = auVar35._20_4_;
            fVar334 = auVar322._20_4_;
            auVar87._20_4_ = fVar334 * fVar347;
            fVar224 = auVar35._24_4_;
            fVar335 = auVar322._24_4_;
            uVar12 = auVar338._28_4_;
            auVar87._24_4_ = fVar335 * fVar224;
            auVar87._28_4_ = uVar12;
            auVar321 = vsubps_avx(auVar87,auVar86);
            fVar351 = auVar29._0_4_;
            fVar250 = auVar29._4_4_;
            auVar88._4_4_ = fVar331 * fVar250;
            auVar88._0_4_ = fVar358 * fVar351;
            fVar169 = auVar29._8_4_;
            auVar88._8_4_ = fVar365 * fVar169;
            fVar242 = auVar29._12_4_;
            auVar88._12_4_ = fVar332 * fVar242;
            fVar336 = auVar29._16_4_;
            auVar88._16_4_ = fVar333 * fVar336;
            fVar167 = auVar29._20_4_;
            auVar88._20_4_ = fVar334 * fVar167;
            fVar225 = auVar29._24_4_;
            auVar88._24_4_ = fVar335 * fVar225;
            auVar88._28_4_ = uVar12;
            fVar247 = auVar263._0_4_;
            fVar356 = auVar263._4_4_;
            auVar89._4_4_ = fVar304 * fVar356;
            auVar89._0_4_ = fVar277 * fVar247;
            fVar172 = auVar263._8_4_;
            auVar89._8_4_ = fVar313 * fVar172;
            fVar244 = auVar263._12_4_;
            auVar89._12_4_ = fVar314 * fVar244;
            fVar342 = auVar263._16_4_;
            auVar89._16_4_ = fVar315 * fVar342;
            fVar186 = auVar263._20_4_;
            auVar89._20_4_ = fVar316 * fVar186;
            fVar227 = auVar263._24_4_;
            auVar89._24_4_ = fVar317 * fVar227;
            auVar89._28_4_ = auVar368._28_4_;
            auVar338 = vsubps_avx(auVar89,auVar88);
            auVar90._4_4_ = fVar354 * fVar356;
            auVar90._0_4_ = fVar292 * fVar247;
            auVar90._8_4_ = fVar168 * fVar172;
            auVar90._12_4_ = fVar278 * fVar244;
            auVar90._16_4_ = fVar295 * fVar342;
            auVar90._20_4_ = fVar347 * fVar186;
            auVar90._24_4_ = fVar224 * fVar227;
            auVar90._28_4_ = uVar12;
            auVar91._4_4_ = fVar250 * fVar294;
            auVar91._0_4_ = fVar351 * fVar291;
            auVar91._8_4_ = fVar169 * fVar209;
            auVar91._12_4_ = fVar242 * fVar180;
            auVar91._16_4_ = fVar336 * fVar252;
            auVar91._20_4_ = fVar167 * fVar346;
            auVar91._24_4_ = fVar225 * fVar211;
            auVar91._28_4_ = auVar31._28_4_;
            auVar31 = vsubps_avx(auVar91,auVar90);
            auVar34 = vsubps_avx(auVar22,auVar236);
            fVar251 = auVar31._28_4_ + auVar338._28_4_;
            auVar341._0_4_ = auVar31._0_4_ + auVar338._0_4_ * 0.0 + auVar321._0_4_ * 0.0;
            auVar341._4_4_ = auVar31._4_4_ + auVar338._4_4_ * 0.0 + auVar321._4_4_ * 0.0;
            auVar341._8_4_ = auVar31._8_4_ + auVar338._8_4_ * 0.0 + auVar321._8_4_ * 0.0;
            auVar341._12_4_ = auVar31._12_4_ + auVar338._12_4_ * 0.0 + auVar321._12_4_ * 0.0;
            auVar341._16_4_ = auVar31._16_4_ + auVar338._16_4_ * 0.0 + auVar321._16_4_ * 0.0;
            auVar341._20_4_ = auVar31._20_4_ + auVar338._20_4_ * 0.0 + auVar321._20_4_ * 0.0;
            auVar341._24_4_ = auVar31._24_4_ + auVar338._24_4_ * 0.0 + auVar321._24_4_ * 0.0;
            auVar341._28_4_ = fVar251 + auVar321._28_4_;
            fVar352 = auVar33._0_4_;
            fVar355 = auVar33._4_4_;
            auVar92._4_4_ = auVar236._4_4_ * fVar355;
            auVar92._0_4_ = auVar236._0_4_ * fVar352;
            fVar173 = auVar33._8_4_;
            auVar92._8_4_ = auVar236._8_4_ * fVar173;
            fVar246 = auVar33._12_4_;
            auVar92._12_4_ = auVar236._12_4_ * fVar246;
            fVar343 = auVar33._16_4_;
            auVar92._16_4_ = auVar236._16_4_ * fVar343;
            fVar202 = auVar33._20_4_;
            auVar92._20_4_ = auVar236._20_4_ * fVar202;
            fVar256 = auVar33._24_4_;
            auVar92._24_4_ = auVar236._24_4_ * fVar256;
            auVar92._28_4_ = fVar251;
            fVar251 = auVar34._0_4_;
            fVar357 = auVar34._4_4_;
            auVar93._4_4_ = auVar235._4_4_ * fVar357;
            auVar93._0_4_ = auVar235._0_4_ * fVar251;
            fVar176 = auVar34._8_4_;
            auVar93._8_4_ = auVar235._8_4_ * fVar176;
            fVar248 = auVar34._12_4_;
            auVar93._12_4_ = auVar235._12_4_ * fVar248;
            fVar344 = auVar34._16_4_;
            auVar93._16_4_ = auVar235._16_4_ * fVar344;
            fVar204 = auVar34._20_4_;
            auVar93._20_4_ = auVar235._20_4_ * fVar204;
            fVar271 = auVar34._24_4_;
            auVar93._24_4_ = auVar235._24_4_ * fVar271;
            auVar93._28_4_ = auVar31._28_4_;
            auVar338 = vsubps_avx(auVar93,auVar92);
            auVar31 = vsubps_avx(auVar29,auVar150);
            fVar353 = auVar31._0_4_;
            fVar253 = auVar31._4_4_;
            auVar94._4_4_ = auVar236._4_4_ * fVar253;
            auVar94._0_4_ = auVar236._0_4_ * fVar353;
            fVar177 = auVar31._8_4_;
            auVar94._8_4_ = auVar236._8_4_ * fVar177;
            fVar249 = auVar31._12_4_;
            auVar94._12_4_ = auVar236._12_4_ * fVar249;
            fVar345 = auVar31._16_4_;
            auVar94._16_4_ = auVar236._16_4_ * fVar345;
            fVar206 = auVar31._20_4_;
            auVar94._20_4_ = auVar236._20_4_ * fVar206;
            fVar274 = auVar31._24_4_;
            auVar94._24_4_ = auVar236._24_4_ * fVar274;
            auVar94._28_4_ = auVar236._28_4_;
            auVar95._4_4_ = fVar357 * auVar150._4_4_;
            auVar95._0_4_ = fVar251 * auVar150._0_4_;
            auVar95._8_4_ = fVar176 * auVar150._8_4_;
            auVar95._12_4_ = fVar248 * auVar150._12_4_;
            auVar95._16_4_ = fVar344 * auVar150._16_4_;
            auVar95._20_4_ = fVar204 * auVar150._20_4_;
            auVar95._24_4_ = fVar271 * auVar150._24_4_;
            auVar95._28_4_ = auVar321._28_4_;
            auVar236 = vsubps_avx(auVar94,auVar95);
            auVar96._4_4_ = auVar235._4_4_ * fVar253;
            auVar96._0_4_ = auVar235._0_4_ * fVar353;
            auVar96._8_4_ = auVar235._8_4_ * fVar177;
            auVar96._12_4_ = auVar235._12_4_ * fVar249;
            auVar96._16_4_ = auVar235._16_4_ * fVar345;
            auVar96._20_4_ = auVar235._20_4_ * fVar206;
            auVar96._24_4_ = auVar235._24_4_ * fVar274;
            auVar96._28_4_ = auVar235._28_4_;
            auVar97._4_4_ = fVar355 * auVar150._4_4_;
            auVar97._0_4_ = fVar352 * auVar150._0_4_;
            auVar97._8_4_ = fVar173 * auVar150._8_4_;
            auVar97._12_4_ = fVar246 * auVar150._12_4_;
            auVar97._16_4_ = fVar343 * auVar150._16_4_;
            auVar97._20_4_ = fVar202 * auVar150._20_4_;
            auVar97._24_4_ = fVar256 * auVar150._24_4_;
            auVar97._28_4_ = auVar150._28_4_;
            auVar150 = vsubps_avx(auVar97,auVar96);
            auVar157._0_4_ = auVar338._0_4_ * 0.0 + auVar150._0_4_ + auVar236._0_4_ * 0.0;
            auVar157._4_4_ = auVar338._4_4_ * 0.0 + auVar150._4_4_ + auVar236._4_4_ * 0.0;
            auVar157._8_4_ = auVar338._8_4_ * 0.0 + auVar150._8_4_ + auVar236._8_4_ * 0.0;
            auVar157._12_4_ = auVar338._12_4_ * 0.0 + auVar150._12_4_ + auVar236._12_4_ * 0.0;
            auVar157._16_4_ = auVar338._16_4_ * 0.0 + auVar150._16_4_ + auVar236._16_4_ * 0.0;
            auVar157._20_4_ = auVar338._20_4_ * 0.0 + auVar150._20_4_ + auVar236._20_4_ * 0.0;
            auVar157._24_4_ = auVar338._24_4_ * 0.0 + auVar150._24_4_ + auVar236._24_4_ * 0.0;
            auVar157._28_4_ = auVar236._28_4_ + auVar150._28_4_ + auVar236._28_4_;
            auVar162 = ZEXT3264(auVar157);
            auVar150 = vmaxps_avx(auVar341,auVar157);
            auVar150 = vcmpps_avx(auVar150,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar268 = ZEXT3264(auVar312);
            auVar235 = auVar312 & auVar150;
            if ((((((((auVar235 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar235 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar235 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar235 >> 0x7f,0) == '\0') &&
                  (auVar235 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar235 >> 0xbf,0) == '\0') &&
                (auVar235 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar235[0x1f]) {
LAB_01026e6a:
              auVar199._8_8_ = uStack_618;
              auVar199._0_8_ = local_620;
              auVar199._16_8_ = uStack_610;
              auVar199._24_8_ = uStack_608;
              auVar324._4_4_ = fVar163;
              auVar324._0_4_ = fVar143;
              auVar324._8_4_ = fVar165;
              auVar324._12_4_ = fVar170;
              auVar324._16_4_ = fVar174;
              auVar324._20_4_ = fVar178;
              auVar324._24_4_ = fVar181;
              auVar324._28_4_ = fVar183;
            }
            else {
              auVar235 = vandps_avx(auVar150,auVar312);
              auVar98._4_4_ = fVar357 * fVar294;
              auVar98._0_4_ = fVar251 * fVar291;
              auVar98._8_4_ = fVar176 * fVar209;
              auVar98._12_4_ = fVar248 * fVar180;
              auVar98._16_4_ = fVar344 * fVar252;
              auVar98._20_4_ = fVar204 * fVar346;
              auVar98._24_4_ = fVar271 * fVar211;
              auVar98._28_4_ = auVar312._28_4_;
              auVar99._4_4_ = fVar355 * fVar331;
              auVar99._0_4_ = fVar352 * fVar358;
              auVar99._8_4_ = fVar173 * fVar365;
              auVar99._12_4_ = fVar246 * fVar332;
              auVar99._16_4_ = fVar343 * fVar333;
              auVar99._20_4_ = fVar202 * fVar334;
              auVar99._24_4_ = fVar256 * fVar335;
              auVar99._28_4_ = auVar150._28_4_;
              auVar150 = vsubps_avx(auVar99,auVar98);
              auVar100._4_4_ = fVar253 * fVar331;
              auVar100._0_4_ = fVar353 * fVar358;
              auVar100._8_4_ = fVar177 * fVar365;
              auVar100._12_4_ = fVar249 * fVar332;
              auVar100._16_4_ = fVar345 * fVar333;
              auVar100._20_4_ = fVar206 * fVar334;
              auVar100._24_4_ = fVar274 * fVar335;
              auVar100._28_4_ = auVar322._28_4_;
              auVar101._4_4_ = fVar357 * fVar356;
              auVar101._0_4_ = fVar251 * fVar247;
              auVar101._8_4_ = fVar176 * fVar172;
              auVar101._12_4_ = fVar248 * fVar244;
              auVar101._16_4_ = fVar344 * fVar342;
              auVar101._20_4_ = fVar204 * fVar186;
              auVar101._24_4_ = fVar271 * fVar227;
              auVar101._28_4_ = auVar34._28_4_;
              auVar236 = vsubps_avx(auVar101,auVar100);
              auVar102._4_4_ = fVar355 * fVar356;
              auVar102._0_4_ = fVar352 * fVar247;
              auVar102._8_4_ = fVar173 * fVar172;
              auVar102._12_4_ = fVar246 * fVar244;
              auVar102._16_4_ = fVar343 * fVar342;
              auVar102._20_4_ = fVar202 * fVar186;
              auVar102._24_4_ = fVar256 * fVar227;
              auVar102._28_4_ = auVar263._28_4_;
              auVar103._4_4_ = fVar253 * fVar294;
              auVar103._0_4_ = fVar353 * fVar291;
              auVar103._8_4_ = fVar177 * fVar209;
              auVar103._12_4_ = fVar249 * fVar180;
              auVar103._16_4_ = fVar345 * fVar252;
              auVar103._20_4_ = fVar206 * fVar346;
              auVar103._24_4_ = fVar274 * fVar211;
              auVar103._28_4_ = auVar32._28_4_;
              auVar321 = vsubps_avx(auVar103,auVar102);
              auVar198._0_4_ = auVar150._0_4_ * 0.0 + auVar321._0_4_ + auVar236._0_4_ * 0.0;
              auVar198._4_4_ = auVar150._4_4_ * 0.0 + auVar321._4_4_ + auVar236._4_4_ * 0.0;
              auVar198._8_4_ = auVar150._8_4_ * 0.0 + auVar321._8_4_ + auVar236._8_4_ * 0.0;
              auVar198._12_4_ = auVar150._12_4_ * 0.0 + auVar321._12_4_ + auVar236._12_4_ * 0.0;
              auVar198._16_4_ = auVar150._16_4_ * 0.0 + auVar321._16_4_ + auVar236._16_4_ * 0.0;
              auVar198._20_4_ = auVar150._20_4_ * 0.0 + auVar321._20_4_ + auVar236._20_4_ * 0.0;
              auVar198._24_4_ = auVar150._24_4_ * 0.0 + auVar321._24_4_ + auVar236._24_4_ * 0.0;
              auVar198._28_4_ = auVar32._28_4_ + auVar321._28_4_ + auVar263._28_4_;
              auVar312 = vrcpps_avx(auVar198);
              fVar291 = auVar312._0_4_;
              fVar247 = auVar312._4_4_;
              auVar104._4_4_ = auVar198._4_4_ * fVar247;
              auVar104._0_4_ = auVar198._0_4_ * fVar291;
              fVar352 = auVar312._8_4_;
              auVar104._8_4_ = auVar198._8_4_ * fVar352;
              fVar251 = auVar312._12_4_;
              auVar104._12_4_ = auVar198._12_4_ * fVar251;
              fVar353 = auVar312._16_4_;
              auVar104._16_4_ = auVar198._16_4_ * fVar353;
              fVar294 = auVar312._20_4_;
              auVar104._20_4_ = auVar198._20_4_ * fVar294;
              fVar356 = auVar312._24_4_;
              auVar104._24_4_ = auVar198._24_4_ * fVar356;
              auVar104._28_4_ = auVar34._28_4_;
              auVar364._8_4_ = 0x3f800000;
              auVar364._0_8_ = &DAT_3f8000003f800000;
              auVar364._12_4_ = 0x3f800000;
              auVar364._16_4_ = 0x3f800000;
              auVar364._20_4_ = 0x3f800000;
              auVar364._24_4_ = 0x3f800000;
              auVar364._28_4_ = 0x3f800000;
              auVar312 = vsubps_avx(auVar364,auVar104);
              fVar291 = auVar312._0_4_ * fVar291 + fVar291;
              fVar247 = auVar312._4_4_ * fVar247 + fVar247;
              fVar352 = auVar312._8_4_ * fVar352 + fVar352;
              fVar251 = auVar312._12_4_ * fVar251 + fVar251;
              fVar353 = auVar312._16_4_ * fVar353 + fVar353;
              fVar294 = auVar312._20_4_ * fVar294 + fVar294;
              fVar356 = auVar312._24_4_ * fVar356 + fVar356;
              auVar105._4_4_ =
                   (fVar250 * auVar150._4_4_ + auVar236._4_4_ * fVar354 + auVar321._4_4_ * fVar304)
                   * fVar247;
              auVar105._0_4_ =
                   (fVar351 * auVar150._0_4_ + auVar236._0_4_ * fVar292 + auVar321._0_4_ * fVar277)
                   * fVar291;
              auVar105._8_4_ =
                   (fVar169 * auVar150._8_4_ + auVar236._8_4_ * fVar168 + auVar321._8_4_ * fVar313)
                   * fVar352;
              auVar105._12_4_ =
                   (fVar242 * auVar150._12_4_ +
                   auVar236._12_4_ * fVar278 + auVar321._12_4_ * fVar314) * fVar251;
              auVar105._16_4_ =
                   (fVar336 * auVar150._16_4_ +
                   auVar236._16_4_ * fVar295 + auVar321._16_4_ * fVar315) * fVar353;
              auVar105._20_4_ =
                   (fVar167 * auVar150._20_4_ +
                   auVar236._20_4_ * fVar347 + auVar321._20_4_ * fVar316) * fVar294;
              auVar105._24_4_ =
                   (fVar225 * auVar150._24_4_ +
                   auVar236._24_4_ * fVar224 + auVar321._24_4_ * fVar317) * fVar356;
              auVar105._28_4_ = auVar29._28_4_ + auVar35._28_4_ + auVar22._28_4_;
              auVar240 = ZEXT3264(auVar105);
              uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar267._4_4_ = uVar12;
              auVar267._0_4_ = uVar12;
              auVar267._8_4_ = uVar12;
              auVar267._12_4_ = uVar12;
              auVar267._16_4_ = uVar12;
              auVar267._20_4_ = uVar12;
              auVar267._24_4_ = uVar12;
              auVar267._28_4_ = uVar12;
              auVar312 = vcmpps_avx(_local_4c0,auVar105,2);
              auVar29 = vcmpps_avx(auVar105,auVar267,2);
              auVar268 = ZEXT3264(auVar29);
              auVar312 = vandps_avx(auVar312,auVar29);
              auVar35 = auVar235 & auVar312;
              if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar35 >> 0x7f,0) == '\0') &&
                    (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar35 >> 0xbf,0) == '\0') &&
                  (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar35[0x1f]) goto LAB_01026e6a;
              auVar312 = vandps_avx(auVar235,auVar312);
              auVar35 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar198,4);
              auVar22 = auVar312 & auVar35;
              auVar199._8_8_ = uStack_618;
              auVar199._0_8_ = local_620;
              auVar199._16_8_ = uStack_610;
              auVar199._24_8_ = uStack_608;
              auVar324._4_4_ = fVar163;
              auVar324._0_4_ = fVar143;
              auVar324._8_4_ = fVar165;
              auVar324._12_4_ = fVar170;
              auVar324._16_4_ = fVar174;
              auVar324._20_4_ = fVar178;
              auVar324._24_4_ = fVar181;
              auVar324._28_4_ = fVar183;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar199 = vandps_avx(auVar35,auVar312);
                auVar106._4_4_ = fVar247 * auVar341._4_4_;
                auVar106._0_4_ = fVar291 * auVar341._0_4_;
                auVar106._8_4_ = fVar352 * auVar341._8_4_;
                auVar106._12_4_ = fVar251 * auVar341._12_4_;
                auVar106._16_4_ = fVar353 * auVar341._16_4_;
                auVar106._20_4_ = fVar294 * auVar341._20_4_;
                auVar106._24_4_ = fVar356 * auVar341._24_4_;
                auVar106._28_4_ = auVar29._28_4_;
                auVar107._4_4_ = auVar157._4_4_ * fVar247;
                auVar107._0_4_ = auVar157._0_4_ * fVar291;
                auVar107._8_4_ = auVar157._8_4_ * fVar352;
                auVar107._12_4_ = auVar157._12_4_ * fVar251;
                auVar107._16_4_ = auVar157._16_4_ * fVar353;
                auVar107._20_4_ = auVar157._20_4_ * fVar294;
                auVar107._24_4_ = auVar157._24_4_ * fVar356;
                auVar107._28_4_ = auVar157._28_4_;
                auVar303._8_4_ = 0x3f800000;
                auVar303._0_8_ = &DAT_3f8000003f800000;
                auVar303._12_4_ = 0x3f800000;
                auVar303._16_4_ = 0x3f800000;
                auVar303._20_4_ = 0x3f800000;
                auVar303._24_4_ = 0x3f800000;
                auVar303._28_4_ = 0x3f800000;
                auVar312 = vsubps_avx(auVar303,auVar106);
                local_2a0 = vblendvps_avx(auVar312,auVar106,auVar326);
                auVar312 = vsubps_avx(auVar303,auVar107);
                auVar268 = ZEXT3264(auVar312);
                _local_500 = vblendvps_avx(auVar312,auVar107,auVar326);
                auVar162 = ZEXT3264(_local_500);
                local_2c0 = auVar105;
              }
            }
            auVar350 = ZEXT3264(auVar193);
            auVar330 = ZEXT3264(auVar262);
            if ((((((((auVar199 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar199 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar199 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar199 >> 0x7f,0) != '\0') ||
                  (auVar199 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar199 >> 0xbf,0) != '\0') ||
                (auVar199 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar199[0x1f] < '\0') {
              auVar312 = vsubps_avx(auVar378,auVar324);
              auVar240 = ZEXT3264(local_2a0);
              fVar292 = auVar324._0_4_ + auVar312._0_4_ * local_2a0._0_4_;
              fVar351 = auVar324._4_4_ + auVar312._4_4_ * local_2a0._4_4_;
              fVar247 = auVar324._8_4_ + auVar312._8_4_ * local_2a0._8_4_;
              fVar352 = auVar324._12_4_ + auVar312._12_4_ * local_2a0._12_4_;
              fVar251 = auVar324._16_4_ + auVar312._16_4_ * local_2a0._16_4_;
              fVar353 = auVar324._20_4_ + auVar312._20_4_ * local_2a0._20_4_;
              fVar294 = auVar324._24_4_ + auVar312._24_4_ * local_2a0._24_4_;
              fVar354 = auVar324._28_4_ + auVar312._28_4_;
              fVar291 = *(float *)((long)local_738->ray_space + k * 4 + -0x20);
              auVar108._4_4_ = (fVar351 + fVar351) * fVar291;
              auVar108._0_4_ = (fVar292 + fVar292) * fVar291;
              auVar108._8_4_ = (fVar247 + fVar247) * fVar291;
              auVar108._12_4_ = (fVar352 + fVar352) * fVar291;
              auVar108._16_4_ = (fVar251 + fVar251) * fVar291;
              auVar108._20_4_ = (fVar353 + fVar353) * fVar291;
              auVar108._24_4_ = (fVar294 + fVar294) * fVar291;
              auVar108._28_4_ = fVar354 + fVar354;
              auVar268 = ZEXT3264(local_2c0);
              auVar312 = vcmpps_avx(local_2c0,auVar108,6);
              auVar162 = ZEXT3264(auVar312);
              auVar29 = auVar199 & auVar312;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0xbf,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar29[0x1f] < '\0') {
                local_340 = vandps_avx(auVar312,auVar199);
                auVar162 = ZEXT3264(local_340);
                local_3e0 = (float)local_500._0_4_ + (float)local_500._0_4_ + -1.0;
                fStack_3dc = (float)local_500._4_4_ + (float)local_500._4_4_ + -1.0;
                fStack_3d8 = (float)uStack_4f8 + (float)uStack_4f8 + -1.0;
                fStack_3d4 = uStack_4f8._4_4_ + uStack_4f8._4_4_ + -1.0;
                fStack_3d0 = (float)uStack_4f0 + (float)uStack_4f0 + -1.0;
                fStack_3cc = uStack_4f0._4_4_ + uStack_4f0._4_4_ + -1.0;
                fStack_3c8 = (float)uStack_4e8 + (float)uStack_4e8 + -1.0;
                fStack_3c4 = uStack_4e8._4_4_ + uStack_4e8._4_4_ + -1.0;
                local_400 = local_2a0;
                local_3c0 = local_2c0;
                local_390 = local_760;
                uStack_388 = uStack_758;
                local_380 = local_570._0_8_;
                uStack_378 = local_570._8_8_;
                local_370 = local_580._0_8_;
                uStack_368 = local_580._8_8_;
                local_360 = local_590._0_8_;
                uStack_358 = local_590._8_8_;
                pGVar17 = (context->scene->geometries).items[uVar14].ptr;
                local_500._4_4_ = fStack_3dc;
                local_500._0_4_ = local_3e0;
                uStack_4f8._0_4_ = fStack_3d8;
                uStack_4f8._4_4_ = fStack_3d4;
                uStack_4f0._0_4_ = fStack_3d0;
                uStack_4f0._4_4_ = fStack_3cc;
                auVar131 = _local_500;
                uStack_4e8._0_4_ = fStack_3c8;
                uStack_4e8._4_4_ = fStack_3c4;
                auVar312 = _local_500;
                if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  pRVar136 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar136 = context->args;
                  if ((pRVar136->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar136 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar136 >> 8),1),
                     pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar192._0_4_ = (float)(int)local_3a0;
                    auVar192._4_8_ = SUB128(ZEXT812(0),4);
                    auVar192._12_4_ = 0;
                    auVar281 = vshufps_avx(auVar192,auVar192,0);
                    local_320[0] = (auVar281._0_4_ + local_2a0._0_4_ + 0.0) * (float)local_100._0_4_
                    ;
                    local_320[1] = (auVar281._4_4_ + local_2a0._4_4_ + 1.0) * (float)local_100._4_4_
                    ;
                    local_320[2] = (auVar281._8_4_ + local_2a0._8_4_ + 2.0) * fStack_f8;
                    local_320[3] = (auVar281._12_4_ + local_2a0._12_4_ + 3.0) * fStack_f4;
                    fStack_310 = (auVar281._0_4_ + local_2a0._16_4_ + 4.0) * fStack_f0;
                    fStack_30c = (auVar281._4_4_ + local_2a0._20_4_ + 5.0) * fStack_ec;
                    fStack_308 = (auVar281._8_4_ + local_2a0._24_4_ + 6.0) * fStack_e8;
                    fStack_304 = auVar281._12_4_ + (float)local_2a0._28_4_ + 7.0;
                    uStack_4f0 = auVar131._16_8_;
                    uStack_4e8 = auVar312._24_8_;
                    local_300 = local_500;
                    uStack_2f8 = uStack_4f8;
                    uStack_2f0 = uStack_4f0;
                    uStack_2e8 = uStack_4e8;
                    local_2e0 = local_2c0._0_8_;
                    uStack_2d8 = local_2c0._8_8_;
                    uStack_2d0 = local_2c0._16_8_;
                    uStack_2c8 = local_2c0._24_8_;
                    iVar134 = vmovmskps_avx(local_340);
                    local_900 = CONCAT44((int)((ulong)pRVar136 >> 0x20),iVar134);
                    lVar19 = 0;
                    if (local_900 != 0) {
                      for (; (local_900 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                      }
                    }
                    local_8c0 = (uint)lVar19;
                    uStack_8bc = (undefined4)((ulong)lVar19 >> 0x20);
                    local_880._1_3_ = 0;
                    local_880[0] = iVar134 != 0;
                    stack0xfffffffffffff784 = auVar36._4_28_;
                    _local_500 = auVar312;
                    if (iVar134 != 0) {
                      _auStack_6b0 = auVar287._16_16_;
                      _local_6c0 = local_570;
                      local_7c0 = local_590._0_4_;
                      fStack_7bc = local_590._4_4_;
                      fStack_7b8 = local_590._8_4_;
                      fStack_7b4 = local_590._12_4_;
                      uVar109 = *(undefined8 *)*local_748;
                      uVar110 = *(undefined8 *)(*local_748 + 8);
                      uVar111 = *local_750;
                      uVar112 = local_750[1];
                      _local_6e0 = auVar30;
                      local_39c = uVar16;
                      do {
                        auVar287 = _local_880;
                        uVar137 = *(uint *)(ray + k * 4 + 0x100);
                        lVar19 = CONCAT44(uStack_8bc,local_8c0);
                        local_1c0 = local_320[lVar19];
                        local_1a0 = *(undefined4 *)((long)&local_300 + lVar19 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)((long)&local_2e0 + lVar19 * 4);
                        fVar228 = 1.0 - local_1c0;
                        fVar208 = local_1c0 * fVar228 * 4.0;
                        auVar281 = ZEXT416((uint)(local_1c0 * local_1c0 * 0.5));
                        auVar281 = vshufps_avx(auVar281,auVar281,0);
                        auVar215 = ZEXT416((uint)((fVar228 * fVar228 + fVar208) * 0.5));
                        auVar215 = vshufps_avx(auVar215,auVar215,0);
                        local_7a0._0_4_ = auVar282._0_4_;
                        local_7a0._4_4_ = auVar282._4_4_;
                        uStack_798._0_4_ = auVar282._8_4_;
                        uStack_798._4_4_ = auVar282._12_4_;
                        auVar218 = ZEXT416((uint)((-local_1c0 * local_1c0 - fVar208) * 0.5));
                        auVar218 = vshufps_avx(auVar218,auVar218,0);
                        auVar260._0_4_ = auVar218._0_4_ * (float)local_6c0._0_4_;
                        auVar260._4_4_ = auVar218._4_4_ * (float)local_6c0._4_4_;
                        auVar260._8_4_ = auVar218._8_4_ * (float)uStack_6b8;
                        auVar260._12_4_ = auVar218._12_4_ * uStack_6b8._4_4_;
                        auVar268 = ZEXT1664(auVar260);
                        local_730.context = context->user;
                        auVar218 = ZEXT416((uint)(fVar228 * -fVar228 * 0.5));
                        auVar218 = vshufps_avx(auVar218,auVar218,0);
                        auVar216._0_4_ =
                             auVar218._0_4_ * (float)local_760._0_4_ +
                             auVar260._0_4_ +
                             auVar281._0_4_ * local_7c0 + auVar215._0_4_ * (float)local_7a0._0_4_;
                        auVar216._4_4_ =
                             auVar218._4_4_ * (float)local_760._4_4_ +
                             auVar260._4_4_ +
                             auVar281._4_4_ * fStack_7bc + auVar215._4_4_ * (float)local_7a0._4_4_;
                        auVar216._8_4_ =
                             auVar218._8_4_ * (float)uStack_758 +
                             auVar260._8_4_ +
                             auVar281._8_4_ * fStack_7b8 + auVar215._8_4_ * (float)uStack_798;
                        auVar216._12_4_ =
                             auVar218._12_4_ * uStack_758._4_4_ +
                             auVar260._12_4_ +
                             auVar281._12_4_ * fStack_7b4 + auVar215._12_4_ * uStack_798._4_4_;
                        local_210 = vshufps_avx(auVar216,auVar216,0);
                        local_220[0] = (RTCHitN)local_210[0];
                        local_220[1] = (RTCHitN)local_210[1];
                        local_220[2] = (RTCHitN)local_210[2];
                        local_220[3] = (RTCHitN)local_210[3];
                        local_220[4] = (RTCHitN)local_210[4];
                        local_220[5] = (RTCHitN)local_210[5];
                        local_220[6] = (RTCHitN)local_210[6];
                        local_220[7] = (RTCHitN)local_210[7];
                        local_220[8] = (RTCHitN)local_210[8];
                        local_220[9] = (RTCHitN)local_210[9];
                        local_220[10] = (RTCHitN)local_210[10];
                        local_220[0xb] = (RTCHitN)local_210[0xb];
                        local_220[0xc] = (RTCHitN)local_210[0xc];
                        local_220[0xd] = (RTCHitN)local_210[0xd];
                        local_220[0xe] = (RTCHitN)local_210[0xe];
                        local_220[0xf] = (RTCHitN)local_210[0xf];
                        local_1f0 = vshufps_avx(auVar216,auVar216,0x55);
                        auVar240 = ZEXT1664(local_1f0);
                        local_200 = local_1f0;
                        local_1d0 = vshufps_avx(auVar216,auVar216,0xaa);
                        local_1e0 = local_1d0;
                        fStack_1bc = local_1c0;
                        fStack_1b8 = local_1c0;
                        fStack_1b4 = local_1c0;
                        fStack_1b0 = local_1c0;
                        fStack_1ac = local_1c0;
                        fStack_1a8 = local_1c0;
                        fStack_1a4 = local_1c0;
                        uStack_19c = local_1a0;
                        uStack_198 = local_1a0;
                        uStack_194 = local_1a0;
                        uStack_190 = local_1a0;
                        uStack_18c = local_1a0;
                        uStack_188 = local_1a0;
                        uStack_184 = local_1a0;
                        local_180 = local_560._0_8_;
                        uStack_178 = local_560._8_8_;
                        uStack_170 = local_560._16_8_;
                        uStack_168 = local_560._24_8_;
                        local_160 = local_540._0_8_;
                        uStack_158 = local_540._8_8_;
                        uStack_150 = local_540._16_8_;
                        uStack_148 = local_540._24_8_;
                        auVar312 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                        local_740[1] = auVar312;
                        *local_740 = auVar312;
                        local_140 = (local_730.context)->instID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_120 = (local_730.context)->instPrimID[0];
                        uStack_11c = local_120;
                        uStack_118 = local_120;
                        uStack_114 = local_120;
                        uStack_110 = local_120;
                        uStack_10c = local_120;
                        uStack_108 = local_120;
                        uStack_104 = local_120;
                        local_730.valid = (int *)&local_780;
                        local_730.geometryUserPtr = pGVar17->userPtr;
                        local_730.hit = local_220;
                        local_730.N = 8;
                        local_780 = uVar109;
                        uStack_778 = uVar110;
                        uStack_770 = uVar111;
                        uStack_768 = uVar112;
                        local_730.ray = (RTCRayN *)ray;
                        if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar240 = ZEXT1664(local_1f0);
                          auVar268 = ZEXT1664(auVar260);
                          (*pGVar17->occlusionFilterN)(&local_730);
                        }
                        auVar120._8_8_ = uStack_778;
                        auVar120._0_8_ = local_780;
                        auVar281 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar120);
                        auVar124._8_8_ = uStack_768;
                        auVar124._0_8_ = uStack_770;
                        auVar215 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar124);
                        auVar158._16_16_ = auVar215;
                        auVar158._0_16_ = auVar281;
                        auVar29 = auVar312 & ~auVar158;
                        local_920 = auVar312._0_4_;
                        fStack_91c = auVar312._4_4_;
                        fStack_918 = auVar312._8_4_;
                        fStack_914 = auVar312._12_4_;
                        fStack_910 = auVar312._16_4_;
                        fStack_90c = auVar312._20_4_;
                        fStack_908 = auVar312._24_4_;
                        fStack_904 = auVar312._28_4_;
                        if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar29 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar29 >> 0x7f,0) == '\0') &&
                              (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar29 >> 0xbf,0) == '\0') &&
                            (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar29[0x1f]) {
                          auVar159._0_4_ = auVar281._0_4_ ^ (uint)local_920;
                          auVar159._4_4_ = auVar281._4_4_ ^ (uint)fStack_91c;
                          auVar159._8_4_ = auVar281._8_4_ ^ (uint)fStack_918;
                          auVar159._12_4_ = auVar281._12_4_ ^ (uint)fStack_914;
                          auVar159._16_4_ = auVar215._0_4_ ^ (uint)fStack_910;
                          auVar159._20_4_ = auVar215._4_4_ ^ (uint)fStack_90c;
                          auVar159._24_4_ = auVar215._8_4_ ^ (uint)fStack_908;
                          auVar159._28_4_ = auVar215._12_4_ ^ (uint)fStack_904;
                        }
                        else {
                          p_Var20 = context->args->filter;
                          if ((p_Var20 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar240 = ZEXT1664(auVar240._0_16_);
                            auVar268 = ZEXT1664(auVar268._0_16_);
                            (*p_Var20)(&local_730);
                          }
                          auVar121._8_8_ = uStack_778;
                          auVar121._0_8_ = local_780;
                          auVar281 = vpcmpeqd_avx((undefined1  [16])0x0,auVar121);
                          auVar125._8_8_ = uStack_768;
                          auVar125._0_8_ = uStack_770;
                          auVar215 = vpcmpeqd_avx((undefined1  [16])0x0,auVar125);
                          auVar200._16_16_ = auVar215;
                          auVar200._0_16_ = auVar281;
                          auVar159._0_4_ = auVar281._0_4_ ^ (uint)local_920;
                          auVar159._4_4_ = auVar281._4_4_ ^ (uint)fStack_91c;
                          auVar159._8_4_ = auVar281._8_4_ ^ (uint)fStack_918;
                          auVar159._12_4_ = auVar281._12_4_ ^ (uint)fStack_914;
                          auVar159._16_4_ = auVar215._0_4_ ^ (uint)fStack_910;
                          auVar159._20_4_ = auVar215._4_4_ ^ (uint)fStack_90c;
                          auVar159._24_4_ = auVar215._8_4_ ^ (uint)fStack_908;
                          auVar159._28_4_ = auVar215._12_4_ ^ (uint)fStack_904;
                          auVar222._8_4_ = 0xff800000;
                          auVar222._0_8_ = 0xff800000ff800000;
                          auVar222._12_4_ = 0xff800000;
                          auVar222._16_4_ = 0xff800000;
                          auVar222._20_4_ = 0xff800000;
                          auVar222._24_4_ = 0xff800000;
                          auVar222._28_4_ = 0xff800000;
                          auVar312 = vblendvps_avx(auVar222,*(undefined1 (*) [32])
                                                             (local_730.ray + 0x100),auVar200);
                          *(undefined1 (*) [32])(local_730.ray + 0x100) = auVar312;
                        }
                        auVar162 = ZEXT3264(auVar159);
                        if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar159 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar159 >> 0x7f,0) != '\0')
                              || (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar159 >> 0xbf,0) != '\0') ||
                            (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar159[0x1f] < '\0') break;
                        auVar162 = ZEXT464(uVar137);
                        *(uint *)(ray + k * 4 + 0x100) = uVar137;
                        local_900 = local_900 ^ 1L << ((ulong)local_8c0 & 0x3f);
                        lVar19 = 0;
                        if (local_900 != 0) {
                          for (; (local_900 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                          }
                        }
                        local_8c0 = (uint)lVar19;
                        uStack_8bc = (undefined4)((ulong)lVar19 >> 0x20);
                        local_880._1_3_ = 0;
                        local_880[0] = local_900 != 0;
                        stack0xfffffffffffff784 = auVar287._4_28_;
                      } while (local_900 != 0);
                    }
                    pRVar136 = (RTCIntersectArguments *)(ulong)local_880[0];
                  }
                }
                auVar350 = ZEXT3264(auVar193);
                auVar330 = ZEXT3264(auVar262);
                bVar139 = (bool)(bVar139 | (byte)pRVar136);
                fVar208 = (float)local_600._0_4_;
                fVar228 = (float)local_600._4_4_;
                fVar226 = fStack_5f8;
                fVar293 = fStack_5f4;
                fVar229 = fStack_5f0;
                fVar241 = fStack_5ec;
                fVar243 = fStack_5e8;
                fVar245 = (float)local_680._0_4_;
                fVar254 = (float)local_680._4_4_;
                fVar269 = fStack_678;
                fVar272 = fStack_674;
                fVar275 = fStack_670;
                fVar279 = fStack_66c;
                fVar290 = fStack_668;
              }
            }
          }
          lVar142 = lVar142 + 8;
        } while ((int)lVar142 < (int)uVar16);
      }
      if (bVar139 != false) {
        return local_92d;
      }
      uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar148._4_4_ = uVar12;
      auVar148._0_4_ = uVar12;
      auVar148._8_4_ = uVar12;
      auVar148._12_4_ = uVar12;
      auVar281 = vcmpps_avx(local_410,auVar148,2);
      uVar137 = vmovmskps_avx(auVar281);
      uVar133 = uVar133 & uVar133 + 0xf & uVar137;
      local_92d = uVar133 != 0;
    } while (local_92d);
  }
  return local_92d;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }